

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3833.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementShellANCF_3833::ComputeInternalJacobianContIntDamping
          (ChElementShellANCF_3833 *this,ChMatrixRef *H,double Kfactor,double Rfactor)

{
  assign_op<double,_double> *paVar1;
  undefined1 (*pauVar2) [16];
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [16];
  DenseStorage<double,__1,__1,__1,_1> *this_00;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  long lVar10;
  PointerType pdVar11;
  DstXprType *pDVar12;
  _func_int *p_Var13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  ChKblockGeneric *pCVar107;
  ChElementShellANCF_3833 *pCVar108;
  undefined8 uVar109;
  undefined8 uVar110;
  undefined8 uVar111;
  undefined8 uVar112;
  undefined8 uVar113;
  undefined8 uVar114;
  undefined8 uVar115;
  undefined8 uVar116;
  undefined8 uVar117;
  undefined8 uVar118;
  undefined8 uVar119;
  undefined8 uVar120;
  undefined8 uVar121;
  undefined8 uVar122;
  undefined8 uVar123;
  undefined8 uVar124;
  undefined8 uVar125;
  undefined8 uVar126;
  undefined8 uVar127;
  undefined8 uVar128;
  undefined8 uVar129;
  undefined8 uVar130;
  undefined8 uVar131;
  undefined8 uVar132;
  undefined8 uVar133;
  undefined8 uVar134;
  undefined8 uVar135;
  undefined8 uVar136;
  undefined8 uVar137;
  undefined8 uVar138;
  undefined8 uVar139;
  undefined8 uVar140;
  undefined8 uVar141;
  undefined8 uVar142;
  undefined8 uVar143;
  undefined8 uVar144;
  undefined8 uVar145;
  undefined8 uVar146;
  undefined8 uVar147;
  undefined8 uVar148;
  long lVar149;
  generic_dense_assignment_kernel<_68f64e37_> *pgVar150;
  int i_1;
  int iVar151;
  generic_dense_assignment_kernel<_68f64e37_> *pgVar152;
  char *__function;
  int iVar153;
  long lVar154;
  _func_int **pp_Var155;
  double *pdVar156;
  Matrix<double,_24,_6,_1,_24,_6> **ppMVar157;
  double dVar158;
  long lVar159;
  ulong uVar160;
  long lVar161;
  ChElementShellANCF_3833 *pCVar162;
  int i;
  long lVar163;
  double *pdVar164;
  long lVar165;
  ulong uVar166;
  long lVar167;
  long lVar168;
  pointer pLVar169;
  ActualDstType actualDst;
  long lVar170;
  ChMatrixRef *dst;
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  Matrix<double,_24,_6,_1,_24,_6> *pMVar195;
  double dVar196;
  undefined1 auVar197 [16];
  double dVar198;
  double dVar199;
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  double dVar208;
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  Matrix<double,__1,__1,_1,__1,__1> Scaled_Combined_PE;
  Matrix<double,__1,__1,_1,__1,__1> PE;
  Matrix<double,__1,__1,_1,__1,__1> DScaled_Combined_PE;
  VectorNIP E_BlockDamping;
  DstEvaluatorType dstEvaluator_1;
  ChMatrixNM<double,_6,_6> D;
  DstEvaluatorType dstEvaluator;
  SrcEvaluatorType srcEvaluator;
  VectorNIP E4_Block;
  VectorNIP E5_Block;
  VectorNIP E6_Block;
  VectorNIP SPK2_6_Block;
  VectorNIP SPK2_5_Block;
  VectorNIP SPK2_4_Block;
  VectorNIP SPK2_3_Block;
  VectorNIP SPK2_2_Block;
  VectorNIP SPK2_1_Block;
  ChMatrixNM<double,_NSF,_3_*_NIP>_conflict2 S_scaled_SD;
  MatrixNx6 ebar_ebardot;
  DenseStorage<double,__1,__1,__1,_1> local_4aa0;
  ulong local_4a80;
  long local_4a78;
  DenseStorage<double,__1,__1,__1,_1> local_4a70;
  ChElementShellANCF_3833 *local_4a50;
  ChMatrixRef *local_4a48;
  pointer local_4a40;
  undefined1 local_4a38 [16];
  long lStack_4a28;
  double local_4a20;
  pointer local_4a10;
  assign_op<double,_double> *local_4a08;
  double local_4a00;
  double dStack_49f8;
  long local_49e8;
  undefined1 local_49e0 [16];
  DenseStorage<double,__1,__1,__1,_1> *local_49d0;
  variable_if_dynamic<long,__1> avStack_49c8 [2];
  double dStack_49b8;
  double local_49b0;
  double dStack_49a8;
  double local_49a0;
  double dStack_4998;
  double local_4990;
  double dStack_4988;
  double local_4980;
  double dStack_4978;
  undefined1 local_4970 [16];
  undefined1 local_4960 [24];
  int local_4948;
  int local_4944;
  undefined1 local_4940;
  undefined7 uStack_493f;
  double dStack_4938;
  ulong local_4930;
  long local_4928;
  undefined8 local_4920;
  double dStack_4918;
  ChLoadableUV local_4910;
  double *local_4908;
  Matrix<double,_24,_6,_1,_24,_6> **local_4900;
  double dStack_48f8;
  generic_dense_assignment_kernel<_68f64e37_> local_48f0;
  double local_48d0;
  double dStack_48c8;
  double local_48c0;
  double dStack_48b8;
  double local_48b0;
  double dStack_48a8;
  double local_48a0;
  double dStack_4898;
  double local_4890;
  double dStack_4888;
  double local_4880;
  double dStack_4878;
  double local_4870;
  double dStack_4868;
  ChLoadableUVW local_4860;
  double *local_4858;
  pointer local_4850;
  assign_op<double,_double> *local_4848;
  undefined1 local_4840 [24];
  double adStack_4828 [4];
  double dStack_4808;
  double local_4800;
  double dStack_47f8;
  double local_47f0;
  double dStack_47e8;
  double local_47e0;
  double dStack_47d8;
  double local_47d0;
  double dStack_47c8;
  double local_47c0;
  double dStack_47b8;
  pointer local_47b0;
  element_type *peStack_47a8;
  undefined1 local_47a0 [96];
  Matrix<double,_24,_6,_1,_24,_6> *local_4740;
  pointer local_4738;
  pointer local_4730;
  ChLoadableUV local_4728;
  ChLoadableUVW local_4720;
  pointer local_4718;
  Matrix<double,_24,_6,_1,_24,_6> *local_4710;
  pointer local_4708;
  pointer local_4700;
  ChLoadableUV local_46f8;
  ChLoadableUVW local_46f0;
  pointer local_46e8;
  Matrix<double,_24,_6,_1,_24,_6> *local_46e0;
  pointer local_46d8;
  pointer local_46d0;
  ChLoadableUV local_46c8;
  ChLoadableUVW local_46c0;
  pointer local_46b8;
  Matrix<double,_24,_6,_1,_24,_6> *local_46b0;
  pointer local_46a8;
  pointer local_46a0;
  ChLoadableUV local_4698;
  ChLoadableUVW local_4690;
  pointer local_4688;
  double local_4680;
  double dStack_4678;
  double local_4670;
  double dStack_4668;
  double local_4660;
  double local_4658;
  double local_4650;
  double local_4648;
  undefined1 local_4640 [1584];
  double local_4010;
  double dStack_4008;
  double local_4000 [4];
  double local_3fe0;
  double dStack_3fd8;
  double local_3fd0;
  double dStack_3fc8;
  double local_3fc0;
  double dStack_3fb8;
  double local_3fb0;
  double dStack_3fa8;
  double local_3fa0;
  double dStack_3f98;
  undefined1 local_3f90 [16];
  double local_3f80;
  double dStack_3f78;
  double local_3f70 [4];
  double local_3f50;
  double dStack_3f48;
  double local_3f40;
  double dStack_3f38;
  double local_3f30;
  double dStack_3f28;
  double local_3f20;
  double dStack_3f18;
  double local_3f10;
  double dStack_3f08;
  undefined1 local_3f00 [16];
  double local_3ef0;
  double dStack_3ee8;
  double local_3ee0 [4];
  double local_3ec0;
  double dStack_3eb8;
  double local_3eb0;
  double dStack_3ea8;
  double local_3ea0;
  double dStack_3e98;
  double local_3e90;
  double dStack_3e88;
  double local_3e80;
  double dStack_3e78;
  undefined1 local_3e70 [16];
  double local_3e60;
  double dStack_3e58;
  double local_3e50 [4];
  double local_3e30;
  double dStack_3e28;
  double local_3e20;
  double dStack_3e18;
  double local_3e10;
  double dStack_3e08;
  double local_3e00;
  double dStack_3df8;
  double local_3df0;
  double dStack_3de8;
  undefined1 local_3de0 [16];
  double local_3dd0;
  double dStack_3dc8;
  double local_3dc0 [12];
  undefined1 local_3d60 [16];
  undefined1 local_3d50 [16];
  double local_3d40 [16];
  undefined1 local_3cc0 [16];
  double local_3cb0 [16];
  undefined1 local_3c30 [16];
  generic_dense_assignment_kernel<_68f64e37_> local_3c20;
  double local_3c00;
  double dStack_3bf8;
  double local_3bf0;
  double dStack_3be8;
  double local_3be0;
  double dStack_3bd8;
  double local_3bd0;
  double dStack_3bc8;
  double local_3bc0;
  double dStack_3bb8;
  double local_3bb0;
  double dStack_3ba8;
  double local_3ba0;
  double dStack_3b98;
  double local_3b90;
  double dStack_3b88;
  double local_3b80;
  double dStack_3b78;
  double local_3b70;
  double dStack_3b68;
  double local_3b60;
  double dStack_3b58;
  double local_3b50;
  double dStack_3b48;
  double local_3b40;
  double dStack_3b38;
  double local_3b30;
  double dStack_3b28;
  double local_3b20;
  double dStack_3b18;
  double local_3b10;
  double dStack_3b08;
  double local_3b00;
  double dStack_3af8;
  double local_3af0;
  double dStack_3ae8;
  double local_3ae0;
  double dStack_3ad8;
  double local_3ad0;
  double dStack_3ac8;
  double local_3ac0;
  double dStack_3ab8;
  double local_3ab0;
  double dStack_3aa8;
  double local_3aa0;
  double dStack_3a98;
  double local_3a90;
  double dStack_3a88;
  double local_3a80;
  double dStack_3a78;
  double local_3a70;
  double dStack_3a68;
  double local_3a60;
  double dStack_3a58;
  double local_3a50;
  double dStack_3a48;
  double local_3a40;
  double dStack_3a38;
  double local_3a30;
  double dStack_3a28;
  double local_3a20;
  double dStack_3a18;
  double local_3a10;
  double dStack_3a08;
  double *local_3a00;
  double dStack_39f8;
  double local_39f0;
  double *pdStack_39e8;
  double local_39e0;
  double dStack_39d8;
  double *local_39d0;
  double dStack_39c8;
  double local_39c0;
  double *pdStack_39b8;
  double local_39b0;
  double dStack_39a8;
  double local_39a0;
  double dStack_3998;
  double local_3990;
  double dStack_3988;
  double local_3980;
  double dStack_3978;
  double local_3970;
  double dStack_3968;
  double local_3960;
  double dStack_3958;
  double local_3950;
  double dStack_3948;
  double local_3940;
  double dStack_3938;
  double local_3930;
  double dStack_3928;
  double local_3920;
  double dStack_3918;
  double local_3910;
  double dStack_3908;
  double local_3900;
  double dStack_38f8;
  double local_38f0;
  double dStack_38e8;
  double local_38e0;
  double dStack_38d8;
  double local_38d0;
  double dStack_38c8;
  double local_38c0;
  double dStack_38b8;
  double local_38b0;
  double dStack_38a8;
  double local_38a0;
  double dStack_3898;
  double local_3890;
  double dStack_3888;
  double local_3880;
  double dStack_3878;
  double local_3870;
  double dStack_3868;
  double local_3860;
  double dStack_3858;
  double local_3850;
  double dStack_3848;
  double local_3840;
  double dStack_3838;
  double local_3830;
  double dStack_3828;
  double local_3820;
  double dStack_3818;
  double local_3810;
  double dStack_3808;
  double local_3800;
  double dStack_37f8;
  double local_37f0;
  double dStack_37e8;
  double local_37e0;
  double dStack_37d8;
  double local_37d0;
  double dStack_37c8;
  double local_37c0;
  double dStack_37b8;
  double local_37b0;
  double dStack_37a8;
  double local_37a0;
  double dStack_3798;
  double local_3790;
  double dStack_3788;
  double local_3780;
  double dStack_3778;
  double local_3770;
  double dStack_3768;
  double local_3760;
  double dStack_3758;
  double local_3750;
  double dStack_3748;
  double local_3740;
  double dStack_3738;
  double local_3730;
  double dStack_3728;
  double local_3720;
  double dStack_3718;
  double local_3710;
  double dStack_3708;
  double local_3700 [4];
  double local_36e0;
  double dStack_36d8;
  double local_36d0;
  double dStack_36c8;
  double local_36c0;
  double dStack_36b8;
  double local_36b0;
  double dStack_36a8;
  double local_36a0;
  double dStack_3698;
  double local_3690;
  double dStack_3688;
  double local_3680;
  double dStack_3678;
  double local_3670 [2];
  undefined1 local_3660 [16];
  undefined1 local_3650 [16];
  undefined1 local_3640 [16];
  undefined1 local_3630 [16];
  undefined1 local_3620 [16];
  undefined1 local_3610 [16];
  undefined1 local_3600 [16];
  double local_35f0;
  double dStack_35e8;
  double local_35e0 [2];
  undefined1 local_35d0 [16];
  undefined1 local_35c0 [16];
  undefined1 local_35b0 [16];
  undefined1 local_35a0 [16];
  undefined1 local_3590 [16];
  undefined1 local_3580 [16];
  undefined1 local_3570 [16];
  double local_3560;
  double dStack_3558;
  double local_3550 [4];
  double local_3530;
  double dStack_3528;
  double local_3520;
  double dStack_3518;
  double local_3510;
  double dStack_3508;
  double local_3500;
  double dStack_34f8;
  double local_34f0;
  double dStack_34e8;
  double local_34e0;
  double dStack_34d8;
  double local_34d0;
  double dStack_34c8;
  double local_34c0;
  double dStack_34b8;
  pointer local_34b0;
  double *local_34a8;
  ChLoadableUVW local_34a0;
  element_type *peStack_3498;
  double local_3490 [4];
  double local_3470;
  double dStack_3468;
  undefined8 local_3460;
  undefined8 uStack_3458;
  undefined1 local_3450 [16];
  undefined1 local_3440 [16];
  undefined1 local_3430 [16];
  undefined1 local_3420 [16];
  ChLoadableUVW local_3410;
  element_type *peStack_3408;
  double local_3400 [4];
  double local_33e0;
  double dStack_33d8;
  undefined1 local_33d0 [16];
  undefined1 local_33c0 [16];
  undefined1 local_33b0 [16];
  undefined1 local_33a0 [16];
  undefined1 local_3390 [16];
  ChLoadableUV local_3380;
  element_type *peStack_3378;
  double local_3370 [4];
  undefined8 local_3350;
  undefined8 uStack_3348;
  undefined8 local_3340;
  undefined8 uStack_3338;
  undefined8 local_3330;
  undefined8 uStack_3328;
  double local_3320;
  double dStack_3318;
  undefined8 local_3310;
  undefined8 uStack_3308;
  undefined8 local_3300;
  undefined8 uStack_32f8;
  undefined1 local_32f0 [16];
  undefined1 local_32e0 [16];
  undefined1 local_32d0 [16];
  undefined1 local_32c0 [16];
  undefined1 local_32b0 [16];
  undefined1 local_32a0 [16];
  undefined1 local_3290 [16];
  undefined8 local_3280;
  undefined8 uStack_3278;
  undefined8 local_3270;
  undefined8 uStack_3268;
  undefined8 local_3260;
  undefined8 uStack_3258;
  double local_3250;
  double dStack_3248;
  undefined8 local_3240;
  undefined8 uStack_3238;
  undefined8 local_3230;
  undefined8 uStack_3228;
  double local_3220;
  double dStack_3218;
  double local_3210;
  double dStack_3208;
  pointer local_3200;
  element_type *peStack_31f8;
  undefined8 local_31f0;
  undefined8 uStack_31e8;
  undefined8 local_31e0;
  undefined8 uStack_31d8;
  undefined8 local_31d0;
  undefined8 uStack_31c8;
  undefined8 local_31c0;
  undefined8 uStack_31b8;
  double local_31b0;
  double dStack_31a8;
  undefined8 local_31a0;
  undefined8 uStack_3198;
  undefined8 local_3190;
  undefined8 uStack_3188;
  undefined8 local_3180;
  undefined8 uStack_3178;
  undefined8 local_3170;
  undefined8 uStack_3168;
  undefined8 local_3160;
  undefined8 uStack_3158;
  undefined8 local_3150;
  undefined8 uStack_3148;
  double local_3140;
  double dStack_3138;
  double local_3130;
  double dStack_3128;
  pointer local_3120;
  element_type *peStack_3118;
  undefined8 local_3110;
  undefined8 uStack_3108;
  undefined8 local_3100;
  undefined8 uStack_30f8;
  double local_30f0;
  undefined8 uStack_30e8;
  _func_int **local_30e0;
  element_type *peStack_30d8;
  undefined8 local_30d0;
  undefined8 uStack_30c8;
  undefined8 local_30c0;
  undefined8 uStack_30b8;
  undefined8 local_30b0;
  undefined8 uStack_30a8;
  double local_30a0;
  double dStack_3098;
  undefined8 local_3090;
  undefined8 uStack_3088;
  double local_3080;
  double dStack_3078;
  double local_3070;
  double dStack_3068;
  double local_3060;
  double dStack_3058;
  double local_3050;
  double dStack_3048;
  pointer local_3040;
  element_type *peStack_3038;
  double local_3030;
  double dStack_3028;
  double local_3020;
  double dStack_3018;
  double local_3010;
  double dStack_3008;
  double local_3000;
  double dStack_2ff8;
  undefined1 local_2ff0 [16];
  undefined1 local_2fe0 [16];
  undefined1 local_2fd0 [16];
  undefined1 local_2fc0 [16];
  undefined1 local_2fb0 [16];
  double local_2fa0;
  double dStack_2f98;
  double local_2f90;
  double dStack_2f88;
  undefined1 local_2f80 [16];
  double local_2f70;
  double dStack_2f68;
  double local_2f60;
  double dStack_2f58;
  double local_2f50;
  double dStack_2f48;
  double local_2f40;
  double dStack_2f38;
  pointer local_2f30;
  element_type *peStack_2f28;
  double local_2f20 [4];
  undefined8 local_2f00;
  undefined8 uStack_2ef8;
  undefined8 local_2ef0;
  undefined8 uStack_2ee8;
  double local_2ee0;
  double dStack_2ed8;
  undefined8 local_2ed0;
  undefined8 uStack_2ec8;
  undefined8 local_2ec0;
  undefined8 uStack_2eb8;
  undefined8 local_2eb0;
  undefined8 uStack_2ea8;
  _func_int **local_2ea0;
  element_type *peStack_2e98;
  double local_2e90 [4];
  undefined8 local_2e70;
  undefined8 uStack_2e68;
  undefined8 local_2e60;
  undefined8 uStack_2e58;
  undefined8 local_2e50;
  undefined8 uStack_2e48;
  undefined8 local_2e40;
  undefined8 uStack_2e38;
  undefined8 local_2e30;
  undefined8 uStack_2e28;
  undefined8 local_2e20;
  undefined8 uStack_2e18;
  double local_2e10;
  double dStack_2e08;
  double local_2e00 [4];
  double local_2de0;
  double dStack_2dd8;
  double local_2dd0;
  double dStack_2dc8;
  double local_2dc0;
  double dStack_2db8;
  undefined8 local_2db0;
  undefined8 uStack_2da8;
  undefined8 local_2da0;
  undefined8 uStack_2d98;
  undefined8 local_2d90;
  undefined8 uStack_2d88;
  undefined1 local_2d80 [8];
  Transpose<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> TStack_2d78;
  assign_op<double,_double> *local_2d70;
  variable_if_dynamic<long,__1> avStack_2d68 [2];
  long lStack_2d58;
  Matrix<double,_24,_6,_1,_24,_6> *local_2d50 [2];
  double *local_2d40;
  ulong local_2d30;
  pointer local_2d20;
  double *local_2d10;
  ulong local_2d00;
  pointer local_2cf0;
  double *local_2ce0;
  ulong local_2cd0;
  ChLoadableUV local_2cc0;
  double *local_2cb0;
  ulong local_2ca0;
  ChLoadableUVW local_2c90;
  double *local_2c80;
  ulong local_2c70;
  pointer local_2c60;
  double *local_2c50;
  ulong local_2c40;
  double local_2be0 [1244];
  MatrixNx6 local_500;
  
  local_4850 = (pointer)Kfactor;
  local_4660 = Rfactor;
  CalcCombinedCoordMatrix(this,&local_500);
  if (((H->
       super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
       ).
       super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
       .
       super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
       .m_cols.m_value |
      (H->
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      ).
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_rows.m_value) < 0) {
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, -1, 1>]"
                 );
  }
  TStack_2d78.m_matrix = (non_const_type)&local_3c20;
  local_2d80 = (undefined1  [8])local_4640;
  local_3c20.m_dst = (DstEvaluatorType *)0x0;
  local_4640._0_8_ =
       (H->
       super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
       ).
       super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
       .
       super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
       .m_data;
  local_4640._16_8_ =
       (H->
       super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
       ).m_stride.m_outer.m_value;
  local_2d70 = (assign_op<double,_double> *)local_47a0;
  avStack_2d68[0].m_value = (long)H;
  Eigen::internal::
  dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
  ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
         *)local_2d80);
  if (0 < this->m_numLayers) {
    local_4848 = (assign_op<double,_double> *)&this->m_SD;
    local_4930 = 0;
    local_4944 = 0x24;
    local_4948 = 0x12;
    local_49e8 = 0;
    local_4670 = -1.0;
    dStack_4668 = -1.0;
    local_4680 = 0.5;
    dStack_4678 = 0.5;
    local_4a50 = this;
    local_4a48 = H;
    do {
      if ((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
          m_rows < 0x18) {
LAB_00751b03:
        __function = 
        "Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 24, 54>::Block(XprType &, Index, Index) [XprType = Eigen::Matrix<double, -1, -1, 1>, BlockRows = 24, BlockCols = 54, InnerPanel = false]"
        ;
LAB_00751aac:
        __assert_fail("startRow >= 0 && BlockRows >= 0 && startRow + BlockRows <= xpr.rows() && startCol >= 0 && BlockCols >= 0 && startCol + BlockCols <= xpr.cols()"
                      ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x85,__function);
      }
      ppMVar157 = (Matrix<double,_24,_6,_1,_24,_6> **)(ulong)(uint)((int)local_49e8 * 0x36);
      lVar10 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_cols;
      local_4648 = (double)((long)ppMVar157 + 0x36);
      if (lVar10 < (long)local_4648) goto LAB_00751b03;
      local_4928 = (long)ppMVar157 * 8;
      local_2d80 = (undefined1  [8])(*(long *)local_4848 + local_4928);
      local_2d70 = local_4848;
      avStack_2d68[0].m_value = 0;
      local_4900 = ppMVar157;
      avStack_2d68[1].m_value = (long)ppMVar157;
      lStack_2d58 = lVar10;
      local_2d50[0] = &local_500;
      memset((Matrix<double,_54,_6,_0,_54,_6> *)local_4640,0,0xa20);
      local_3c20.m_dst = (DstEvaluatorType *)0x3ff0000000000000;
      Eigen::internal::
      generic_product_impl<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,24,54,false>>,Eigen::Matrix<double,24,6,1,24,6>,Eigen::DenseShape,Eigen::DenseShape,8>
      ::scaleAndAddTo<Eigen::Matrix<double,54,6,0,54,6>>
                ((Matrix<double,_54,_6,_0,_54,_6> *)local_4640,
                 (Transpose<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_24,_54,_false>_>
                  *)local_2d80,&local_500,(Scalar *)&local_3c20);
      local_4a70.m_cols = 0;
      local_4a70.m_data = (double *)0x0;
      local_4a70.m_rows = 0;
      Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize(&local_4a70,0x1e60,0x48,0x6c);
      ppMVar157 = local_4900;
      lVar10 = local_49e8;
      pCVar162 = local_4a50;
      auVar171._8_8_ = 0;
      auVar171._0_8_ = local_4850;
      dVar158 = local_4920;
      if (local_49e8 == 0x25ed098) {
LAB_00751a80:
        local_4920 = dVar158;
        __function = 
        "Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 1, 18>::Block(XprType &, Index, Index) [XprType = Eigen::Matrix<double, -1, -1, 1>, BlockRows = 1, BlockCols = 18, InnerPanel = false]"
        ;
        goto LAB_00751aac;
      }
      lVar159 = 0;
      lVar163 = 0;
      local_4650 = (double)(long)local_4944;
      local_4658 = (double)(long)local_4948;
      local_4930 = local_4930 & 0xffffffff;
      iVar151 = (int)local_4900;
      lVar149 = (long)iVar151;
      iVar153 = iVar151 + 0x12;
      uVar160 = lVar149 + 0x12;
      lVar170 = (long)(iVar151 + 0x24);
      lVar168 = (long)iVar153;
      local_4a80 = lVar168 + 0x12;
      local_4a78 = lVar170 + 0x12;
      do {
        dVar158 = (double)CONCAT44(local_4920._4_4_,iVar153);
        if (((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_rows <= lVar163) ||
             (lVar154 = (this->m_SD).
                        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                        m_cols, dVar158 = (double)CONCAT44(local_4920._4_4_,iVar153),
             lVar154 < (long)uVar160)) ||
            (dVar158 = (double)CONCAT44(local_4920._4_4_,iVar153), local_4a70.m_rows <= lVar159)) ||
           (dVar158 = (double)CONCAT44(local_4920._4_4_,iVar153), local_4a70.m_cols < 0x12))
        goto LAB_00751a80;
        pdVar164 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                   m_storage.m_data;
        lVar154 = lVar154 * lVar163;
        lVar165 = local_4a70.m_cols * lVar159;
        dVar158 = (pdVar164 + lVar149 + lVar154)[1];
        local_4a70.m_data[lVar165] = pdVar164[lVar149 + lVar154] * (double)local_4640._0_8_;
        (local_4a70.m_data + lVar165)[1] = dVar158 * (double)local_4640._8_8_;
        dVar158 = (pdVar164 + lVar149 + lVar154 + 2)[1];
        local_4a70.m_data[lVar165 + 2] = pdVar164[lVar149 + lVar154 + 2] * (double)local_4640._16_8_
        ;
        (local_4a70.m_data + lVar165 + 2)[1] = dVar158 * (double)local_4640._24_8_;
        dVar158 = (pdVar164 + lVar149 + lVar154 + 4)[1];
        local_4a70.m_data[lVar165 + 4] = pdVar164[lVar149 + lVar154 + 4] * (double)local_4640._32_8_
        ;
        (local_4a70.m_data + lVar165 + 4)[1] = dVar158 * (double)local_4640._40_8_;
        dVar158 = (pdVar164 + lVar149 + lVar154 + 6)[1];
        local_4a70.m_data[lVar165 + 6] = pdVar164[lVar149 + lVar154 + 6] * (double)local_4640._48_8_
        ;
        (local_4a70.m_data + lVar165 + 6)[1] = dVar158 * (double)local_4640._56_8_;
        dVar158 = (pdVar164 + lVar149 + lVar154 + 8)[1];
        local_4a70.m_data[lVar165 + 8] = pdVar164[lVar149 + lVar154 + 8] * (double)local_4640._64_8_
        ;
        (local_4a70.m_data + lVar165 + 8)[1] = dVar158 * (double)local_4640._72_8_;
        dVar158 = (pdVar164 + lVar149 + lVar154 + 10)[1];
        local_4a70.m_data[lVar165 + 10] =
             pdVar164[lVar149 + lVar154 + 10] * (double)local_4640._80_8_;
        (local_4a70.m_data + lVar165 + 10)[1] = dVar158 * (double)local_4640._88_8_;
        dVar158 = (pdVar164 + lVar149 + lVar154 + 0xc)[1];
        local_4a70.m_data[lVar165 + 0xc] =
             pdVar164[lVar149 + lVar154 + 0xc] * (double)local_4640._96_8_;
        (local_4a70.m_data + lVar165 + 0xc)[1] = dVar158 * (double)local_4640._104_8_;
        dVar158 = (pdVar164 + lVar149 + lVar154 + 0xe)[1];
        local_4a70.m_data[lVar165 + 0xe] =
             pdVar164[lVar149 + lVar154 + 0xe] * (double)local_4640._112_8_;
        (local_4a70.m_data + lVar165 + 0xe)[1] = dVar158 * (double)local_4640._120_8_;
        dVar158 = (pdVar164 + lVar149 + lVar154 + 0x10)[1];
        local_4a70.m_data[lVar165 + 0x10] =
             pdVar164[lVar149 + lVar154 + 0x10] * (double)local_4640._128_8_;
        (local_4a70.m_data + lVar165 + 0x10)[1] = dVar158 * (double)local_4640._136_8_;
        dVar158 = (double)CONCAT44(local_4920._4_4_,iVar153);
        if (((iVar153 < 0) ||
            (dVar158 = (double)CONCAT44(local_4920._4_4_,iVar153),
            (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
            m_rows <= lVar163)) ||
           ((lVar154 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                       .m_storage.m_cols, dVar158 = (double)CONCAT44(local_4920._4_4_,iVar153),
            lVar154 < (long)local_4a80 ||
            ((dVar158 = (double)CONCAT44(local_4920._4_4_,iVar153), local_4a70.m_rows <= lVar159 ||
             (dVar158 = (double)CONCAT44(local_4920._4_4_,iVar153), local_4a70.m_cols < 0x24))))))
        goto LAB_00751a80;
        pdVar164 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                   m_storage.m_data;
        local_4a00 = (double)(lVar168 * 8);
        lVar154 = lVar154 * lVar163;
        lVar165 = local_4a70.m_cols * lVar159;
        dVar158 = (pdVar164 + lVar168 + lVar154)[1];
        local_4a70.m_data[lVar165 + 0x12] = pdVar164[lVar168 + lVar154] * (double)local_4640._144_8_
        ;
        (local_4a70.m_data + lVar165 + 0x12)[1] = dVar158 * (double)local_4640._152_8_;
        dVar158 = (pdVar164 + lVar168 + lVar154 + 2)[1];
        local_4a70.m_data[lVar165 + 0x14] =
             pdVar164[lVar168 + lVar154 + 2] * (double)local_4640._160_8_;
        (local_4a70.m_data + lVar165 + 0x14)[1] = dVar158 * (double)local_4640._168_8_;
        dVar158 = (pdVar164 + lVar168 + lVar154 + 4)[1];
        local_4a70.m_data[lVar165 + 0x16] =
             pdVar164[lVar168 + lVar154 + 4] * (double)local_4640._176_8_;
        (local_4a70.m_data + lVar165 + 0x16)[1] = dVar158 * (double)local_4640._184_8_;
        dVar158 = (pdVar164 + lVar168 + lVar154 + 6)[1];
        local_4a70.m_data[lVar165 + 0x18] =
             pdVar164[lVar168 + lVar154 + 6] * (double)local_4640._192_8_;
        (local_4a70.m_data + lVar165 + 0x18)[1] = dVar158 * (double)local_4640._200_8_;
        dVar158 = (pdVar164 + lVar168 + lVar154 + 8)[1];
        local_4a70.m_data[lVar165 + 0x1a] =
             pdVar164[lVar168 + lVar154 + 8] * (double)local_4640._208_8_;
        (local_4a70.m_data + lVar165 + 0x1a)[1] = dVar158 * (double)local_4640._216_8_;
        dVar158 = (pdVar164 + lVar168 + lVar154 + 10)[1];
        local_4a70.m_data[lVar165 + 0x1c] =
             pdVar164[lVar168 + lVar154 + 10] * (double)local_4640._224_8_;
        (local_4a70.m_data + lVar165 + 0x1c)[1] = dVar158 * (double)local_4640._232_8_;
        dVar158 = (pdVar164 + lVar168 + lVar154 + 0xc)[1];
        local_4a70.m_data[lVar165 + 0x1e] =
             pdVar164[lVar168 + lVar154 + 0xc] * (double)local_4640._240_8_;
        (local_4a70.m_data + lVar165 + 0x1e)[1] = dVar158 * (double)local_4640._248_8_;
        dVar158 = (pdVar164 + lVar168 + lVar154 + 0xe)[1];
        local_4a70.m_data[lVar165 + 0x20] =
             pdVar164[lVar168 + lVar154 + 0xe] * (double)local_4640._256_8_;
        (local_4a70.m_data + lVar165 + 0x20)[1] = dVar158 * (double)local_4640._264_8_;
        dVar158 = (pdVar164 + lVar168 + lVar154 + 0x10)[1];
        local_4a70.m_data[lVar165 + 0x22] =
             pdVar164[lVar168 + lVar154 + 0x10] * (double)local_4640._272_8_;
        (local_4a70.m_data + lVar165 + 0x22)[1] = dVar158 * (double)local_4640._280_8_;
        dVar158 = (double)CONCAT44(local_4920._4_4_,iVar153);
        if ((iVar151 + 0x24 < 0) ||
           ((((dVar158 = (double)CONCAT44(local_4920._4_4_,iVar153),
              (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar163 ||
              (lVar154 = (this->m_SD).
                         super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                         m_cols, dVar158 = (double)CONCAT44(local_4920._4_4_,iVar153),
              lVar154 < local_4a78)) ||
             (dVar158 = (double)CONCAT44(local_4920._4_4_,iVar153), local_4a70.m_rows <= lVar159))
            || (dVar158 = (double)CONCAT44(local_4920._4_4_,iVar153), local_4a70.m_cols < 0x36))))
        goto LAB_00751a80;
        pdVar164 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                   m_storage.m_data;
        lVar154 = lVar154 * lVar163;
        lVar165 = local_4a70.m_cols * lVar159;
        local_4940 = (undefined1)(lVar170 * 8);
        uStack_493f = (undefined7)((ulong)(lVar170 * 8) >> 8);
        dVar158 = (pdVar164 + lVar170 + lVar154)[1];
        local_4a70.m_data[lVar165 + 0x24] = pdVar164[lVar170 + lVar154] * (double)local_4640._288_8_
        ;
        (local_4a70.m_data + lVar165 + 0x24)[1] = dVar158 * (double)local_4640._296_8_;
        dVar158 = (pdVar164 + lVar170 + lVar154 + 2)[1];
        local_4a70.m_data[lVar165 + 0x26] =
             pdVar164[lVar170 + lVar154 + 2] * (double)local_4640._304_8_;
        (local_4a70.m_data + lVar165 + 0x26)[1] = dVar158 * (double)local_4640._312_8_;
        dVar158 = (pdVar164 + lVar170 + lVar154 + 4)[1];
        local_4a70.m_data[lVar165 + 0x28] =
             pdVar164[lVar170 + lVar154 + 4] * (double)local_4640._320_8_;
        (local_4a70.m_data + lVar165 + 0x28)[1] = dVar158 * (double)local_4640._328_8_;
        dVar158 = (pdVar164 + lVar170 + lVar154 + 6)[1];
        local_4a70.m_data[lVar165 + 0x2a] =
             pdVar164[lVar170 + lVar154 + 6] * (double)local_4640._336_8_;
        (local_4a70.m_data + lVar165 + 0x2a)[1] = dVar158 * (double)local_4640._344_8_;
        dVar158 = (pdVar164 + lVar170 + lVar154 + 8)[1];
        local_4a70.m_data[lVar165 + 0x2c] =
             pdVar164[lVar170 + lVar154 + 8] * (double)local_4640._352_8_;
        (local_4a70.m_data + lVar165 + 0x2c)[1] = dVar158 * (double)local_4640._360_8_;
        dVar158 = (pdVar164 + lVar170 + lVar154 + 10)[1];
        local_4a70.m_data[lVar165 + 0x2e] =
             pdVar164[lVar170 + lVar154 + 10] * (double)local_4640._368_8_;
        (local_4a70.m_data + lVar165 + 0x2e)[1] = dVar158 * (double)local_4640._376_8_;
        dVar158 = (pdVar164 + lVar170 + lVar154 + 0xc)[1];
        local_4a70.m_data[lVar165 + 0x30] =
             pdVar164[lVar170 + lVar154 + 0xc] * (double)local_4640._384_8_;
        (local_4a70.m_data + lVar165 + 0x30)[1] = dVar158 * (double)local_4640._392_8_;
        dVar158 = (pdVar164 + lVar170 + lVar154 + 0xe)[1];
        local_4a70.m_data[lVar165 + 0x32] =
             pdVar164[lVar170 + lVar154 + 0xe] * (double)local_4640._400_8_;
        (local_4a70.m_data + lVar165 + 0x32)[1] = dVar158 * (double)local_4640._408_8_;
        dVar158 = (pdVar164 + lVar170 + lVar154 + 0x10)[1];
        local_4a70.m_data[lVar165 + 0x34] =
             pdVar164[lVar170 + lVar154 + 0x10] * (double)local_4640._416_8_;
        (local_4a70.m_data + lVar165 + 0x34)[1] = dVar158 * (double)local_4640._424_8_;
        dVar158 = (double)CONCAT44(local_4920._4_4_,iVar153);
        if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar163) ||
            (uVar166 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                       .m_storage.m_cols, dVar158 = (double)CONCAT44(local_4920._4_4_,iVar153),
            (long)uVar166 < local_4a78)) ||
           ((dVar158 = (double)CONCAT44(local_4920._4_4_,iVar153), uVar166 < local_4a80 ||
            ((dVar158 = (double)CONCAT44(local_4920._4_4_,iVar153), local_4a70.m_rows <= lVar159 ||
             (dVar158 = (double)CONCAT44(local_4920._4_4_,iVar153), local_4a70.m_cols < 0x48))))))
        goto LAB_00751a80;
        pdVar164 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                   m_storage.m_data;
        lVar154 = uVar166 * lVar163;
        lVar165 = local_4a70.m_cols * lVar159;
        dVar158 = (pdVar164 + lVar170 + lVar154)[1];
        dVar196 = (pdVar164 + lVar168 + lVar154)[1];
        local_4a70.m_data[lVar165 + 0x36] =
             pdVar164[lVar170 + lVar154] * (double)local_4640._144_8_ +
             pdVar164[lVar168 + lVar154] * (double)local_4640._288_8_;
        (local_4a70.m_data + lVar165 + 0x36)[1] =
             dVar158 * (double)local_4640._152_8_ + dVar196 * (double)local_4640._296_8_;
        dVar158 = (pdVar164 + lVar170 + lVar154 + 2)[1];
        dVar196 = (pdVar164 + lVar168 + lVar154 + 2)[1];
        local_4a70.m_data[lVar165 + 0x38] =
             pdVar164[lVar170 + lVar154 + 2] * (double)local_4640._160_8_ +
             pdVar164[lVar168 + lVar154 + 2] * (double)local_4640._304_8_;
        (local_4a70.m_data + lVar165 + 0x38)[1] =
             dVar158 * (double)local_4640._168_8_ + dVar196 * (double)local_4640._312_8_;
        dVar158 = (pdVar164 + lVar170 + lVar154 + 4)[1];
        dVar196 = (pdVar164 + lVar168 + lVar154 + 4)[1];
        local_4a70.m_data[lVar165 + 0x3a] =
             pdVar164[lVar170 + lVar154 + 4] * (double)local_4640._176_8_ +
             pdVar164[lVar168 + lVar154 + 4] * (double)local_4640._320_8_;
        (local_4a70.m_data + lVar165 + 0x3a)[1] =
             dVar158 * (double)local_4640._184_8_ + dVar196 * (double)local_4640._328_8_;
        dVar158 = (pdVar164 + lVar170 + lVar154 + 6)[1];
        dVar196 = (pdVar164 + lVar168 + lVar154 + 6)[1];
        local_4a70.m_data[lVar165 + 0x3c] =
             pdVar164[lVar170 + lVar154 + 6] * (double)local_4640._192_8_ +
             pdVar164[lVar168 + lVar154 + 6] * (double)local_4640._336_8_;
        (local_4a70.m_data + lVar165 + 0x3c)[1] =
             dVar158 * (double)local_4640._200_8_ + dVar196 * (double)local_4640._344_8_;
        dVar158 = (pdVar164 + lVar170 + lVar154 + 8)[1];
        dVar196 = (pdVar164 + lVar168 + lVar154 + 8)[1];
        local_4a70.m_data[lVar165 + 0x3e] =
             pdVar164[lVar170 + lVar154 + 8] * (double)local_4640._208_8_ +
             pdVar164[lVar168 + lVar154 + 8] * (double)local_4640._352_8_;
        (local_4a70.m_data + lVar165 + 0x3e)[1] =
             dVar158 * (double)local_4640._216_8_ + dVar196 * (double)local_4640._360_8_;
        dVar158 = (pdVar164 + lVar170 + lVar154 + 10)[1];
        dVar196 = (pdVar164 + lVar168 + lVar154 + 10)[1];
        local_4a70.m_data[lVar165 + 0x40] =
             pdVar164[lVar170 + lVar154 + 10] * (double)local_4640._224_8_ +
             pdVar164[lVar168 + lVar154 + 10] * (double)local_4640._368_8_;
        (local_4a70.m_data + lVar165 + 0x40)[1] =
             dVar158 * (double)local_4640._232_8_ + dVar196 * (double)local_4640._376_8_;
        dVar158 = (pdVar164 + lVar170 + lVar154 + 0xc)[1];
        dVar196 = (pdVar164 + lVar168 + lVar154 + 0xc)[1];
        local_4a70.m_data[lVar165 + 0x42] =
             pdVar164[lVar170 + lVar154 + 0xc] * (double)local_4640._240_8_ +
             pdVar164[lVar168 + lVar154 + 0xc] * (double)local_4640._384_8_;
        (local_4a70.m_data + lVar165 + 0x42)[1] =
             dVar158 * (double)local_4640._248_8_ + dVar196 * (double)local_4640._392_8_;
        dVar158 = (pdVar164 + lVar170 + lVar154 + 0xe)[1];
        dVar196 = (pdVar164 + lVar168 + lVar154 + 0xe)[1];
        local_4a70.m_data[lVar165 + 0x44] =
             pdVar164[lVar170 + lVar154 + 0xe] * (double)local_4640._256_8_ +
             pdVar164[lVar168 + lVar154 + 0xe] * (double)local_4640._400_8_;
        (local_4a70.m_data + lVar165 + 0x44)[1] =
             dVar158 * (double)local_4640._264_8_ + dVar196 * (double)local_4640._408_8_;
        dVar158 = (pdVar164 + lVar170 + lVar154 + 0x10)[1];
        dVar196 = (pdVar164 + lVar168 + lVar154 + 0x10)[1];
        local_4a70.m_data[lVar165 + 0x46] =
             pdVar164[lVar170 + lVar154 + 0x10] * (double)local_4640._272_8_ +
             pdVar164[lVar168 + lVar154 + 0x10] * (double)local_4640._416_8_;
        (local_4a70.m_data + lVar165 + 0x46)[1] =
             dVar158 * (double)local_4640._280_8_ + dVar196 * (double)local_4640._424_8_;
        dVar158 = (double)CONCAT44(local_4920._4_4_,iVar153);
        if (((local_4a50->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
             m_storage.m_rows <= lVar163) ||
           ((((uVar166 = (local_4a50->m_SD).
                         super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                         m_cols, dVar158 = (double)CONCAT44(local_4920._4_4_,iVar153),
              (long)uVar166 < local_4a78 ||
              (dVar158 = (double)CONCAT44(local_4920._4_4_,iVar153), uVar166 < uVar160)) ||
             (dVar158 = (double)CONCAT44(local_4920._4_4_,iVar153), local_4a70.m_rows <= lVar159))
            || (dVar158 = (double)CONCAT44(local_4920._4_4_,iVar153), local_4a70.m_cols < 0x5a))))
        goto LAB_00751a80;
        pdVar164 = (local_4a50->m_SD).
                   super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data
        ;
        lVar154 = uVar166 * lVar163;
        lVar165 = local_4a70.m_cols * lVar159;
        dVar158 = (pdVar164 + lVar170 + lVar154)[1];
        dVar196 = (pdVar164 + lVar149 + lVar154)[1];
        local_4a70.m_data[lVar165 + 0x48] =
             pdVar164[lVar170 + lVar154] * (double)local_4640._0_8_ +
             pdVar164[lVar149 + lVar154] * (double)local_4640._288_8_;
        (local_4a70.m_data + lVar165 + 0x48)[1] =
             dVar158 * (double)local_4640._8_8_ + dVar196 * (double)local_4640._296_8_;
        dVar158 = (pdVar164 + lVar170 + lVar154 + 2)[1];
        dVar196 = (pdVar164 + lVar149 + lVar154 + 2)[1];
        local_4a70.m_data[lVar165 + 0x4a] =
             pdVar164[lVar170 + lVar154 + 2] * (double)local_4640._16_8_ +
             pdVar164[lVar149 + lVar154 + 2] * (double)local_4640._304_8_;
        (local_4a70.m_data + lVar165 + 0x4a)[1] =
             dVar158 * (double)local_4640._24_8_ + dVar196 * (double)local_4640._312_8_;
        dVar158 = (pdVar164 + lVar170 + lVar154 + 4)[1];
        dVar196 = (pdVar164 + lVar149 + lVar154 + 4)[1];
        local_4a70.m_data[lVar165 + 0x4c] =
             pdVar164[lVar170 + lVar154 + 4] * (double)local_4640._32_8_ +
             pdVar164[lVar149 + lVar154 + 4] * (double)local_4640._320_8_;
        (local_4a70.m_data + lVar165 + 0x4c)[1] =
             dVar158 * (double)local_4640._40_8_ + dVar196 * (double)local_4640._328_8_;
        dVar158 = (pdVar164 + lVar170 + lVar154 + 6)[1];
        dVar196 = (pdVar164 + lVar149 + lVar154 + 6)[1];
        local_4a70.m_data[lVar165 + 0x4e] =
             pdVar164[lVar170 + lVar154 + 6] * (double)local_4640._48_8_ +
             pdVar164[lVar149 + lVar154 + 6] * (double)local_4640._336_8_;
        (local_4a70.m_data + lVar165 + 0x4e)[1] =
             dVar158 * (double)local_4640._56_8_ + dVar196 * (double)local_4640._344_8_;
        dVar158 = (pdVar164 + lVar170 + lVar154 + 8)[1];
        dVar196 = (pdVar164 + lVar149 + lVar154 + 8)[1];
        local_4a70.m_data[lVar165 + 0x50] =
             pdVar164[lVar170 + lVar154 + 8] * (double)local_4640._64_8_ +
             pdVar164[lVar149 + lVar154 + 8] * (double)local_4640._352_8_;
        (local_4a70.m_data + lVar165 + 0x50)[1] =
             dVar158 * (double)local_4640._72_8_ + dVar196 * (double)local_4640._360_8_;
        dVar158 = (pdVar164 + lVar170 + lVar154 + 10)[1];
        dVar196 = (pdVar164 + lVar149 + lVar154 + 10)[1];
        local_4a70.m_data[lVar165 + 0x52] =
             pdVar164[lVar170 + lVar154 + 10] * (double)local_4640._80_8_ +
             pdVar164[lVar149 + lVar154 + 10] * (double)local_4640._368_8_;
        (local_4a70.m_data + lVar165 + 0x52)[1] =
             dVar158 * (double)local_4640._88_8_ + dVar196 * (double)local_4640._376_8_;
        dVar158 = (pdVar164 + lVar170 + lVar154 + 0xc)[1];
        dVar196 = (pdVar164 + lVar149 + lVar154 + 0xc)[1];
        local_4a70.m_data[lVar165 + 0x54] =
             pdVar164[lVar170 + lVar154 + 0xc] * (double)local_4640._96_8_ +
             pdVar164[lVar149 + lVar154 + 0xc] * (double)local_4640._384_8_;
        (local_4a70.m_data + lVar165 + 0x54)[1] =
             dVar158 * (double)local_4640._104_8_ + dVar196 * (double)local_4640._392_8_;
        dVar158 = (pdVar164 + lVar170 + lVar154 + 0xe)[1];
        dVar196 = (pdVar164 + lVar149 + lVar154 + 0xe)[1];
        local_4a70.m_data[lVar165 + 0x56] =
             pdVar164[lVar170 + lVar154 + 0xe] * (double)local_4640._112_8_ +
             pdVar164[lVar149 + lVar154 + 0xe] * (double)local_4640._400_8_;
        (local_4a70.m_data + lVar165 + 0x56)[1] =
             dVar158 * (double)local_4640._120_8_ + dVar196 * (double)local_4640._408_8_;
        dVar158 = (pdVar164 + lVar170 + lVar154 + 0x10)[1];
        dVar196 = (pdVar164 + lVar149 + lVar154 + 0x10)[1];
        local_4a70.m_data[lVar165 + 0x58] =
             pdVar164[lVar170 + lVar154 + 0x10] * (double)local_4640._128_8_ +
             pdVar164[lVar149 + lVar154 + 0x10] * (double)local_4640._416_8_;
        (local_4a70.m_data + lVar165 + 0x58)[1] =
             dVar158 * (double)local_4640._136_8_ + dVar196 * (double)local_4640._424_8_;
        dVar158 = (double)CONCAT44(local_4920._4_4_,iVar153);
        if ((((local_4a50->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar163) ||
            (uVar166 = (local_4a50->m_SD).
                       super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                       m_cols, dVar158 = (double)CONCAT44(local_4920._4_4_,iVar153),
            (long)uVar166 < (long)local_4a80)) ||
           ((dVar158 = (double)CONCAT44(local_4920._4_4_,iVar153), uVar166 < uVar160 ||
            ((dVar158 = (double)CONCAT44(local_4920._4_4_,iVar153), local_4a70.m_rows <= lVar159 ||
             (dVar158 = (double)CONCAT44(local_4920._4_4_,iVar153), local_4a70.m_cols < 0x6c))))))
        goto LAB_00751a80;
        pdVar164 = (local_4a50->m_SD).
                   super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data
        ;
        lVar154 = uVar166 * lVar163;
        lVar165 = local_4a70.m_cols * lVar159;
        dVar158 = (pdVar164 + lVar168 + lVar154)[1];
        dVar196 = (pdVar164 + lVar149 + lVar154)[1];
        local_4a70.m_data[lVar165 + 0x5a] =
             pdVar164[lVar168 + lVar154] * (double)local_4640._0_8_ +
             pdVar164[lVar149 + lVar154] * (double)local_4640._144_8_;
        (local_4a70.m_data + lVar165 + 0x5a)[1] =
             dVar158 * (double)local_4640._8_8_ + dVar196 * (double)local_4640._152_8_;
        dVar158 = (pdVar164 + lVar168 + lVar154 + 2)[1];
        dVar196 = (pdVar164 + lVar149 + lVar154 + 2)[1];
        local_4a70.m_data[lVar165 + 0x5c] =
             pdVar164[lVar168 + lVar154 + 2] * (double)local_4640._16_8_ +
             pdVar164[lVar149 + lVar154 + 2] * (double)local_4640._160_8_;
        (local_4a70.m_data + lVar165 + 0x5c)[1] =
             dVar158 * (double)local_4640._24_8_ + dVar196 * (double)local_4640._168_8_;
        dVar158 = (pdVar164 + lVar168 + lVar154 + 4)[1];
        dVar196 = (pdVar164 + lVar149 + lVar154 + 4)[1];
        local_4a70.m_data[lVar165 + 0x5e] =
             pdVar164[lVar168 + lVar154 + 4] * (double)local_4640._32_8_ +
             pdVar164[lVar149 + lVar154 + 4] * (double)local_4640._176_8_;
        (local_4a70.m_data + lVar165 + 0x5e)[1] =
             dVar158 * (double)local_4640._40_8_ + dVar196 * (double)local_4640._184_8_;
        dVar158 = (pdVar164 + lVar168 + lVar154 + 6)[1];
        dVar196 = (pdVar164 + lVar149 + lVar154 + 6)[1];
        local_4a70.m_data[lVar165 + 0x60] =
             pdVar164[lVar168 + lVar154 + 6] * (double)local_4640._48_8_ +
             pdVar164[lVar149 + lVar154 + 6] * (double)local_4640._192_8_;
        (local_4a70.m_data + lVar165 + 0x60)[1] =
             dVar158 * (double)local_4640._56_8_ + dVar196 * (double)local_4640._200_8_;
        dVar158 = (pdVar164 + lVar168 + lVar154 + 8)[1];
        dVar196 = (pdVar164 + lVar149 + lVar154 + 8)[1];
        local_4a70.m_data[lVar165 + 0x62] =
             pdVar164[lVar168 + lVar154 + 8] * (double)local_4640._64_8_ +
             pdVar164[lVar149 + lVar154 + 8] * (double)local_4640._208_8_;
        (local_4a70.m_data + lVar165 + 0x62)[1] =
             dVar158 * (double)local_4640._72_8_ + dVar196 * (double)local_4640._216_8_;
        dVar158 = (pdVar164 + lVar168 + lVar154 + 10)[1];
        dVar196 = (pdVar164 + lVar149 + lVar154 + 10)[1];
        local_4a70.m_data[lVar165 + 100] =
             pdVar164[lVar168 + lVar154 + 10] * (double)local_4640._80_8_ +
             pdVar164[lVar149 + lVar154 + 10] * (double)local_4640._224_8_;
        (local_4a70.m_data + lVar165 + 100)[1] =
             dVar158 * (double)local_4640._88_8_ + dVar196 * (double)local_4640._232_8_;
        dVar158 = (pdVar164 + lVar168 + lVar154 + 0xc)[1];
        dVar196 = (pdVar164 + lVar149 + lVar154 + 0xc)[1];
        local_4a70.m_data[lVar165 + 0x66] =
             pdVar164[lVar168 + lVar154 + 0xc] * (double)local_4640._96_8_ +
             pdVar164[lVar149 + lVar154 + 0xc] * (double)local_4640._240_8_;
        (local_4a70.m_data + lVar165 + 0x66)[1] =
             dVar158 * (double)local_4640._104_8_ + dVar196 * (double)local_4640._248_8_;
        dVar158 = (pdVar164 + lVar168 + lVar154 + 0xe)[1];
        dVar196 = (pdVar164 + lVar149 + lVar154 + 0xe)[1];
        local_4a70.m_data[lVar165 + 0x68] =
             pdVar164[lVar168 + lVar154 + 0xe] * (double)local_4640._112_8_ +
             pdVar164[lVar149 + lVar154 + 0xe] * (double)local_4640._256_8_;
        (local_4a70.m_data + lVar165 + 0x68)[1] =
             dVar158 * (double)local_4640._120_8_ + dVar196 * (double)local_4640._264_8_;
        dVar158 = (pdVar164 + lVar168 + lVar154 + 0x10)[1];
        dVar196 = (pdVar164 + lVar149 + lVar154 + 0x10)[1];
        local_4a70.m_data[lVar165 + 0x6a] =
             pdVar164[lVar168 + lVar154 + 0x10] * (double)local_4640._128_8_ +
             pdVar164[lVar149 + lVar154 + 0x10] * (double)local_4640._272_8_;
        (local_4a70.m_data + lVar165 + 0x6a)[1] =
             dVar158 * (double)local_4640._136_8_ + dVar196 * (double)local_4640._280_8_;
        dVar158 = (double)CONCAT44(local_4920._4_4_,iVar153);
        if (((local_4a50->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
             m_storage.m_rows <= lVar163) ||
           (((lVar154 = (local_4a50->m_SD).
                        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                        m_cols, dVar158 = (double)CONCAT44(local_4920._4_4_,iVar153),
             lVar154 < (long)uVar160 ||
             (lVar165 = lVar159 + 1, dVar158 = (double)CONCAT44(local_4920._4_4_,iVar153),
             local_4a70.m_rows <= lVar165)) ||
            (dVar158 = (double)CONCAT44(local_4920._4_4_,iVar153), local_4a70.m_cols < 0x12))))
        goto LAB_00751a80;
        pdVar164 = (local_4a50->m_SD).
                   super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data
        ;
        lVar154 = lVar154 * lVar163;
        lVar167 = local_4a70.m_cols * lVar165;
        dVar158 = (pdVar164 + lVar149 + lVar154)[1];
        local_4a70.m_data[lVar167] = pdVar164[lVar149 + lVar154] * (double)local_4640._432_8_;
        (local_4a70.m_data + lVar167)[1] = dVar158 * (double)local_4640._440_8_;
        dVar158 = (pdVar164 + lVar149 + lVar154 + 2)[1];
        local_4a70.m_data[lVar167 + 2] =
             pdVar164[lVar149 + lVar154 + 2] * (double)local_4640._448_8_;
        (local_4a70.m_data + lVar167 + 2)[1] = dVar158 * (double)local_4640._456_8_;
        dVar158 = (pdVar164 + lVar149 + lVar154 + 4)[1];
        local_4a70.m_data[lVar167 + 4] =
             pdVar164[lVar149 + lVar154 + 4] * (double)local_4640._464_8_;
        (local_4a70.m_data + lVar167 + 4)[1] = dVar158 * (double)local_4640._472_8_;
        dVar158 = (pdVar164 + lVar149 + lVar154 + 6)[1];
        local_4a70.m_data[lVar167 + 6] =
             pdVar164[lVar149 + lVar154 + 6] * (double)local_4640._480_8_;
        (local_4a70.m_data + lVar167 + 6)[1] = dVar158 * (double)local_4640._488_8_;
        dVar158 = (pdVar164 + lVar149 + lVar154 + 8)[1];
        local_4a70.m_data[lVar167 + 8] =
             pdVar164[lVar149 + lVar154 + 8] * (double)local_4640._496_8_;
        (local_4a70.m_data + lVar167 + 8)[1] = dVar158 * (double)local_4640._504_8_;
        dVar158 = (pdVar164 + lVar149 + lVar154 + 10)[1];
        local_4a70.m_data[lVar167 + 10] =
             pdVar164[lVar149 + lVar154 + 10] * (double)local_4640._512_8_;
        (local_4a70.m_data + lVar167 + 10)[1] = dVar158 * (double)local_4640._520_8_;
        dVar158 = (pdVar164 + lVar149 + lVar154 + 0xc)[1];
        local_4a70.m_data[lVar167 + 0xc] =
             pdVar164[lVar149 + lVar154 + 0xc] * (double)local_4640._528_8_;
        (local_4a70.m_data + lVar167 + 0xc)[1] = dVar158 * (double)local_4640._536_8_;
        dVar158 = (pdVar164 + lVar149 + lVar154 + 0xe)[1];
        local_4a70.m_data[lVar167 + 0xe] =
             pdVar164[lVar149 + lVar154 + 0xe] * (double)local_4640._544_8_;
        (local_4a70.m_data + lVar167 + 0xe)[1] = dVar158 * (double)local_4640._552_8_;
        dVar158 = (pdVar164 + lVar149 + lVar154 + 0x10)[1];
        local_4a70.m_data[lVar167 + 0x10] =
             pdVar164[lVar149 + lVar154 + 0x10] * (double)local_4640._560_8_;
        (local_4a70.m_data + lVar167 + 0x10)[1] = dVar158 * (double)local_4640._568_8_;
        dVar158 = (double)CONCAT44(local_4920._4_4_,iVar153);
        if ((((local_4a50->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar163) ||
            (lVar154 = (local_4a50->m_SD).
                       super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                       m_cols, dVar158 = (double)CONCAT44(local_4920._4_4_,iVar153),
            lVar154 < (long)local_4a80)) ||
           ((dVar158 = (double)CONCAT44(local_4920._4_4_,iVar153), local_4a70.m_rows <= lVar165 ||
            (dVar158 = (double)CONCAT44(local_4920._4_4_,iVar153), local_4a70.m_cols < 0x24))))
        goto LAB_00751a80;
        pdVar164 = (local_4a50->m_SD).
                   super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data
        ;
        lVar154 = lVar154 * lVar163;
        lVar167 = local_4a70.m_cols * lVar165;
        dVar158 = (pdVar164 + lVar168 + lVar154)[1];
        local_4a70.m_data[lVar167 + 0x12] = pdVar164[lVar168 + lVar154] * (double)local_4640._576_8_
        ;
        (local_4a70.m_data + lVar167 + 0x12)[1] = dVar158 * (double)local_4640._584_8_;
        dVar158 = (pdVar164 + lVar168 + lVar154 + 2)[1];
        local_4a70.m_data[lVar167 + 0x14] =
             pdVar164[lVar168 + lVar154 + 2] * (double)local_4640._592_8_;
        (local_4a70.m_data + lVar167 + 0x14)[1] = dVar158 * (double)local_4640._600_8_;
        dVar158 = (pdVar164 + lVar168 + lVar154 + 4)[1];
        local_4a70.m_data[lVar167 + 0x16] =
             pdVar164[lVar168 + lVar154 + 4] * (double)local_4640._608_8_;
        (local_4a70.m_data + lVar167 + 0x16)[1] = dVar158 * (double)local_4640._616_8_;
        dVar158 = (pdVar164 + lVar168 + lVar154 + 6)[1];
        local_4a70.m_data[lVar167 + 0x18] =
             pdVar164[lVar168 + lVar154 + 6] * (double)local_4640._624_8_;
        (local_4a70.m_data + lVar167 + 0x18)[1] = dVar158 * (double)local_4640._632_8_;
        dVar158 = (pdVar164 + lVar168 + lVar154 + 8)[1];
        local_4a70.m_data[lVar167 + 0x1a] =
             pdVar164[lVar168 + lVar154 + 8] * (double)local_4640._640_8_;
        (local_4a70.m_data + lVar167 + 0x1a)[1] = dVar158 * (double)local_4640._648_8_;
        dVar158 = (pdVar164 + lVar168 + lVar154 + 10)[1];
        local_4a70.m_data[lVar167 + 0x1c] =
             pdVar164[lVar168 + lVar154 + 10] * (double)local_4640._656_8_;
        (local_4a70.m_data + lVar167 + 0x1c)[1] = dVar158 * (double)local_4640._664_8_;
        dVar158 = (pdVar164 + lVar168 + lVar154 + 0xc)[1];
        local_4a70.m_data[lVar167 + 0x1e] =
             pdVar164[lVar168 + lVar154 + 0xc] * (double)local_4640._672_8_;
        (local_4a70.m_data + lVar167 + 0x1e)[1] = dVar158 * (double)local_4640._680_8_;
        dVar158 = (pdVar164 + lVar168 + lVar154 + 0xe)[1];
        local_4a70.m_data[lVar167 + 0x20] =
             pdVar164[lVar168 + lVar154 + 0xe] * (double)local_4640._688_8_;
        (local_4a70.m_data + lVar167 + 0x20)[1] = dVar158 * (double)local_4640._696_8_;
        dVar158 = (pdVar164 + lVar168 + lVar154 + 0x10)[1];
        local_4a70.m_data[lVar167 + 0x22] =
             pdVar164[lVar168 + lVar154 + 0x10] * (double)local_4640._704_8_;
        (local_4a70.m_data + lVar167 + 0x22)[1] = dVar158 * (double)local_4640._712_8_;
        dVar158 = (double)CONCAT44(local_4920._4_4_,iVar153);
        if (((((local_4a50->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_rows <= lVar163) ||
             (lVar154 = (local_4a50->m_SD).
                        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                        m_cols, dVar158 = (double)CONCAT44(local_4920._4_4_,iVar153),
             lVar154 < local_4a78)) ||
            (dVar158 = (double)CONCAT44(local_4920._4_4_,iVar153), local_4a70.m_rows <= lVar165)) ||
           (dVar158 = (double)CONCAT44(local_4920._4_4_,iVar153), local_4a70.m_cols < 0x36))
        goto LAB_00751a80;
        pdVar164 = (local_4a50->m_SD).
                   super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data
        ;
        lVar154 = lVar154 * lVar163;
        lVar167 = local_4a70.m_cols * lVar165;
        dVar158 = (pdVar164 + lVar170 + lVar154)[1];
        local_4a70.m_data[lVar167 + 0x24] = pdVar164[lVar170 + lVar154] * (double)local_4640._720_8_
        ;
        (local_4a70.m_data + lVar167 + 0x24)[1] = dVar158 * (double)local_4640._728_8_;
        dVar158 = (pdVar164 + lVar170 + lVar154 + 2)[1];
        local_4a70.m_data[lVar167 + 0x26] =
             pdVar164[lVar170 + lVar154 + 2] * (double)local_4640._736_8_;
        (local_4a70.m_data + lVar167 + 0x26)[1] = dVar158 * (double)local_4640._744_8_;
        dVar158 = (pdVar164 + lVar170 + lVar154 + 4)[1];
        local_4a70.m_data[lVar167 + 0x28] =
             pdVar164[lVar170 + lVar154 + 4] * (double)local_4640._752_8_;
        (local_4a70.m_data + lVar167 + 0x28)[1] = dVar158 * (double)local_4640._760_8_;
        dVar158 = (pdVar164 + lVar170 + lVar154 + 6)[1];
        local_4a70.m_data[lVar167 + 0x2a] =
             pdVar164[lVar170 + lVar154 + 6] * (double)local_4640._768_8_;
        (local_4a70.m_data + lVar167 + 0x2a)[1] = dVar158 * (double)local_4640._776_8_;
        dVar158 = (pdVar164 + lVar170 + lVar154 + 8)[1];
        local_4a70.m_data[lVar167 + 0x2c] =
             pdVar164[lVar170 + lVar154 + 8] * (double)local_4640._784_8_;
        (local_4a70.m_data + lVar167 + 0x2c)[1] = dVar158 * (double)local_4640._792_8_;
        dVar158 = (pdVar164 + lVar170 + lVar154 + 10)[1];
        local_4a70.m_data[lVar167 + 0x2e] =
             pdVar164[lVar170 + lVar154 + 10] * (double)local_4640._800_8_;
        (local_4a70.m_data + lVar167 + 0x2e)[1] = dVar158 * (double)local_4640._808_8_;
        dVar158 = (pdVar164 + lVar170 + lVar154 + 0xc)[1];
        local_4a70.m_data[lVar167 + 0x30] =
             pdVar164[lVar170 + lVar154 + 0xc] * (double)local_4640._816_8_;
        (local_4a70.m_data + lVar167 + 0x30)[1] = dVar158 * (double)local_4640._824_8_;
        dVar158 = (pdVar164 + lVar170 + lVar154 + 0xe)[1];
        local_4a70.m_data[lVar167 + 0x32] =
             pdVar164[lVar170 + lVar154 + 0xe] * (double)local_4640._832_8_;
        (local_4a70.m_data + lVar167 + 0x32)[1] = dVar158 * (double)local_4640._840_8_;
        dVar158 = (pdVar164 + lVar170 + lVar154 + 0x10)[1];
        local_4a70.m_data[lVar167 + 0x34] =
             pdVar164[lVar170 + lVar154 + 0x10] * (double)local_4640._848_8_;
        (local_4a70.m_data + lVar167 + 0x34)[1] = dVar158 * (double)local_4640._856_8_;
        dVar158 = (double)CONCAT44(local_4920._4_4_,iVar153);
        if (((((local_4a50->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_rows <= lVar163) ||
             (uVar166 = (local_4a50->m_SD).
                        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                        m_cols, dVar158 = (double)CONCAT44(local_4920._4_4_,iVar153),
             (long)uVar166 < local_4a78)) ||
            (dVar158 = (double)CONCAT44(local_4920._4_4_,iVar153), uVar166 < local_4a80)) ||
           ((dVar158 = (double)CONCAT44(local_4920._4_4_,iVar153), local_4a70.m_rows <= lVar165 ||
            (dVar158 = (double)CONCAT44(local_4920._4_4_,iVar153), local_4a70.m_cols < 0x48))))
        goto LAB_00751a80;
        pdVar164 = (local_4a50->m_SD).
                   super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data
        ;
        lVar167 = uVar166 * lVar163;
        lVar154 = local_4a70.m_cols * lVar165;
        dVar158 = (pdVar164 + lVar170 + lVar167)[1];
        dVar196 = (pdVar164 + lVar168 + lVar167)[1];
        local_4a70.m_data[lVar154 + 0x36] =
             pdVar164[lVar170 + lVar167] * (double)local_4640._576_8_ +
             pdVar164[lVar168 + lVar167] * (double)local_4640._720_8_;
        (local_4a70.m_data + lVar154 + 0x36)[1] =
             dVar158 * (double)local_4640._584_8_ + dVar196 * (double)local_4640._728_8_;
        dVar158 = (pdVar164 + lVar170 + lVar167 + 2)[1];
        dVar196 = (pdVar164 + lVar168 + lVar167 + 2)[1];
        local_4a70.m_data[lVar154 + 0x38] =
             pdVar164[lVar170 + lVar167 + 2] * (double)local_4640._592_8_ +
             pdVar164[lVar168 + lVar167 + 2] * (double)local_4640._736_8_;
        (local_4a70.m_data + lVar154 + 0x38)[1] =
             dVar158 * (double)local_4640._600_8_ + dVar196 * (double)local_4640._744_8_;
        dVar158 = (pdVar164 + lVar170 + lVar167 + 4)[1];
        dVar196 = (pdVar164 + lVar168 + lVar167 + 4)[1];
        local_4a70.m_data[lVar154 + 0x3a] =
             pdVar164[lVar170 + lVar167 + 4] * (double)local_4640._608_8_ +
             pdVar164[lVar168 + lVar167 + 4] * (double)local_4640._752_8_;
        (local_4a70.m_data + lVar154 + 0x3a)[1] =
             dVar158 * (double)local_4640._616_8_ + dVar196 * (double)local_4640._760_8_;
        dVar158 = (pdVar164 + lVar170 + lVar167 + 6)[1];
        dVar196 = (pdVar164 + lVar168 + lVar167 + 6)[1];
        local_4a70.m_data[lVar154 + 0x3c] =
             pdVar164[lVar170 + lVar167 + 6] * (double)local_4640._624_8_ +
             pdVar164[lVar168 + lVar167 + 6] * (double)local_4640._768_8_;
        (local_4a70.m_data + lVar154 + 0x3c)[1] =
             dVar158 * (double)local_4640._632_8_ + dVar196 * (double)local_4640._776_8_;
        dVar158 = (pdVar164 + lVar170 + lVar167 + 8)[1];
        dVar196 = (pdVar164 + lVar168 + lVar167 + 8)[1];
        local_4a70.m_data[lVar154 + 0x3e] =
             pdVar164[lVar170 + lVar167 + 8] * (double)local_4640._640_8_ +
             pdVar164[lVar168 + lVar167 + 8] * (double)local_4640._784_8_;
        (local_4a70.m_data + lVar154 + 0x3e)[1] =
             dVar158 * (double)local_4640._648_8_ + dVar196 * (double)local_4640._792_8_;
        dVar158 = (pdVar164 + lVar170 + lVar167 + 10)[1];
        dVar196 = (pdVar164 + lVar168 + lVar167 + 10)[1];
        local_4a70.m_data[lVar154 + 0x40] =
             pdVar164[lVar170 + lVar167 + 10] * (double)local_4640._656_8_ +
             pdVar164[lVar168 + lVar167 + 10] * (double)local_4640._800_8_;
        (local_4a70.m_data + lVar154 + 0x40)[1] =
             dVar158 * (double)local_4640._664_8_ + dVar196 * (double)local_4640._808_8_;
        dVar158 = (pdVar164 + lVar170 + lVar167 + 0xc)[1];
        dVar196 = (pdVar164 + lVar168 + lVar167 + 0xc)[1];
        local_4a70.m_data[lVar154 + 0x42] =
             pdVar164[lVar170 + lVar167 + 0xc] * (double)local_4640._672_8_ +
             pdVar164[lVar168 + lVar167 + 0xc] * (double)local_4640._816_8_;
        (local_4a70.m_data + lVar154 + 0x42)[1] =
             dVar158 * (double)local_4640._680_8_ + dVar196 * (double)local_4640._824_8_;
        dVar158 = (pdVar164 + lVar170 + lVar167 + 0xe)[1];
        dVar196 = (pdVar164 + lVar168 + lVar167 + 0xe)[1];
        local_4a70.m_data[lVar154 + 0x44] =
             pdVar164[lVar170 + lVar167 + 0xe] * (double)local_4640._688_8_ +
             pdVar164[lVar168 + lVar167 + 0xe] * (double)local_4640._832_8_;
        (local_4a70.m_data + lVar154 + 0x44)[1] =
             dVar158 * (double)local_4640._696_8_ + dVar196 * (double)local_4640._840_8_;
        dVar158 = (pdVar164 + lVar168 + lVar167 + 0x10)[1];
        dVar196 = (pdVar164 + lVar170 + lVar167 + 0x10)[1];
        local_4a70.m_data[lVar154 + 0x46] =
             pdVar164[lVar170 + lVar167 + 0x10] * (double)local_4640._704_8_ +
             pdVar164[lVar168 + lVar167 + 0x10] * (double)local_4640._848_8_;
        (local_4a70.m_data + lVar154 + 0x46)[1] =
             dVar196 * (double)local_4640._712_8_ + dVar158 * (double)local_4640._856_8_;
        dVar158 = (double)CONCAT44(local_4920._4_4_,iVar153);
        if (((((local_4a50->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_rows <= lVar163) ||
             ((uVar166 = (local_4a50->m_SD).
                         super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                         m_cols, dVar158 = (double)CONCAT44(local_4920._4_4_,iVar153),
              (long)uVar166 < local_4a78 ||
              (dVar158 = (double)CONCAT44(local_4920._4_4_,iVar153), uVar166 < uVar160)))) ||
            (dVar158 = (double)CONCAT44(local_4920._4_4_,iVar153), local_4a70.m_rows <= lVar165)) ||
           (dVar158 = (double)CONCAT44(local_4920._4_4_,iVar153), local_4a70.m_cols < 0x5a))
        goto LAB_00751a80;
        pdVar164 = (local_4a50->m_SD).
                   super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data
        ;
        lVar167 = uVar166 * lVar163;
        lVar154 = local_4a70.m_cols * lVar165;
        dVar158 = (pdVar164 + lVar170 + lVar167)[1];
        dVar196 = (pdVar164 + lVar149 + lVar167)[1];
        local_4a70.m_data[lVar154 + 0x48] =
             pdVar164[lVar170 + lVar167] * (double)local_4640._432_8_ +
             pdVar164[lVar149 + lVar167] * (double)local_4640._720_8_;
        (local_4a70.m_data + lVar154 + 0x48)[1] =
             dVar158 * (double)local_4640._440_8_ + dVar196 * (double)local_4640._728_8_;
        dVar158 = (pdVar164 + lVar170 + lVar167 + 2)[1];
        dVar196 = (pdVar164 + lVar149 + lVar167 + 2)[1];
        local_4a70.m_data[lVar154 + 0x4a] =
             pdVar164[lVar170 + lVar167 + 2] * (double)local_4640._448_8_ +
             pdVar164[lVar149 + lVar167 + 2] * (double)local_4640._736_8_;
        (local_4a70.m_data + lVar154 + 0x4a)[1] =
             dVar158 * (double)local_4640._456_8_ + dVar196 * (double)local_4640._744_8_;
        dVar158 = (pdVar164 + lVar170 + lVar167 + 4)[1];
        dVar196 = (pdVar164 + lVar149 + lVar167 + 4)[1];
        local_4a70.m_data[lVar154 + 0x4c] =
             pdVar164[lVar170 + lVar167 + 4] * (double)local_4640._464_8_ +
             pdVar164[lVar149 + lVar167 + 4] * (double)local_4640._752_8_;
        (local_4a70.m_data + lVar154 + 0x4c)[1] =
             dVar158 * (double)local_4640._472_8_ + dVar196 * (double)local_4640._760_8_;
        dVar158 = (pdVar164 + lVar170 + lVar167 + 6)[1];
        dVar196 = (pdVar164 + lVar149 + lVar167 + 6)[1];
        local_4a70.m_data[lVar154 + 0x4e] =
             pdVar164[lVar170 + lVar167 + 6] * (double)local_4640._480_8_ +
             pdVar164[lVar149 + lVar167 + 6] * (double)local_4640._768_8_;
        (local_4a70.m_data + lVar154 + 0x4e)[1] =
             dVar158 * (double)local_4640._488_8_ + dVar196 * (double)local_4640._776_8_;
        dVar158 = (pdVar164 + lVar170 + lVar167 + 8)[1];
        dVar196 = (pdVar164 + lVar149 + lVar167 + 8)[1];
        local_4a70.m_data[lVar154 + 0x50] =
             pdVar164[lVar170 + lVar167 + 8] * (double)local_4640._496_8_ +
             pdVar164[lVar149 + lVar167 + 8] * (double)local_4640._784_8_;
        (local_4a70.m_data + lVar154 + 0x50)[1] =
             dVar158 * (double)local_4640._504_8_ + dVar196 * (double)local_4640._792_8_;
        dVar158 = (pdVar164 + lVar170 + lVar167 + 10)[1];
        dVar196 = (pdVar164 + lVar149 + lVar167 + 10)[1];
        local_4a70.m_data[lVar154 + 0x52] =
             pdVar164[lVar170 + lVar167 + 10] * (double)local_4640._512_8_ +
             pdVar164[lVar149 + lVar167 + 10] * (double)local_4640._800_8_;
        (local_4a70.m_data + lVar154 + 0x52)[1] =
             dVar158 * (double)local_4640._520_8_ + dVar196 * (double)local_4640._808_8_;
        dVar158 = (pdVar164 + lVar170 + lVar167 + 0xc)[1];
        dVar196 = (pdVar164 + lVar149 + lVar167 + 0xc)[1];
        local_4a70.m_data[lVar154 + 0x54] =
             pdVar164[lVar170 + lVar167 + 0xc] * (double)local_4640._528_8_ +
             pdVar164[lVar149 + lVar167 + 0xc] * (double)local_4640._816_8_;
        (local_4a70.m_data + lVar154 + 0x54)[1] =
             dVar158 * (double)local_4640._536_8_ + dVar196 * (double)local_4640._824_8_;
        dVar158 = (pdVar164 + lVar170 + lVar167 + 0xe)[1];
        dVar196 = (pdVar164 + lVar149 + lVar167 + 0xe)[1];
        local_4a70.m_data[lVar154 + 0x56] =
             pdVar164[lVar170 + lVar167 + 0xe] * (double)local_4640._544_8_ +
             pdVar164[lVar149 + lVar167 + 0xe] * (double)local_4640._832_8_;
        (local_4a70.m_data + lVar154 + 0x56)[1] =
             dVar158 * (double)local_4640._552_8_ + dVar196 * (double)local_4640._840_8_;
        dVar158 = (pdVar164 + lVar149 + lVar167 + 0x10)[1];
        dVar196 = (pdVar164 + lVar170 + lVar167 + 0x10)[1];
        local_4a70.m_data[lVar154 + 0x58] =
             pdVar164[lVar170 + lVar167 + 0x10] * (double)local_4640._560_8_ +
             pdVar164[lVar149 + lVar167 + 0x10] * (double)local_4640._848_8_;
        (local_4a70.m_data + lVar154 + 0x58)[1] =
             dVar196 * (double)local_4640._568_8_ + dVar158 * (double)local_4640._856_8_;
        dVar158 = (double)CONCAT44(local_4920._4_4_,iVar153);
        if (((((local_4a50->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_rows <= lVar163) ||
             (uVar166 = (local_4a50->m_SD).
                        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                        m_cols, dVar158 = (double)CONCAT44(local_4920._4_4_,iVar153),
             (long)uVar166 < (long)local_4a80)) ||
            (dVar158 = (double)CONCAT44(local_4920._4_4_,iVar153), uVar166 < uVar160)) ||
           ((dVar158 = (double)CONCAT44(local_4920._4_4_,iVar153), local_4a70.m_rows <= lVar165 ||
            (dVar158 = (double)CONCAT44(local_4920._4_4_,iVar153), local_4a70.m_cols < 0x6c))))
        goto LAB_00751a80;
        pdVar164 = (local_4a50->m_SD).
                   super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data
        ;
        lVar154 = uVar166 * lVar163;
        lVar165 = local_4a70.m_cols * lVar165;
        dVar158 = (pdVar164 + lVar168 + lVar154)[1];
        dVar196 = (pdVar164 + lVar149 + lVar154)[1];
        local_4a70.m_data[lVar165 + 0x5a] =
             pdVar164[lVar168 + lVar154] * (double)local_4640._432_8_ +
             pdVar164[lVar149 + lVar154] * (double)local_4640._576_8_;
        (local_4a70.m_data + lVar165 + 0x5a)[1] =
             dVar158 * (double)local_4640._440_8_ + dVar196 * (double)local_4640._584_8_;
        dVar158 = (pdVar164 + lVar168 + lVar154 + 2)[1];
        dVar196 = (pdVar164 + lVar149 + lVar154 + 2)[1];
        local_4a70.m_data[lVar165 + 0x5c] =
             pdVar164[lVar168 + lVar154 + 2] * (double)local_4640._448_8_ +
             pdVar164[lVar149 + lVar154 + 2] * (double)local_4640._592_8_;
        (local_4a70.m_data + lVar165 + 0x5c)[1] =
             dVar158 * (double)local_4640._456_8_ + dVar196 * (double)local_4640._600_8_;
        dVar158 = (pdVar164 + lVar168 + lVar154 + 4)[1];
        dVar196 = (pdVar164 + lVar149 + lVar154 + 4)[1];
        local_4a70.m_data[lVar165 + 0x5e] =
             pdVar164[lVar168 + lVar154 + 4] * (double)local_4640._464_8_ +
             pdVar164[lVar149 + lVar154 + 4] * (double)local_4640._608_8_;
        (local_4a70.m_data + lVar165 + 0x5e)[1] =
             dVar158 * (double)local_4640._472_8_ + dVar196 * (double)local_4640._616_8_;
        dVar158 = (pdVar164 + lVar168 + lVar154 + 6)[1];
        dVar196 = (pdVar164 + lVar149 + lVar154 + 6)[1];
        local_4a70.m_data[lVar165 + 0x60] =
             pdVar164[lVar168 + lVar154 + 6] * (double)local_4640._480_8_ +
             pdVar164[lVar149 + lVar154 + 6] * (double)local_4640._624_8_;
        (local_4a70.m_data + lVar165 + 0x60)[1] =
             dVar158 * (double)local_4640._488_8_ + dVar196 * (double)local_4640._632_8_;
        dVar158 = (pdVar164 + lVar168 + lVar154 + 8)[1];
        dVar196 = (pdVar164 + lVar149 + lVar154 + 8)[1];
        local_4a70.m_data[lVar165 + 0x62] =
             pdVar164[lVar168 + lVar154 + 8] * (double)local_4640._496_8_ +
             pdVar164[lVar149 + lVar154 + 8] * (double)local_4640._640_8_;
        (local_4a70.m_data + lVar165 + 0x62)[1] =
             dVar158 * (double)local_4640._504_8_ + dVar196 * (double)local_4640._648_8_;
        dVar158 = (pdVar164 + lVar168 + lVar154 + 10)[1];
        dVar196 = (pdVar164 + lVar149 + lVar154 + 10)[1];
        local_4a70.m_data[lVar165 + 100] =
             pdVar164[lVar168 + lVar154 + 10] * (double)local_4640._512_8_ +
             pdVar164[lVar149 + lVar154 + 10] * (double)local_4640._656_8_;
        (local_4a70.m_data + lVar165 + 100)[1] =
             dVar158 * (double)local_4640._520_8_ + dVar196 * (double)local_4640._664_8_;
        dVar158 = (pdVar164 + lVar168 + lVar154 + 0xc)[1];
        dVar196 = (pdVar164 + lVar149 + lVar154 + 0xc)[1];
        local_4a70.m_data[lVar165 + 0x66] =
             pdVar164[lVar168 + lVar154 + 0xc] * (double)local_4640._528_8_ +
             pdVar164[lVar149 + lVar154 + 0xc] * (double)local_4640._672_8_;
        (local_4a70.m_data + lVar165 + 0x66)[1] =
             dVar158 * (double)local_4640._536_8_ + dVar196 * (double)local_4640._680_8_;
        dVar158 = (pdVar164 + lVar168 + lVar154 + 0xe)[1];
        dVar196 = (pdVar164 + lVar149 + lVar154 + 0xe)[1];
        local_4a70.m_data[lVar165 + 0x68] =
             pdVar164[lVar168 + lVar154 + 0xe] * (double)local_4640._544_8_ +
             pdVar164[lVar149 + lVar154 + 0xe] * (double)local_4640._688_8_;
        (local_4a70.m_data + lVar165 + 0x68)[1] =
             dVar158 * (double)local_4640._552_8_ + dVar196 * (double)local_4640._696_8_;
        dVar158 = (pdVar164 + lVar168 + lVar154 + 0x10)[1];
        dVar196 = (pdVar164 + lVar149 + lVar154 + 0x10)[1];
        local_4a70.m_data[lVar165 + 0x6a] =
             pdVar164[lVar168 + lVar154 + 0x10] * (double)local_4640._560_8_ +
             pdVar164[lVar149 + lVar154 + 0x10] * (double)local_4640._704_8_;
        (local_4a70.m_data + lVar165 + 0x6a)[1] =
             dVar158 * (double)local_4640._568_8_ + dVar196 * (double)local_4640._712_8_;
        dVar158 = (double)CONCAT44(local_4920._4_4_,iVar153);
        if ((((local_4a50->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar163) ||
            ((lVar154 = (local_4a50->m_SD).
                        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                        m_cols, dVar158 = (double)CONCAT44(local_4920._4_4_,iVar153),
             lVar154 < (long)uVar160 ||
             (lVar165 = lVar159 + 2, dVar158 = (double)CONCAT44(local_4920._4_4_,iVar153),
             local_4a70.m_rows <= lVar165)))) ||
           (dVar158 = (double)CONCAT44(local_4920._4_4_,iVar153), local_4a70.m_cols < 0x12))
        goto LAB_00751a80;
        pdVar164 = (local_4a50->m_SD).
                   super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data
        ;
        lVar154 = lVar154 * lVar163;
        lVar167 = local_4a70.m_cols * lVar165;
        dVar158 = (pdVar164 + lVar149 + lVar154)[1];
        local_4a70.m_data[lVar167] = pdVar164[lVar149 + lVar154] * (double)local_4640._864_8_;
        (local_4a70.m_data + lVar167)[1] = dVar158 * (double)local_4640._872_8_;
        dVar158 = (pdVar164 + lVar149 + lVar154 + 2)[1];
        local_4a70.m_data[lVar167 + 2] =
             pdVar164[lVar149 + lVar154 + 2] * (double)local_4640._880_8_;
        (local_4a70.m_data + lVar167 + 2)[1] = dVar158 * (double)local_4640._888_8_;
        dVar158 = (pdVar164 + lVar149 + lVar154 + 4)[1];
        local_4a70.m_data[lVar167 + 4] =
             pdVar164[lVar149 + lVar154 + 4] * (double)local_4640._896_8_;
        (local_4a70.m_data + lVar167 + 4)[1] = dVar158 * (double)local_4640._904_8_;
        dVar158 = (pdVar164 + lVar149 + lVar154 + 6)[1];
        local_4a70.m_data[lVar167 + 6] =
             pdVar164[lVar149 + lVar154 + 6] * (double)local_4640._912_8_;
        (local_4a70.m_data + lVar167 + 6)[1] = dVar158 * (double)local_4640._920_8_;
        dVar158 = (pdVar164 + lVar149 + lVar154 + 8)[1];
        local_4a70.m_data[lVar167 + 8] =
             pdVar164[lVar149 + lVar154 + 8] * (double)local_4640._928_8_;
        (local_4a70.m_data + lVar167 + 8)[1] = dVar158 * (double)local_4640._936_8_;
        dVar158 = (pdVar164 + lVar149 + lVar154 + 10)[1];
        local_4a70.m_data[lVar167 + 10] =
             pdVar164[lVar149 + lVar154 + 10] * (double)local_4640._944_8_;
        (local_4a70.m_data + lVar167 + 10)[1] = dVar158 * (double)local_4640._952_8_;
        dVar158 = (pdVar164 + lVar149 + lVar154 + 0xc)[1];
        local_4a70.m_data[lVar167 + 0xc] =
             pdVar164[lVar149 + lVar154 + 0xc] * (double)local_4640._960_8_;
        (local_4a70.m_data + lVar167 + 0xc)[1] = dVar158 * (double)local_4640._968_8_;
        dVar158 = (pdVar164 + lVar149 + lVar154 + 0xe)[1];
        local_4a70.m_data[lVar167 + 0xe] =
             pdVar164[lVar149 + lVar154 + 0xe] * (double)local_4640._976_8_;
        (local_4a70.m_data + lVar167 + 0xe)[1] = dVar158 * (double)local_4640._984_8_;
        dVar158 = (pdVar164 + lVar149 + lVar154 + 0x10)[1];
        local_4a70.m_data[lVar167 + 0x10] =
             pdVar164[lVar149 + lVar154 + 0x10] * (double)local_4640._992_8_;
        (local_4a70.m_data + lVar167 + 0x10)[1] = dVar158 * (double)local_4640._1000_8_;
        dVar158 = (double)CONCAT44(local_4920._4_4_,iVar153);
        if (((((local_4a50->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_rows <= lVar163) ||
             (lVar154 = (local_4a50->m_SD).
                        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                        m_cols, dVar158 = (double)CONCAT44(local_4920._4_4_,iVar153),
             lVar154 < (long)local_4a80)) ||
            (dVar158 = (double)CONCAT44(local_4920._4_4_,iVar153), local_4a70.m_rows <= lVar165)) ||
           (dVar158 = (double)CONCAT44(local_4920._4_4_,iVar153), local_4a70.m_cols < 0x24))
        goto LAB_00751a80;
        pdVar164 = (local_4a50->m_SD).
                   super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data
        ;
        lVar154 = lVar154 * lVar163;
        lVar167 = local_4a70.m_cols * lVar165;
        dVar158 = (pdVar164 + lVar168 + lVar154)[1];
        local_4a70.m_data[lVar167 + 0x12] =
             pdVar164[lVar168 + lVar154] * (double)local_4640._1008_8_;
        (local_4a70.m_data + lVar167 + 0x12)[1] = dVar158 * (double)local_4640._1016_8_;
        dVar158 = (pdVar164 + lVar168 + lVar154 + 2)[1];
        local_4a70.m_data[lVar167 + 0x14] =
             pdVar164[lVar168 + lVar154 + 2] * (double)local_4640._1024_8_;
        (local_4a70.m_data + lVar167 + 0x14)[1] = dVar158 * (double)local_4640._1032_8_;
        dVar158 = (pdVar164 + lVar168 + lVar154 + 4)[1];
        local_4a70.m_data[lVar167 + 0x16] =
             pdVar164[lVar168 + lVar154 + 4] * (double)local_4640._1040_8_;
        (local_4a70.m_data + lVar167 + 0x16)[1] = dVar158 * (double)local_4640._1048_8_;
        dVar158 = (pdVar164 + lVar168 + lVar154 + 6)[1];
        local_4a70.m_data[lVar167 + 0x18] =
             pdVar164[lVar168 + lVar154 + 6] * (double)local_4640._1056_8_;
        (local_4a70.m_data + lVar167 + 0x18)[1] = dVar158 * (double)local_4640._1064_8_;
        dVar158 = (pdVar164 + lVar168 + lVar154 + 8)[1];
        local_4a70.m_data[lVar167 + 0x1a] =
             pdVar164[lVar168 + lVar154 + 8] * (double)local_4640._1072_8_;
        (local_4a70.m_data + lVar167 + 0x1a)[1] = dVar158 * (double)local_4640._1080_8_;
        dVar158 = (pdVar164 + lVar168 + lVar154 + 10)[1];
        local_4a70.m_data[lVar167 + 0x1c] =
             pdVar164[lVar168 + lVar154 + 10] * (double)local_4640._1088_8_;
        (local_4a70.m_data + lVar167 + 0x1c)[1] = dVar158 * (double)local_4640._1096_8_;
        dVar158 = (pdVar164 + lVar168 + lVar154 + 0xc)[1];
        local_4a70.m_data[lVar167 + 0x1e] =
             pdVar164[lVar168 + lVar154 + 0xc] * (double)local_4640._1104_8_;
        (local_4a70.m_data + lVar167 + 0x1e)[1] = dVar158 * (double)local_4640._1112_8_;
        dVar158 = (pdVar164 + lVar168 + lVar154 + 0xe)[1];
        local_4a70.m_data[lVar167 + 0x20] =
             pdVar164[lVar168 + lVar154 + 0xe] * (double)local_4640._1120_8_;
        (local_4a70.m_data + lVar167 + 0x20)[1] = dVar158 * (double)local_4640._1128_8_;
        dVar158 = (pdVar164 + lVar168 + lVar154 + 0x10)[1];
        local_4a70.m_data[lVar167 + 0x22] =
             pdVar164[lVar168 + lVar154 + 0x10] * (double)local_4640._1136_8_;
        (local_4a70.m_data + lVar167 + 0x22)[1] = dVar158 * (double)local_4640._1144_8_;
        dVar158 = (double)CONCAT44(local_4920._4_4_,iVar153);
        if ((((local_4a50->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar163) ||
            (lVar154 = (local_4a50->m_SD).
                       super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                       m_cols, dVar158 = (double)CONCAT44(local_4920._4_4_,iVar153),
            lVar154 < local_4a78)) ||
           ((dVar158 = (double)CONCAT44(local_4920._4_4_,iVar153), local_4a70.m_rows <= lVar165 ||
            (dVar158 = (double)CONCAT44(local_4920._4_4_,iVar153), local_4a70.m_cols < 0x36))))
        goto LAB_00751a80;
        pdVar164 = (local_4a50->m_SD).
                   super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data
        ;
        lVar154 = lVar154 * lVar163;
        lVar167 = local_4a70.m_cols * lVar165;
        dVar158 = (pdVar164 + lVar170 + lVar154)[1];
        local_4a70.m_data[lVar167 + 0x24] =
             pdVar164[lVar170 + lVar154] * (double)local_4640._1152_8_;
        (local_4a70.m_data + lVar167 + 0x24)[1] = dVar158 * (double)local_4640._1160_8_;
        dVar158 = (pdVar164 + lVar170 + lVar154 + 2)[1];
        local_4a70.m_data[lVar167 + 0x26] =
             pdVar164[lVar170 + lVar154 + 2] * (double)local_4640._1168_8_;
        (local_4a70.m_data + lVar167 + 0x26)[1] = dVar158 * (double)local_4640._1176_8_;
        dVar158 = (pdVar164 + lVar170 + lVar154 + 4)[1];
        local_4a70.m_data[lVar167 + 0x28] =
             pdVar164[lVar170 + lVar154 + 4] * (double)local_4640._1184_8_;
        (local_4a70.m_data + lVar167 + 0x28)[1] = dVar158 * (double)local_4640._1192_8_;
        dVar158 = (pdVar164 + lVar170 + lVar154 + 6)[1];
        local_4a70.m_data[lVar167 + 0x2a] =
             pdVar164[lVar170 + lVar154 + 6] * (double)local_4640._1200_8_;
        (local_4a70.m_data + lVar167 + 0x2a)[1] = dVar158 * (double)local_4640._1208_8_;
        dVar158 = (pdVar164 + lVar170 + lVar154 + 8)[1];
        local_4a70.m_data[lVar167 + 0x2c] =
             pdVar164[lVar170 + lVar154 + 8] * (double)local_4640._1216_8_;
        (local_4a70.m_data + lVar167 + 0x2c)[1] = dVar158 * (double)local_4640._1224_8_;
        dVar158 = (pdVar164 + lVar170 + lVar154 + 10)[1];
        local_4a70.m_data[lVar167 + 0x2e] =
             pdVar164[lVar170 + lVar154 + 10] * (double)local_4640._1232_8_;
        (local_4a70.m_data + lVar167 + 0x2e)[1] = dVar158 * (double)local_4640._1240_8_;
        dVar158 = (pdVar164 + lVar170 + lVar154 + 0xc)[1];
        local_4a70.m_data[lVar167 + 0x30] =
             pdVar164[lVar170 + lVar154 + 0xc] * (double)local_4640._1248_8_;
        (local_4a70.m_data + lVar167 + 0x30)[1] = dVar158 * (double)local_4640._1256_8_;
        dVar158 = (pdVar164 + lVar170 + lVar154 + 0xe)[1];
        local_4a70.m_data[lVar167 + 0x32] =
             pdVar164[lVar170 + lVar154 + 0xe] * (double)local_4640._1264_8_;
        (local_4a70.m_data + lVar167 + 0x32)[1] = dVar158 * (double)local_4640._1272_8_;
        dVar158 = (pdVar164 + lVar170 + lVar154 + 0x10)[1];
        local_4a70.m_data[lVar167 + 0x34] =
             pdVar164[lVar170 + lVar154 + 0x10] * (double)local_4640._1280_8_;
        (local_4a70.m_data + lVar167 + 0x34)[1] = dVar158 * (double)local_4640._1288_8_;
        dVar158 = (double)CONCAT44(local_4920._4_4_,iVar153);
        if (((((local_4a50->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_rows <= lVar163) ||
             (uVar166 = (local_4a50->m_SD).
                        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                        m_cols, dVar158 = (double)CONCAT44(local_4920._4_4_,iVar153),
             (long)uVar166 < local_4a78)) ||
            (dVar158 = (double)CONCAT44(local_4920._4_4_,iVar153), uVar166 < local_4a80)) ||
           ((dVar158 = (double)CONCAT44(local_4920._4_4_,iVar153), local_4a70.m_rows <= lVar165 ||
            (dVar158 = (double)CONCAT44(local_4920._4_4_,iVar153), local_4a70.m_cols < 0x48))))
        goto LAB_00751a80;
        pdVar164 = (local_4a50->m_SD).
                   super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data
        ;
        lVar154 = uVar166 * lVar163;
        lVar167 = local_4a70.m_cols * lVar165;
        dVar158 = (pdVar164 + lVar170 + lVar154)[1];
        dVar196 = (pdVar164 + lVar168 + lVar154)[1];
        local_4a70.m_data[lVar167 + 0x36] =
             pdVar164[lVar170 + lVar154] * (double)local_4640._1008_8_ +
             pdVar164[lVar168 + lVar154] * (double)local_4640._1152_8_;
        (local_4a70.m_data + lVar167 + 0x36)[1] =
             dVar158 * (double)local_4640._1016_8_ + dVar196 * (double)local_4640._1160_8_;
        dVar158 = (pdVar164 + lVar170 + lVar154 + 2)[1];
        dVar196 = (pdVar164 + lVar168 + lVar154 + 2)[1];
        local_4a70.m_data[lVar167 + 0x38] =
             pdVar164[lVar170 + lVar154 + 2] * (double)local_4640._1024_8_ +
             pdVar164[lVar168 + lVar154 + 2] * (double)local_4640._1168_8_;
        (local_4a70.m_data + lVar167 + 0x38)[1] =
             dVar158 * (double)local_4640._1032_8_ + dVar196 * (double)local_4640._1176_8_;
        dVar158 = (pdVar164 + lVar170 + lVar154 + 4)[1];
        dVar196 = (pdVar164 + lVar168 + lVar154 + 4)[1];
        local_4a70.m_data[lVar167 + 0x3a] =
             pdVar164[lVar170 + lVar154 + 4] * (double)local_4640._1040_8_ +
             pdVar164[lVar168 + lVar154 + 4] * (double)local_4640._1184_8_;
        (local_4a70.m_data + lVar167 + 0x3a)[1] =
             dVar158 * (double)local_4640._1048_8_ + dVar196 * (double)local_4640._1192_8_;
        dVar158 = (pdVar164 + lVar170 + lVar154 + 6)[1];
        dVar196 = (pdVar164 + lVar168 + lVar154 + 6)[1];
        local_4a70.m_data[lVar167 + 0x3c] =
             pdVar164[lVar170 + lVar154 + 6] * (double)local_4640._1056_8_ +
             pdVar164[lVar168 + lVar154 + 6] * (double)local_4640._1200_8_;
        (local_4a70.m_data + lVar167 + 0x3c)[1] =
             dVar158 * (double)local_4640._1064_8_ + dVar196 * (double)local_4640._1208_8_;
        dVar158 = (pdVar164 + lVar170 + lVar154 + 8)[1];
        dVar196 = (pdVar164 + lVar168 + lVar154 + 8)[1];
        local_4a70.m_data[lVar167 + 0x3e] =
             pdVar164[lVar170 + lVar154 + 8] * (double)local_4640._1072_8_ +
             pdVar164[lVar168 + lVar154 + 8] * (double)local_4640._1216_8_;
        (local_4a70.m_data + lVar167 + 0x3e)[1] =
             dVar158 * (double)local_4640._1080_8_ + dVar196 * (double)local_4640._1224_8_;
        dVar158 = (pdVar164 + lVar170 + lVar154 + 10)[1];
        dVar196 = (pdVar164 + lVar168 + lVar154 + 10)[1];
        local_4a70.m_data[lVar167 + 0x40] =
             pdVar164[lVar170 + lVar154 + 10] * (double)local_4640._1088_8_ +
             pdVar164[lVar168 + lVar154 + 10] * (double)local_4640._1232_8_;
        (local_4a70.m_data + lVar167 + 0x40)[1] =
             dVar158 * (double)local_4640._1096_8_ + dVar196 * (double)local_4640._1240_8_;
        dVar158 = (pdVar164 + lVar170 + lVar154 + 0xc)[1];
        dVar196 = (pdVar164 + lVar168 + lVar154 + 0xc)[1];
        local_4a70.m_data[lVar167 + 0x42] =
             pdVar164[lVar170 + lVar154 + 0xc] * (double)local_4640._1104_8_ +
             pdVar164[lVar168 + lVar154 + 0xc] * (double)local_4640._1248_8_;
        (local_4a70.m_data + lVar167 + 0x42)[1] =
             dVar158 * (double)local_4640._1112_8_ + dVar196 * (double)local_4640._1256_8_;
        dVar158 = (pdVar164 + lVar170 + lVar154 + 0xe)[1];
        dVar196 = (pdVar164 + lVar168 + lVar154 + 0xe)[1];
        local_4a70.m_data[lVar167 + 0x44] =
             pdVar164[lVar170 + lVar154 + 0xe] * (double)local_4640._1120_8_ +
             pdVar164[lVar168 + lVar154 + 0xe] * (double)local_4640._1264_8_;
        (local_4a70.m_data + lVar167 + 0x44)[1] =
             dVar158 * (double)local_4640._1128_8_ + dVar196 * (double)local_4640._1272_8_;
        dVar158 = (pdVar164 + lVar170 + lVar154 + 0x10)[1];
        dVar196 = (pdVar164 + lVar168 + lVar154 + 0x10)[1];
        local_4a70.m_data[lVar167 + 0x46] =
             pdVar164[lVar170 + lVar154 + 0x10] * (double)local_4640._1136_8_ +
             pdVar164[lVar168 + lVar154 + 0x10] * (double)local_4640._1280_8_;
        (local_4a70.m_data + lVar167 + 0x46)[1] =
             dVar158 * (double)local_4640._1144_8_ + dVar196 * (double)local_4640._1288_8_;
        dVar158 = (double)CONCAT44(local_4920._4_4_,iVar153);
        if (((local_4a50->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
             m_storage.m_rows <= lVar163) ||
           ((((uVar166 = (local_4a50->m_SD).
                         super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                         m_cols, dVar158 = (double)CONCAT44(local_4920._4_4_,iVar153),
              (long)uVar166 < local_4a78 ||
              (dVar158 = (double)CONCAT44(local_4920._4_4_,iVar153), uVar166 < uVar160)) ||
             (dVar158 = (double)CONCAT44(local_4920._4_4_,iVar153), local_4a70.m_rows <= lVar165))
            || (dVar158 = (double)CONCAT44(local_4920._4_4_,iVar153), local_4a70.m_cols < 0x5a))))
        goto LAB_00751a80;
        pdVar164 = (local_4a50->m_SD).
                   super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data
        ;
        lVar154 = uVar166 * lVar163;
        lVar167 = local_4a70.m_cols * lVar165;
        dVar158 = (pdVar164 + lVar170 + lVar154)[1];
        dVar196 = (pdVar164 + lVar149 + lVar154)[1];
        local_4a70.m_data[lVar167 + 0x48] =
             pdVar164[lVar170 + lVar154] * (double)local_4640._864_8_ +
             pdVar164[lVar149 + lVar154] * (double)local_4640._1152_8_;
        (local_4a70.m_data + lVar167 + 0x48)[1] =
             dVar158 * (double)local_4640._872_8_ + dVar196 * (double)local_4640._1160_8_;
        dVar158 = (pdVar164 + lVar170 + lVar154 + 2)[1];
        dVar196 = (pdVar164 + lVar149 + lVar154 + 2)[1];
        local_4a70.m_data[lVar167 + 0x4a] =
             pdVar164[lVar170 + lVar154 + 2] * (double)local_4640._880_8_ +
             pdVar164[lVar149 + lVar154 + 2] * (double)local_4640._1168_8_;
        (local_4a70.m_data + lVar167 + 0x4a)[1] =
             dVar158 * (double)local_4640._888_8_ + dVar196 * (double)local_4640._1176_8_;
        dVar158 = (pdVar164 + lVar170 + lVar154 + 4)[1];
        dVar196 = (pdVar164 + lVar149 + lVar154 + 4)[1];
        local_4a70.m_data[lVar167 + 0x4c] =
             pdVar164[lVar170 + lVar154 + 4] * (double)local_4640._896_8_ +
             pdVar164[lVar149 + lVar154 + 4] * (double)local_4640._1184_8_;
        (local_4a70.m_data + lVar167 + 0x4c)[1] =
             dVar158 * (double)local_4640._904_8_ + dVar196 * (double)local_4640._1192_8_;
        dVar158 = (pdVar164 + lVar170 + lVar154 + 6)[1];
        dVar196 = (pdVar164 + lVar149 + lVar154 + 6)[1];
        local_4a70.m_data[lVar167 + 0x4e] =
             pdVar164[lVar170 + lVar154 + 6] * (double)local_4640._912_8_ +
             pdVar164[lVar149 + lVar154 + 6] * (double)local_4640._1200_8_;
        (local_4a70.m_data + lVar167 + 0x4e)[1] =
             dVar158 * (double)local_4640._920_8_ + dVar196 * (double)local_4640._1208_8_;
        dVar158 = (pdVar164 + lVar170 + lVar154 + 8)[1];
        dVar196 = (pdVar164 + lVar149 + lVar154 + 8)[1];
        local_4a70.m_data[lVar167 + 0x50] =
             pdVar164[lVar170 + lVar154 + 8] * (double)local_4640._928_8_ +
             pdVar164[lVar149 + lVar154 + 8] * (double)local_4640._1216_8_;
        (local_4a70.m_data + lVar167 + 0x50)[1] =
             dVar158 * (double)local_4640._936_8_ + dVar196 * (double)local_4640._1224_8_;
        dVar158 = (pdVar164 + lVar170 + lVar154 + 10)[1];
        dVar196 = (pdVar164 + lVar149 + lVar154 + 10)[1];
        local_4a70.m_data[lVar167 + 0x52] =
             pdVar164[lVar170 + lVar154 + 10] * (double)local_4640._944_8_ +
             pdVar164[lVar149 + lVar154 + 10] * (double)local_4640._1232_8_;
        (local_4a70.m_data + lVar167 + 0x52)[1] =
             dVar158 * (double)local_4640._952_8_ + dVar196 * (double)local_4640._1240_8_;
        dVar158 = (pdVar164 + lVar170 + lVar154 + 0xc)[1];
        dVar196 = (pdVar164 + lVar149 + lVar154 + 0xc)[1];
        local_4a70.m_data[lVar167 + 0x54] =
             pdVar164[lVar170 + lVar154 + 0xc] * (double)local_4640._960_8_ +
             pdVar164[lVar149 + lVar154 + 0xc] * (double)local_4640._1248_8_;
        (local_4a70.m_data + lVar167 + 0x54)[1] =
             dVar158 * (double)local_4640._968_8_ + dVar196 * (double)local_4640._1256_8_;
        dVar158 = (pdVar164 + lVar170 + lVar154 + 0xe)[1];
        dVar196 = (pdVar164 + lVar149 + lVar154 + 0xe)[1];
        local_4a70.m_data[lVar167 + 0x56] =
             pdVar164[lVar170 + lVar154 + 0xe] * (double)local_4640._976_8_ +
             pdVar164[lVar149 + lVar154 + 0xe] * (double)local_4640._1264_8_;
        (local_4a70.m_data + lVar167 + 0x56)[1] =
             dVar158 * (double)local_4640._984_8_ + dVar196 * (double)local_4640._1272_8_;
        dVar158 = (pdVar164 + lVar170 + lVar154 + 0x10)[1];
        dVar196 = (pdVar164 + lVar149 + lVar154 + 0x10)[1];
        local_4a70.m_data[lVar167 + 0x58] =
             pdVar164[lVar170 + lVar154 + 0x10] * (double)local_4640._992_8_ +
             pdVar164[lVar149 + lVar154 + 0x10] * (double)local_4640._1280_8_;
        (local_4a70.m_data + lVar167 + 0x58)[1] =
             dVar158 * (double)local_4640._1000_8_ + dVar196 * (double)local_4640._1288_8_;
        dVar158 = (double)CONCAT44(local_4920._4_4_,iVar153);
        if ((((local_4a50->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar163) ||
            (uVar166 = (local_4a50->m_SD).
                       super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                       m_cols, dVar158 = (double)CONCAT44(local_4920._4_4_,iVar153),
            (long)uVar166 < (long)local_4a80)) ||
           ((dVar158 = (double)CONCAT44(local_4920._4_4_,iVar153), uVar166 < uVar160 ||
            ((dVar158 = (double)CONCAT44(local_4920._4_4_,iVar153), local_4a70.m_rows <= lVar165 ||
             (dVar158 = (double)CONCAT44(local_4920._4_4_,iVar153), local_4a70.m_cols < 0x6c))))))
        goto LAB_00751a80;
        pdVar164 = (local_4a50->m_SD).
                   super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data
        ;
        lVar154 = uVar166 * lVar163;
        lVar165 = local_4a70.m_cols * lVar165;
        lVar163 = lVar163 + 1;
        lVar159 = lVar159 + 3;
        dVar158 = (pdVar164 + lVar168 + lVar154)[1];
        dVar196 = (pdVar164 + lVar149 + lVar154)[1];
        local_4a70.m_data[lVar165 + 0x5a] =
             pdVar164[lVar168 + lVar154] * (double)local_4640._864_8_ +
             pdVar164[lVar149 + lVar154] * (double)local_4640._1008_8_;
        (local_4a70.m_data + lVar165 + 0x5a)[1] =
             dVar158 * (double)local_4640._872_8_ + dVar196 * (double)local_4640._1016_8_;
        dVar158 = (pdVar164 + lVar168 + lVar154 + 2)[1];
        dVar196 = (pdVar164 + lVar149 + lVar154 + 2)[1];
        local_4a70.m_data[lVar165 + 0x5c] =
             pdVar164[lVar168 + lVar154 + 2] * (double)local_4640._880_8_ +
             pdVar164[lVar149 + lVar154 + 2] * (double)local_4640._1024_8_;
        (local_4a70.m_data + lVar165 + 0x5c)[1] =
             dVar158 * (double)local_4640._888_8_ + dVar196 * (double)local_4640._1032_8_;
        dVar158 = (pdVar164 + lVar168 + lVar154 + 4)[1];
        dVar196 = (pdVar164 + lVar149 + lVar154 + 4)[1];
        local_4a70.m_data[lVar165 + 0x5e] =
             pdVar164[lVar168 + lVar154 + 4] * (double)local_4640._896_8_ +
             pdVar164[lVar149 + lVar154 + 4] * (double)local_4640._1040_8_;
        (local_4a70.m_data + lVar165 + 0x5e)[1] =
             dVar158 * (double)local_4640._904_8_ + dVar196 * (double)local_4640._1048_8_;
        dVar158 = (pdVar164 + lVar168 + lVar154 + 6)[1];
        dVar196 = (pdVar164 + lVar149 + lVar154 + 6)[1];
        local_4a70.m_data[lVar165 + 0x60] =
             pdVar164[lVar168 + lVar154 + 6] * (double)local_4640._912_8_ +
             pdVar164[lVar149 + lVar154 + 6] * (double)local_4640._1056_8_;
        (local_4a70.m_data + lVar165 + 0x60)[1] =
             dVar158 * (double)local_4640._920_8_ + dVar196 * (double)local_4640._1064_8_;
        dVar158 = (pdVar164 + lVar168 + lVar154 + 8)[1];
        dVar196 = (pdVar164 + lVar149 + lVar154 + 8)[1];
        local_4a70.m_data[lVar165 + 0x62] =
             pdVar164[lVar168 + lVar154 + 8] * (double)local_4640._928_8_ +
             pdVar164[lVar149 + lVar154 + 8] * (double)local_4640._1072_8_;
        (local_4a70.m_data + lVar165 + 0x62)[1] =
             dVar158 * (double)local_4640._936_8_ + dVar196 * (double)local_4640._1080_8_;
        dVar158 = (pdVar164 + lVar168 + lVar154 + 10)[1];
        dVar196 = (pdVar164 + lVar149 + lVar154 + 10)[1];
        local_4a70.m_data[lVar165 + 100] =
             pdVar164[lVar168 + lVar154 + 10] * (double)local_4640._944_8_ +
             pdVar164[lVar149 + lVar154 + 10] * (double)local_4640._1088_8_;
        (local_4a70.m_data + lVar165 + 100)[1] =
             dVar158 * (double)local_4640._952_8_ + dVar196 * (double)local_4640._1096_8_;
        dVar158 = (pdVar164 + lVar168 + lVar154 + 0xc)[1];
        dVar196 = (pdVar164 + lVar149 + lVar154 + 0xc)[1];
        local_4a70.m_data[lVar165 + 0x66] =
             pdVar164[lVar168 + lVar154 + 0xc] * (double)local_4640._960_8_ +
             pdVar164[lVar149 + lVar154 + 0xc] * (double)local_4640._1104_8_;
        (local_4a70.m_data + lVar165 + 0x66)[1] =
             dVar158 * (double)local_4640._968_8_ + dVar196 * (double)local_4640._1112_8_;
        dVar158 = (pdVar164 + lVar168 + lVar154 + 0xe)[1];
        dVar196 = (pdVar164 + lVar149 + lVar154 + 0xe)[1];
        local_4a70.m_data[lVar165 + 0x68] =
             pdVar164[lVar168 + lVar154 + 0xe] * (double)local_4640._976_8_ +
             pdVar164[lVar149 + lVar154 + 0xe] * (double)local_4640._1120_8_;
        (local_4a70.m_data + lVar165 + 0x68)[1] =
             dVar158 * (double)local_4640._984_8_ + dVar196 * (double)local_4640._1128_8_;
        dVar158 = (pdVar164 + lVar168 + lVar154 + 0x10)[1];
        dVar196 = (pdVar164 + lVar149 + lVar154 + 0x10)[1];
        local_4a70.m_data[lVar165 + 0x6a] =
             pdVar164[lVar168 + lVar154 + 0x10] * (double)local_4640._992_8_ +
             pdVar164[lVar149 + lVar154 + 0x10] * (double)local_4640._1136_8_;
        (local_4a70.m_data + lVar165 + 0x6a)[1] =
             dVar158 * (double)local_4640._1000_8_ + dVar196 * (double)local_4640._1144_8_;
        this = local_4a50;
      } while (lVar163 != 0x18);
      auVar172._8_8_ = 0;
      auVar172._0_8_ = local_4a50->m_Alpha;
      auVar173._8_8_ = 0;
      auVar173._0_8_ = local_4660;
      pgVar152 = (generic_dense_assignment_kernel<_68f64e37_> *)local_4640;
      pp_Var155 = (_func_int **)(local_4640 + 0x510);
      pgVar150 = &local_3c20;
      lVar149 = 0;
      auVar171 = vfmadd213sd_fma(auVar173,auVar172,auVar171);
      local_47a0._0_8_ = local_4a50->m_Alpha * (double)local_4850;
      local_47a0._8_8_ = pp_Var155;
      pMVar195 = auVar171._0_8_;
      local_2d80 = (undefined1  [8])pMVar195;
      TStack_2d78.m_matrix = (non_const_type)pgVar152;
      do {
        uVar160 = 0xfffffffffffffffe;
        do {
          pDVar12 = (DstXprType *)(&pgVar152->m_functor + uVar160)[1];
          p_Var13 = (pp_Var155 + uVar160 + 2)[1];
          (&pgVar150->m_functor)[uVar160] =
               (assign_op<double,_double> *)
               ((double)pMVar195 * (double)(&pgVar152->m_functor)[uVar160] +
               (double)local_47a0._0_8_ * (double)pp_Var155[uVar160 + 2]);
          (&pgVar150->m_functor + uVar160)[1] =
               (assign_op<double,_double> *)
               ((double)pMVar195 * (double)pDVar12 + (double)local_47a0._0_8_ * (double)p_Var13);
          uVar160 = uVar160 + 2;
        } while (uVar160 < 0x34);
        lVar149 = lVar149 + 1;
        pp_Var155 = pp_Var155 + 0x36;
        pgVar152 = (generic_dense_assignment_kernel<_68f64e37_> *)&pgVar152[0xd].m_functor;
        pgVar150 = (generic_dense_assignment_kernel<_68f64e37_> *)&pgVar150[0xd].m_functor;
      } while (lVar149 != 3);
      local_4920 = (double)(local_49e8 * 0x12 + 0x12);
      if (((local_4a50->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_rows < (long)local_4920) ||
         ((local_4a50->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
          m_storage.m_cols < 1)) goto LAB_00751acd;
      pdVar164 = (local_4a50->m_kGQ).
                 super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data;
      lVar149 = 0x1a0;
      do {
        dVar158 = (pdVar164 + local_49e8 * 0x12)[1];
        *(double *)((long)local_3dc0 + lVar149) =
             pdVar164[local_49e8 * 0x12] * *(double *)((long)local_3dc0 + lVar149);
        *(double *)((long)local_3dc0 + lVar149 + 8) =
             dVar158 * *(double *)((long)local_3dc0 + lVar149 + 8);
        dVar158 = (pdVar164 + local_49e8 * 0x12 + 2)[1];
        *(double *)((long)local_3dc0 + lVar149 + 0x10) =
             pdVar164[local_49e8 * 0x12 + 2] * *(double *)((long)local_3dc0 + lVar149 + 0x10);
        *(double *)((long)local_3dc0 + lVar149 + 0x18) =
             dVar158 * *(double *)((long)local_3dc0 + lVar149 + 0x18);
        dVar158 = (pdVar164 + local_49e8 * 0x12 + 4)[1];
        *(double *)((long)local_3dc0 + lVar149 + 0x20) =
             pdVar164[local_49e8 * 0x12 + 4] * *(double *)((long)local_3dc0 + lVar149 + 0x20);
        *(double *)((long)local_3dc0 + lVar149 + 0x28) =
             dVar158 * *(double *)((long)local_3dc0 + lVar149 + 0x28);
        dVar158 = (pdVar164 + local_49e8 * 0x12 + 6)[1];
        *(double *)((long)local_3dc0 + lVar149 + 0x30) =
             pdVar164[local_49e8 * 0x12 + 6] * *(double *)((long)local_3dc0 + lVar149 + 0x30);
        *(double *)((long)local_3dc0 + lVar149 + 0x38) =
             dVar158 * *(double *)((long)local_3dc0 + lVar149 + 0x38);
        dVar158 = (pdVar164 + local_49e8 * 0x12 + 8)[1];
        *(double *)((long)local_3dc0 + lVar149 + 0x40) =
             pdVar164[local_49e8 * 0x12 + 8] * *(double *)((long)local_3dc0 + lVar149 + 0x40);
        *(double *)((long)local_3dc0 + lVar149 + 0x48) =
             dVar158 * *(double *)((long)local_3dc0 + lVar149 + 0x48);
        dVar158 = (pdVar164 + local_49e8 * 0x12 + 10)[1];
        dVar196 = *(double *)(local_3d60 + lVar149 + -8);
        *(double *)((long)local_3dc0 + lVar149 + 0x50) =
             pdVar164[local_49e8 * 0x12 + 10] * *(double *)((long)local_3dc0 + lVar149 + 0x50);
        *(double *)(local_3d60 + lVar149 + -8) = dVar158 * dVar196;
        dVar158 = (pdVar164 + local_49e8 * 0x12 + 0xc)[1];
        *(double *)(local_3d60 + lVar149) =
             pdVar164[local_49e8 * 0x12 + 0xc] * *(double *)(local_3d60 + lVar149);
        *(double *)(local_3d60 + lVar149 + 8) = dVar158 * *(double *)(local_3d60 + lVar149 + 8);
        dVar158 = (pdVar164 + local_49e8 * 0x12 + 0xe)[1];
        *(double *)(local_3d50 + lVar149) =
             pdVar164[local_49e8 * 0x12 + 0xe] * *(double *)(local_3d50 + lVar149);
        *(double *)(local_3d50 + lVar149 + 8) = dVar158 * *(double *)(local_3d50 + lVar149 + 8);
        dVar158 = (pdVar164 + local_49e8 * 0x12 + 0x10)[1];
        *(double *)((long)local_3d40 + lVar149) =
             pdVar164[local_49e8 * 0x12 + 0x10] * *(double *)((long)local_3d40 + lVar149);
        *(double *)((long)local_3d40 + lVar149 + 8) =
             dVar158 * *(double *)((long)local_3d40 + lVar149 + 8);
        dVar158 = (pdVar164 + local_49e8 * 0x12)[1];
        *(double *)((long)local_3d40 + lVar149 + 0x10) =
             pdVar164[local_49e8 * 0x12] * *(double *)((long)local_3d40 + lVar149 + 0x10);
        *(double *)((long)local_3d40 + lVar149 + 0x18) =
             dVar158 * *(double *)((long)local_3d40 + lVar149 + 0x18);
        dVar158 = (pdVar164 + local_49e8 * 0x12 + 2)[1];
        *(double *)((long)local_3d40 + lVar149 + 0x20) =
             pdVar164[local_49e8 * 0x12 + 2] * *(double *)((long)local_3d40 + lVar149 + 0x20);
        *(double *)((long)local_3d40 + lVar149 + 0x28) =
             dVar158 * *(double *)((long)local_3d40 + lVar149 + 0x28);
        dVar158 = (pdVar164 + local_49e8 * 0x12 + 4)[1];
        *(double *)((long)local_3d40 + lVar149 + 0x30) =
             pdVar164[local_49e8 * 0x12 + 4] * *(double *)((long)local_3d40 + lVar149 + 0x30);
        *(double *)((long)local_3d40 + lVar149 + 0x38) =
             dVar158 * *(double *)((long)local_3d40 + lVar149 + 0x38);
        dVar158 = (pdVar164 + local_49e8 * 0x12 + 6)[1];
        *(double *)((long)local_3d40 + lVar149 + 0x40) =
             pdVar164[local_49e8 * 0x12 + 6] * *(double *)((long)local_3d40 + lVar149 + 0x40);
        *(double *)((long)local_3d40 + lVar149 + 0x48) =
             dVar158 * *(double *)((long)local_3d40 + lVar149 + 0x48);
        dVar158 = (pdVar164 + local_49e8 * 0x12 + 8)[1];
        *(double *)((long)local_3d40 + lVar149 + 0x50) =
             pdVar164[local_49e8 * 0x12 + 8] * *(double *)((long)local_3d40 + lVar149 + 0x50);
        *(double *)((long)local_3d40 + lVar149 + 0x58) =
             dVar158 * *(double *)((long)local_3d40 + lVar149 + 0x58);
        dVar158 = (pdVar164 + local_49e8 * 0x12 + 10)[1];
        *(double *)((long)local_3d40 + lVar149 + 0x60) =
             pdVar164[local_49e8 * 0x12 + 10] * *(double *)((long)local_3d40 + lVar149 + 0x60);
        *(double *)((long)local_3d40 + lVar149 + 0x68) =
             dVar158 * *(double *)((long)local_3d40 + lVar149 + 0x68);
        dVar158 = (pdVar164 + local_49e8 * 0x12 + 0xc)[1];
        dVar196 = *(double *)(local_3cc0 + lVar149 + -8);
        *(double *)((long)local_3d40 + lVar149 + 0x70) =
             pdVar164[local_49e8 * 0x12 + 0xc] * *(double *)((long)local_3d40 + lVar149 + 0x70);
        *(double *)(local_3cc0 + lVar149 + -8) = dVar158 * dVar196;
        dVar158 = (pdVar164 + local_49e8 * 0x12 + 0xe)[1];
        *(double *)(local_3cc0 + lVar149) =
             pdVar164[local_49e8 * 0x12 + 0xe] * *(double *)(local_3cc0 + lVar149);
        *(double *)(local_3cc0 + lVar149 + 8) = dVar158 * *(double *)(local_3cc0 + lVar149 + 8);
        dVar158 = (pdVar164 + local_49e8 * 0x12 + 0x10)[1];
        *(double *)((long)local_3cb0 + lVar149) =
             pdVar164[local_49e8 * 0x12 + 0x10] * *(double *)((long)local_3cb0 + lVar149);
        *(double *)((long)local_3cb0 + lVar149 + 8) =
             dVar158 * *(double *)((long)local_3cb0 + lVar149 + 8);
        dVar158 = (pdVar164 + local_49e8 * 0x12)[1];
        *(double *)((long)local_3cb0 + lVar149 + 0x10) =
             pdVar164[local_49e8 * 0x12] * *(double *)((long)local_3cb0 + lVar149 + 0x10);
        *(double *)((long)local_3cb0 + lVar149 + 0x18) =
             dVar158 * *(double *)((long)local_3cb0 + lVar149 + 0x18);
        dVar158 = (pdVar164 + local_49e8 * 0x12 + 2)[1];
        *(double *)((long)local_3cb0 + lVar149 + 0x20) =
             pdVar164[local_49e8 * 0x12 + 2] * *(double *)((long)local_3cb0 + lVar149 + 0x20);
        *(double *)((long)local_3cb0 + lVar149 + 0x28) =
             dVar158 * *(double *)((long)local_3cb0 + lVar149 + 0x28);
        dVar158 = (pdVar164 + local_49e8 * 0x12 + 4)[1];
        *(double *)((long)local_3cb0 + lVar149 + 0x30) =
             pdVar164[local_49e8 * 0x12 + 4] * *(double *)((long)local_3cb0 + lVar149 + 0x30);
        *(double *)((long)local_3cb0 + lVar149 + 0x38) =
             dVar158 * *(double *)((long)local_3cb0 + lVar149 + 0x38);
        dVar158 = (pdVar164 + local_49e8 * 0x12 + 6)[1];
        *(double *)((long)local_3cb0 + lVar149 + 0x40) =
             pdVar164[local_49e8 * 0x12 + 6] * *(double *)((long)local_3cb0 + lVar149 + 0x40);
        *(double *)((long)local_3cb0 + lVar149 + 0x48) =
             dVar158 * *(double *)((long)local_3cb0 + lVar149 + 0x48);
        dVar158 = (pdVar164 + local_49e8 * 0x12 + 8)[1];
        *(double *)((long)local_3cb0 + lVar149 + 0x50) =
             pdVar164[local_49e8 * 0x12 + 8] * *(double *)((long)local_3cb0 + lVar149 + 0x50);
        *(double *)((long)local_3cb0 + lVar149 + 0x58) =
             dVar158 * *(double *)((long)local_3cb0 + lVar149 + 0x58);
        dVar158 = (pdVar164 + local_49e8 * 0x12 + 10)[1];
        *(double *)((long)local_3cb0 + lVar149 + 0x60) =
             pdVar164[local_49e8 * 0x12 + 10] * *(double *)((long)local_3cb0 + lVar149 + 0x60);
        *(double *)((long)local_3cb0 + lVar149 + 0x68) =
             dVar158 * *(double *)((long)local_3cb0 + lVar149 + 0x68);
        dVar158 = (pdVar164 + local_49e8 * 0x12 + 0xc)[1];
        dVar196 = *(double *)(local_3c30 + lVar149 + -8);
        *(double *)((long)local_3cb0 + lVar149 + 0x70) =
             pdVar164[local_49e8 * 0x12 + 0xc] * *(double *)((long)local_3cb0 + lVar149 + 0x70);
        *(double *)(local_3c30 + lVar149 + -8) = dVar158 * dVar196;
        dVar158 = (pdVar164 + local_49e8 * 0x12 + 0xe)[1];
        *(double *)(local_3c30 + lVar149) =
             pdVar164[local_49e8 * 0x12 + 0xe] * *(double *)(local_3c30 + lVar149);
        *(double *)(local_3c30 + lVar149 + 8) = dVar158 * *(double *)(local_3c30 + lVar149 + 8);
        dVar158 = (pdVar164 + local_49e8 * 0x12 + 0x10)[1];
        *(double *)((long)&local_3c20.m_dst + lVar149) =
             pdVar164[local_49e8 * 0x12 + 0x10] * *(double *)((long)&local_3c20.m_dst + lVar149);
        *(double *)((long)&local_3c20.m_src + lVar149) =
             dVar158 * *(double *)((long)&local_3c20.m_src + lVar149);
        lVar149 = lVar149 + 0x1b0;
      } while (lVar149 != 0x6b0);
      local_4aa0.m_cols = 0;
      local_4aa0.m_data = (double *)0x0;
      local_4aa0.m_rows = 0;
      Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize(&local_4aa0,0x1e60,0x48,0x6c);
      lVar149 = local_49e8;
      dst = local_4a48;
      pCVar108 = local_4a50;
      dVar196 = (double)((long)ppMVar157 + 0x12);
      lVar159 = 0;
      lVar163 = 0;
      do {
        dVar158 = local_4920;
        if (((((pCVar162->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_rows <= lVar163) ||
             (lVar154 = (pCVar162->m_SD).
                        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                        m_cols, lVar154 < (long)dVar196)) || (local_4aa0.m_rows <= lVar159)) ||
           (local_4aa0.m_cols < 0x12)) goto LAB_00751a80;
        pdVar156 = (pCVar162->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                   .m_storage.m_data;
        lVar154 = lVar154 * lVar163;
        lVar165 = local_4aa0.m_cols * lVar159;
        pdVar164 = (double *)((long)pdVar156 + lVar154 * 8 + local_4928);
        dVar198 = pdVar164[1];
        local_4aa0.m_data[lVar165] = *pdVar164 * (double)local_3c20.m_dst;
        (local_4aa0.m_data + lVar165)[1] = dVar198 * (double)local_3c20.m_src;
        pdVar164 = (double *)((long)pdVar156 + lVar154 * 8 + local_4928 + 0x10);
        dVar198 = pdVar164[1];
        local_4aa0.m_data[lVar165 + 2] = *pdVar164 * (double)local_3c20.m_functor;
        (local_4aa0.m_data + lVar165 + 2)[1] = dVar198 * (double)local_3c20.m_dstExpr;
        pdVar164 = (double *)((long)pdVar156 + lVar154 * 8 + local_4928 + 0x20);
        dVar198 = pdVar164[1];
        local_4aa0.m_data[lVar165 + 4] = *pdVar164 * local_3c00;
        (local_4aa0.m_data + lVar165 + 4)[1] = dVar198 * dStack_3bf8;
        pdVar164 = (double *)((long)pdVar156 + lVar154 * 8 + local_4928 + 0x30);
        dVar198 = pdVar164[1];
        local_4aa0.m_data[lVar165 + 6] = *pdVar164 * local_3bf0;
        (local_4aa0.m_data + lVar165 + 6)[1] = dVar198 * dStack_3be8;
        pdVar164 = (double *)((long)pdVar156 + lVar154 * 8 + local_4928 + 0x40);
        dVar198 = pdVar164[1];
        local_4aa0.m_data[lVar165 + 8] = *pdVar164 * local_3be0;
        (local_4aa0.m_data + lVar165 + 8)[1] = dVar198 * dStack_3bd8;
        pdVar164 = (double *)((long)pdVar156 + lVar154 * 8 + local_4928 + 0x50);
        dVar198 = pdVar164[1];
        local_4aa0.m_data[lVar165 + 10] = *pdVar164 * local_3bd0;
        (local_4aa0.m_data + lVar165 + 10)[1] = dVar198 * dStack_3bc8;
        pdVar164 = (double *)((long)pdVar156 + lVar154 * 8 + local_4928 + 0x60);
        dVar198 = pdVar164[1];
        local_4aa0.m_data[lVar165 + 0xc] = *pdVar164 * local_3bc0;
        (local_4aa0.m_data + lVar165 + 0xc)[1] = dVar198 * dStack_3bb8;
        pdVar164 = (double *)((long)pdVar156 + lVar154 * 8 + local_4928 + 0x70);
        dVar198 = pdVar164[1];
        local_4aa0.m_data[lVar165 + 0xe] = *pdVar164 * local_3bb0;
        (local_4aa0.m_data + lVar165 + 0xe)[1] = dVar198 * dStack_3ba8;
        pdVar156 = (double *)((long)pdVar156 + lVar154 * 8 + local_4928 + 0x80);
        dVar198 = pdVar156[1];
        local_4aa0.m_data[lVar165 + 0x10] = *pdVar156 * local_3ba0;
        (local_4aa0.m_data + lVar165 + 0x10)[1] = dVar198 * dStack_3b98;
        if ((((pCVar162->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar163) ||
            (lVar154 = (pCVar162->m_SD).
                       super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                       m_cols, lVar154 < (long)local_4a80)) ||
           ((local_4aa0.m_rows <= lVar159 || (local_4aa0.m_cols < 0x24)))) goto LAB_00751a80;
        pdVar156 = (pCVar162->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                   .m_storage.m_data;
        lVar154 = lVar154 * lVar163;
        lVar165 = local_4aa0.m_cols * lVar159;
        pdVar164 = (double *)((long)pdVar156 + lVar154 * 8 + (long)local_4a00);
        dVar198 = pdVar164[1];
        local_4aa0.m_data[lVar165 + 0x12] = *pdVar164 * local_3b90;
        (local_4aa0.m_data + lVar165 + 0x12)[1] = dVar198 * dStack_3b88;
        pdVar164 = (double *)((long)pdVar156 + lVar154 * 8 + (long)local_4a00 + 0x10U);
        dVar198 = pdVar164[1];
        local_4aa0.m_data[lVar165 + 0x14] = *pdVar164 * local_3b80;
        (local_4aa0.m_data + lVar165 + 0x14)[1] = dVar198 * dStack_3b78;
        pdVar164 = (double *)((long)pdVar156 + lVar154 * 8 + (long)local_4a00 + 0x20U);
        dVar198 = pdVar164[1];
        local_4aa0.m_data[lVar165 + 0x16] = *pdVar164 * local_3b70;
        (local_4aa0.m_data + lVar165 + 0x16)[1] = dVar198 * dStack_3b68;
        pdVar164 = (double *)((long)pdVar156 + lVar154 * 8 + (long)local_4a00 + 0x30U);
        dVar198 = pdVar164[1];
        local_4aa0.m_data[lVar165 + 0x18] = *pdVar164 * local_3b60;
        (local_4aa0.m_data + lVar165 + 0x18)[1] = dVar198 * dStack_3b58;
        pdVar164 = (double *)((long)pdVar156 + lVar154 * 8 + (long)local_4a00 + 0x40U);
        dVar198 = pdVar164[1];
        local_4aa0.m_data[lVar165 + 0x1a] = *pdVar164 * local_3b50;
        (local_4aa0.m_data + lVar165 + 0x1a)[1] = dVar198 * dStack_3b48;
        pdVar164 = (double *)((long)pdVar156 + lVar154 * 8 + (long)local_4a00 + 0x50U);
        dVar198 = pdVar164[1];
        local_4aa0.m_data[lVar165 + 0x1c] = *pdVar164 * local_3b40;
        (local_4aa0.m_data + lVar165 + 0x1c)[1] = dVar198 * dStack_3b38;
        pdVar164 = (double *)((long)pdVar156 + lVar154 * 8 + (long)local_4a00 + 0x60U);
        dVar198 = pdVar164[1];
        local_4aa0.m_data[lVar165 + 0x1e] = *pdVar164 * local_3b30;
        (local_4aa0.m_data + lVar165 + 0x1e)[1] = dVar198 * dStack_3b28;
        pdVar164 = (double *)((long)pdVar156 + lVar154 * 8 + (long)local_4a00 + 0x70U);
        dVar198 = pdVar164[1];
        local_4aa0.m_data[lVar165 + 0x20] = *pdVar164 * local_3b20;
        (local_4aa0.m_data + lVar165 + 0x20)[1] = dVar198 * dStack_3b18;
        pdVar156 = (double *)((long)pdVar156 + lVar154 * 8 + (long)local_4a00 + 0x80U);
        dVar198 = pdVar156[1];
        local_4aa0.m_data[lVar165 + 0x22] = *pdVar156 * local_3b10;
        (local_4aa0.m_data + lVar165 + 0x22)[1] = dVar198 * dStack_3b08;
        if ((((pCVar162->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar163) ||
            (lVar154 = (pCVar162->m_SD).
                       super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                       m_cols, lVar154 < local_4a78)) ||
           ((local_4aa0.m_rows <= lVar159 || (local_4aa0.m_cols < 0x36)))) goto LAB_00751a80;
        pdVar156 = (pCVar162->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                   .m_storage.m_data;
        lVar154 = lVar154 * lVar163;
        lVar167 = local_4aa0.m_cols * lVar159;
        lVar165 = CONCAT71(uStack_493f,local_4940);
        pdVar164 = (double *)((long)pdVar156 + lVar154 * 8 + lVar165);
        dVar198 = pdVar164[1];
        local_4aa0.m_data[lVar167 + 0x24] = *pdVar164 * local_3b00;
        (local_4aa0.m_data + lVar167 + 0x24)[1] = dVar198 * dStack_3af8;
        pdVar164 = (double *)((long)pdVar156 + lVar154 * 8 + lVar165 + 0x10);
        dVar198 = pdVar164[1];
        local_4aa0.m_data[lVar167 + 0x26] = *pdVar164 * local_3af0;
        (local_4aa0.m_data + lVar167 + 0x26)[1] = dVar198 * dStack_3ae8;
        pdVar164 = (double *)((long)pdVar156 + lVar154 * 8 + lVar165 + 0x20);
        dVar198 = pdVar164[1];
        local_4aa0.m_data[lVar167 + 0x28] = *pdVar164 * local_3ae0;
        (local_4aa0.m_data + lVar167 + 0x28)[1] = dVar198 * dStack_3ad8;
        pdVar164 = (double *)((long)pdVar156 + lVar154 * 8 + lVar165 + 0x30);
        dVar198 = pdVar164[1];
        local_4aa0.m_data[lVar167 + 0x2a] = *pdVar164 * local_3ad0;
        (local_4aa0.m_data + lVar167 + 0x2a)[1] = dVar198 * dStack_3ac8;
        pdVar164 = (double *)((long)pdVar156 + lVar154 * 8 + lVar165 + 0x40);
        dVar198 = pdVar164[1];
        local_4aa0.m_data[lVar167 + 0x2c] = *pdVar164 * local_3ac0;
        (local_4aa0.m_data + lVar167 + 0x2c)[1] = dVar198 * dStack_3ab8;
        pdVar164 = (double *)((long)pdVar156 + lVar154 * 8 + lVar165 + 0x50);
        dVar198 = pdVar164[1];
        local_4aa0.m_data[lVar167 + 0x2e] = *pdVar164 * local_3ab0;
        (local_4aa0.m_data + lVar167 + 0x2e)[1] = dVar198 * dStack_3aa8;
        pdVar164 = (double *)((long)pdVar156 + lVar154 * 8 + lVar165 + 0x60);
        dVar198 = pdVar164[1];
        local_4aa0.m_data[lVar167 + 0x30] = *pdVar164 * local_3aa0;
        (local_4aa0.m_data + lVar167 + 0x30)[1] = dVar198 * dStack_3a98;
        pdVar164 = (double *)((long)pdVar156 + lVar154 * 8 + lVar165 + 0x70);
        dVar198 = pdVar164[1];
        local_4aa0.m_data[lVar167 + 0x32] = *pdVar164 * local_3a90;
        (local_4aa0.m_data + lVar167 + 0x32)[1] = dVar198 * dStack_3a88;
        pdVar156 = (double *)((long)pdVar156 + lVar154 * 8 + lVar165 + 0x80);
        dVar198 = pdVar156[1];
        local_4aa0.m_data[lVar167 + 0x34] = *pdVar156 * local_3a80;
        (local_4aa0.m_data + lVar167 + 0x34)[1] = dVar198 * dStack_3a78;
        if (((((pCVar162->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_rows <= lVar163) ||
             (uVar160 = (pCVar162->m_SD).
                        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                        m_cols, (long)uVar160 < local_4a78)) || (uVar160 < local_4a80)) ||
           ((local_4aa0.m_rows <= lVar159 || (local_4aa0.m_cols < 0x48)))) goto LAB_00751a80;
        pdVar164 = (pCVar162->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                   .m_storage.m_data;
        lVar154 = uVar160 * lVar163;
        lVar165 = local_4aa0.m_cols * lVar159;
        dVar198 = (pdVar164 + lVar170 + lVar154)[1];
        dVar199 = (pdVar164 + lVar168 + lVar154)[1];
        local_4aa0.m_data[lVar165 + 0x36] =
             pdVar164[lVar170 + lVar154] * local_3b90 + pdVar164[lVar168 + lVar154] * local_3b00;
        (local_4aa0.m_data + lVar165 + 0x36)[1] = dVar198 * dStack_3b88 + dVar199 * dStack_3af8;
        dVar198 = (pdVar164 + lVar170 + lVar154 + 2)[1];
        dVar199 = (pdVar164 + lVar168 + lVar154 + 2)[1];
        local_4aa0.m_data[lVar165 + 0x38] =
             pdVar164[lVar170 + lVar154 + 2] * local_3b80 +
             pdVar164[lVar168 + lVar154 + 2] * local_3af0;
        (local_4aa0.m_data + lVar165 + 0x38)[1] = dVar198 * dStack_3b78 + dVar199 * dStack_3ae8;
        dVar198 = (pdVar164 + lVar170 + lVar154 + 4)[1];
        dVar199 = (pdVar164 + lVar168 + lVar154 + 4)[1];
        local_4aa0.m_data[lVar165 + 0x3a] =
             pdVar164[lVar170 + lVar154 + 4] * local_3b70 +
             pdVar164[lVar168 + lVar154 + 4] * local_3ae0;
        (local_4aa0.m_data + lVar165 + 0x3a)[1] = dVar198 * dStack_3b68 + dVar199 * dStack_3ad8;
        dVar198 = (pdVar164 + lVar170 + lVar154 + 6)[1];
        dVar199 = (pdVar164 + lVar168 + lVar154 + 6)[1];
        local_4aa0.m_data[lVar165 + 0x3c] =
             pdVar164[lVar170 + lVar154 + 6] * local_3b60 +
             pdVar164[lVar168 + lVar154 + 6] * local_3ad0;
        (local_4aa0.m_data + lVar165 + 0x3c)[1] = dVar198 * dStack_3b58 + dVar199 * dStack_3ac8;
        dVar198 = (pdVar164 + lVar170 + lVar154 + 8)[1];
        dVar199 = (pdVar164 + lVar168 + lVar154 + 8)[1];
        local_4aa0.m_data[lVar165 + 0x3e] =
             pdVar164[lVar170 + lVar154 + 8] * local_3b50 +
             pdVar164[lVar168 + lVar154 + 8] * local_3ac0;
        (local_4aa0.m_data + lVar165 + 0x3e)[1] = dVar198 * dStack_3b48 + dVar199 * dStack_3ab8;
        dVar198 = (pdVar164 + lVar170 + lVar154 + 10)[1];
        dVar199 = (pdVar164 + lVar168 + lVar154 + 10)[1];
        local_4aa0.m_data[lVar165 + 0x40] =
             pdVar164[lVar170 + lVar154 + 10] * local_3b40 +
             pdVar164[lVar168 + lVar154 + 10] * local_3ab0;
        (local_4aa0.m_data + lVar165 + 0x40)[1] = dVar198 * dStack_3b38 + dVar199 * dStack_3aa8;
        dVar198 = (pdVar164 + lVar170 + lVar154 + 0xc)[1];
        dVar199 = (pdVar164 + lVar168 + lVar154 + 0xc)[1];
        local_4aa0.m_data[lVar165 + 0x42] =
             pdVar164[lVar170 + lVar154 + 0xc] * local_3b30 +
             pdVar164[lVar168 + lVar154 + 0xc] * local_3aa0;
        (local_4aa0.m_data + lVar165 + 0x42)[1] = dVar198 * dStack_3b28 + dVar199 * dStack_3a98;
        dVar198 = (pdVar164 + lVar170 + lVar154 + 0xe)[1];
        dVar199 = (pdVar164 + lVar168 + lVar154 + 0xe)[1];
        local_4aa0.m_data[lVar165 + 0x44] =
             pdVar164[lVar170 + lVar154 + 0xe] * local_3b20 +
             pdVar164[lVar168 + lVar154 + 0xe] * local_3a90;
        (local_4aa0.m_data + lVar165 + 0x44)[1] = dVar198 * dStack_3b18 + dVar199 * dStack_3a88;
        dVar198 = (pdVar164 + lVar170 + lVar154 + 0x10)[1];
        dVar199 = (pdVar164 + lVar168 + lVar154 + 0x10)[1];
        local_4aa0.m_data[lVar165 + 0x46] =
             pdVar164[lVar170 + lVar154 + 0x10] * local_3b10 +
             pdVar164[lVar168 + lVar154 + 0x10] * local_3a80;
        (local_4aa0.m_data + lVar165 + 0x46)[1] = dVar198 * dStack_3b08 + dVar199 * dStack_3a78;
        if (((((pCVar162->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_rows <= lVar163) ||
             ((dVar198 = (double)(pCVar162->m_SD).
                                 super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                                 m_storage.m_cols, (long)dVar198 < local_4a78 ||
              ((ulong)dVar198 < (ulong)dVar196)))) || (local_4aa0.m_rows <= lVar159)) ||
           (local_4aa0.m_cols < 0x5a)) goto LAB_00751a80;
        pdVar164 = (pCVar162->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                   .m_storage.m_data;
        lVar154 = (long)dVar198 * lVar163;
        lVar165 = local_4aa0.m_cols * lVar159;
        dVar198 = (pdVar164 + lVar170 + lVar154)[1];
        dVar199 = (pdVar164 + (long)((long)ppMVar157 + lVar154))[1];
        local_4aa0.m_data[lVar165 + 0x48] =
             pdVar164[lVar170 + lVar154] * (double)local_3c20.m_dst +
             pdVar164[(long)((long)ppMVar157 + lVar154)] * local_3b00;
        (local_4aa0.m_data + lVar165 + 0x48)[1] =
             dVar198 * (double)local_3c20.m_src + dVar199 * dStack_3af8;
        dVar198 = (pdVar164 + lVar170 + lVar154 + 2)[1];
        dVar199 = (pdVar164 + (long)ppMVar157 + lVar154 + 2)[1];
        local_4aa0.m_data[lVar165 + 0x4a] =
             pdVar164[lVar170 + lVar154 + 2] * (double)local_3c20.m_functor +
             pdVar164[(long)ppMVar157 + lVar154 + 2] * local_3af0;
        (local_4aa0.m_data + lVar165 + 0x4a)[1] =
             dVar198 * (double)local_3c20.m_dstExpr + dVar199 * dStack_3ae8;
        dVar198 = (pdVar164 + lVar170 + lVar154 + 4)[1];
        dVar199 = (pdVar164 + (long)ppMVar157 + lVar154 + 4)[1];
        local_4aa0.m_data[lVar165 + 0x4c] =
             pdVar164[lVar170 + lVar154 + 4] * local_3c00 +
             pdVar164[(long)ppMVar157 + lVar154 + 4] * local_3ae0;
        (local_4aa0.m_data + lVar165 + 0x4c)[1] = dVar198 * dStack_3bf8 + dVar199 * dStack_3ad8;
        dVar198 = (pdVar164 + lVar170 + lVar154 + 6)[1];
        dVar199 = (pdVar164 + (long)ppMVar157 + lVar154 + 6)[1];
        local_4aa0.m_data[lVar165 + 0x4e] =
             pdVar164[lVar170 + lVar154 + 6] * local_3bf0 +
             pdVar164[(long)ppMVar157 + lVar154 + 6] * local_3ad0;
        (local_4aa0.m_data + lVar165 + 0x4e)[1] = dVar198 * dStack_3be8 + dVar199 * dStack_3ac8;
        dVar198 = (pdVar164 + lVar170 + lVar154 + 8)[1];
        dVar199 = (pdVar164 + (long)ppMVar157 + lVar154 + 8)[1];
        local_4aa0.m_data[lVar165 + 0x50] =
             pdVar164[lVar170 + lVar154 + 8] * local_3be0 +
             pdVar164[(long)ppMVar157 + lVar154 + 8] * local_3ac0;
        (local_4aa0.m_data + lVar165 + 0x50)[1] = dVar198 * dStack_3bd8 + dVar199 * dStack_3ab8;
        dVar198 = (pdVar164 + lVar170 + lVar154 + 10)[1];
        dVar199 = (pdVar164 + (long)ppMVar157 + lVar154 + 10)[1];
        local_4aa0.m_data[lVar165 + 0x52] =
             pdVar164[lVar170 + lVar154 + 10] * local_3bd0 +
             pdVar164[(long)ppMVar157 + lVar154 + 10] * local_3ab0;
        (local_4aa0.m_data + lVar165 + 0x52)[1] = dVar198 * dStack_3bc8 + dVar199 * dStack_3aa8;
        dVar198 = (pdVar164 + lVar170 + lVar154 + 0xc)[1];
        dVar199 = (pdVar164 + (long)ppMVar157 + lVar154 + 0xc)[1];
        local_4aa0.m_data[lVar165 + 0x54] =
             pdVar164[lVar170 + lVar154 + 0xc] * local_3bc0 +
             pdVar164[(long)ppMVar157 + lVar154 + 0xc] * local_3aa0;
        (local_4aa0.m_data + lVar165 + 0x54)[1] = dVar198 * dStack_3bb8 + dVar199 * dStack_3a98;
        dVar198 = (pdVar164 + lVar170 + lVar154 + 0xe)[1];
        dVar199 = (pdVar164 + (long)ppMVar157 + lVar154 + 0xe)[1];
        local_4aa0.m_data[lVar165 + 0x56] =
             pdVar164[lVar170 + lVar154 + 0xe] * local_3bb0 +
             pdVar164[(long)ppMVar157 + lVar154 + 0xe] * local_3a90;
        (local_4aa0.m_data + lVar165 + 0x56)[1] = dVar198 * dStack_3ba8 + dVar199 * dStack_3a88;
        dVar198 = (pdVar164 + lVar170 + lVar154 + 0x10)[1];
        dVar199 = (pdVar164 + (long)ppMVar157 + lVar154 + 0x10)[1];
        local_4aa0.m_data[lVar165 + 0x58] =
             pdVar164[lVar170 + lVar154 + 0x10] * local_3ba0 +
             pdVar164[(long)ppMVar157 + lVar154 + 0x10] * local_3a80;
        (local_4aa0.m_data + lVar165 + 0x58)[1] = dVar198 * dStack_3b98 + dVar199 * dStack_3a78;
        if (((((pCVar162->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_rows <= lVar163) ||
             (dVar198 = (double)(pCVar162->m_SD).
                                super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                                m_storage.m_cols, (long)dVar198 < (long)local_4a80)) ||
            ((ulong)dVar198 < (ulong)dVar196)) ||
           ((local_4aa0.m_rows <= lVar159 || (local_4aa0.m_cols < 0x6c)))) goto LAB_00751a80;
        pdVar164 = (pCVar162->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                   .m_storage.m_data;
        lVar154 = (long)dVar198 * lVar163;
        lVar165 = local_4aa0.m_cols * lVar159;
        dVar198 = (pdVar164 + lVar168 + lVar154)[1];
        dVar199 = (pdVar164 + (long)((long)ppMVar157 + lVar154))[1];
        local_4aa0.m_data[lVar165 + 0x5a] =
             pdVar164[lVar168 + lVar154] * (double)local_3c20.m_dst +
             pdVar164[(long)((long)ppMVar157 + lVar154)] * local_3b90;
        (local_4aa0.m_data + lVar165 + 0x5a)[1] =
             dVar198 * (double)local_3c20.m_src + dVar199 * dStack_3b88;
        dVar198 = (pdVar164 + lVar168 + lVar154 + 2)[1];
        dVar199 = (pdVar164 + (long)ppMVar157 + lVar154 + 2)[1];
        local_4aa0.m_data[lVar165 + 0x5c] =
             pdVar164[lVar168 + lVar154 + 2] * (double)local_3c20.m_functor +
             pdVar164[(long)ppMVar157 + lVar154 + 2] * local_3b80;
        (local_4aa0.m_data + lVar165 + 0x5c)[1] =
             dVar198 * (double)local_3c20.m_dstExpr + dVar199 * dStack_3b78;
        dVar198 = (pdVar164 + lVar168 + lVar154 + 4)[1];
        dVar199 = (pdVar164 + (long)ppMVar157 + lVar154 + 4)[1];
        local_4aa0.m_data[lVar165 + 0x5e] =
             pdVar164[lVar168 + lVar154 + 4] * local_3c00 +
             pdVar164[(long)ppMVar157 + lVar154 + 4] * local_3b70;
        (local_4aa0.m_data + lVar165 + 0x5e)[1] = dVar198 * dStack_3bf8 + dVar199 * dStack_3b68;
        dVar198 = (pdVar164 + lVar168 + lVar154 + 6)[1];
        dVar199 = (pdVar164 + (long)ppMVar157 + lVar154 + 6)[1];
        local_4aa0.m_data[lVar165 + 0x60] =
             pdVar164[lVar168 + lVar154 + 6] * local_3bf0 +
             pdVar164[(long)ppMVar157 + lVar154 + 6] * local_3b60;
        (local_4aa0.m_data + lVar165 + 0x60)[1] = dVar198 * dStack_3be8 + dVar199 * dStack_3b58;
        dVar198 = (pdVar164 + lVar168 + lVar154 + 8)[1];
        dVar199 = (pdVar164 + (long)ppMVar157 + lVar154 + 8)[1];
        local_4aa0.m_data[lVar165 + 0x62] =
             pdVar164[lVar168 + lVar154 + 8] * local_3be0 +
             pdVar164[(long)ppMVar157 + lVar154 + 8] * local_3b50;
        (local_4aa0.m_data + lVar165 + 0x62)[1] = dVar198 * dStack_3bd8 + dVar199 * dStack_3b48;
        dVar198 = (pdVar164 + lVar168 + lVar154 + 10)[1];
        dVar199 = (pdVar164 + (long)ppMVar157 + lVar154 + 10)[1];
        local_4aa0.m_data[lVar165 + 100] =
             pdVar164[lVar168 + lVar154 + 10] * local_3bd0 +
             pdVar164[(long)ppMVar157 + lVar154 + 10] * local_3b40;
        (local_4aa0.m_data + lVar165 + 100)[1] = dVar198 * dStack_3bc8 + dVar199 * dStack_3b38;
        dVar198 = (pdVar164 + lVar168 + lVar154 + 0xc)[1];
        dVar199 = (pdVar164 + (long)ppMVar157 + lVar154 + 0xc)[1];
        local_4aa0.m_data[lVar165 + 0x66] =
             pdVar164[lVar168 + lVar154 + 0xc] * local_3bc0 +
             pdVar164[(long)ppMVar157 + lVar154 + 0xc] * local_3b30;
        (local_4aa0.m_data + lVar165 + 0x66)[1] = dVar198 * dStack_3bb8 + dVar199 * dStack_3b28;
        dVar198 = (pdVar164 + lVar168 + lVar154 + 0xe)[1];
        dVar199 = (pdVar164 + (long)ppMVar157 + lVar154 + 0xe)[1];
        local_4aa0.m_data[lVar165 + 0x68] =
             pdVar164[lVar168 + lVar154 + 0xe] * local_3bb0 +
             pdVar164[(long)ppMVar157 + lVar154 + 0xe] * local_3b20;
        (local_4aa0.m_data + lVar165 + 0x68)[1] = dVar198 * dStack_3ba8 + dVar199 * dStack_3b18;
        dVar198 = (pdVar164 + lVar168 + lVar154 + 0x10)[1];
        dVar199 = (pdVar164 + (long)ppMVar157 + lVar154 + 0x10)[1];
        local_4aa0.m_data[lVar165 + 0x6a] =
             pdVar164[lVar168 + lVar154 + 0x10] * local_3ba0 +
             pdVar164[(long)ppMVar157 + lVar154 + 0x10] * local_3b10;
        (local_4aa0.m_data + lVar165 + 0x6a)[1] = dVar198 * dStack_3b98 + dVar199 * dStack_3b08;
        if ((((pCVar162->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar163) ||
            ((lVar154 = (pCVar162->m_SD).
                        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                        m_cols, lVar154 < (long)dVar196 ||
             (lVar165 = lVar159 + 1, local_4aa0.m_rows <= lVar165)))) || (local_4aa0.m_cols < 0x12))
        goto LAB_00751a80;
        pdVar156 = (pCVar162->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                   .m_storage.m_data;
        lVar154 = lVar154 * lVar163;
        lVar167 = local_4aa0.m_cols * lVar165;
        pdVar164 = (double *)((long)pdVar156 + lVar154 * 8 + local_4928);
        dVar198 = pdVar164[1];
        local_4aa0.m_data[lVar167] = *pdVar164 * local_3a70;
        (local_4aa0.m_data + lVar167)[1] = dVar198 * dStack_3a68;
        pdVar164 = (double *)((long)pdVar156 + lVar154 * 8 + local_4928 + 0x10);
        dVar198 = pdVar164[1];
        local_4aa0.m_data[lVar167 + 2] = *pdVar164 * local_3a60;
        (local_4aa0.m_data + lVar167 + 2)[1] = dVar198 * dStack_3a58;
        pdVar164 = (double *)((long)pdVar156 + lVar154 * 8 + local_4928 + 0x20);
        dVar198 = pdVar164[1];
        local_4aa0.m_data[lVar167 + 4] = *pdVar164 * local_3a50;
        (local_4aa0.m_data + lVar167 + 4)[1] = dVar198 * dStack_3a48;
        pdVar164 = (double *)((long)pdVar156 + lVar154 * 8 + local_4928 + 0x30);
        dVar198 = pdVar164[1];
        local_4aa0.m_data[lVar167 + 6] = *pdVar164 * local_3a40;
        (local_4aa0.m_data + lVar167 + 6)[1] = dVar198 * dStack_3a38;
        pdVar164 = (double *)((long)pdVar156 + lVar154 * 8 + local_4928 + 0x40);
        dVar198 = pdVar164[1];
        local_4aa0.m_data[lVar167 + 8] = *pdVar164 * local_3a30;
        (local_4aa0.m_data + lVar167 + 8)[1] = dVar198 * dStack_3a28;
        pdVar164 = (double *)((long)pdVar156 + lVar154 * 8 + local_4928 + 0x50);
        dVar198 = pdVar164[1];
        local_4aa0.m_data[lVar167 + 10] = *pdVar164 * local_3a20;
        (local_4aa0.m_data + lVar167 + 10)[1] = dVar198 * dStack_3a18;
        pdVar164 = (double *)((long)pdVar156 + lVar154 * 8 + local_4928 + 0x60);
        dVar198 = pdVar164[1];
        local_4aa0.m_data[lVar167 + 0xc] = *pdVar164 * local_3a10;
        (local_4aa0.m_data + lVar167 + 0xc)[1] = dVar198 * dStack_3a08;
        pdVar164 = (double *)((long)pdVar156 + lVar154 * 8 + local_4928 + 0x70);
        dVar198 = pdVar164[1];
        local_4aa0.m_data[lVar167 + 0xe] = *pdVar164 * (double)local_3a00;
        (local_4aa0.m_data + lVar167 + 0xe)[1] = dVar198 * dStack_39f8;
        pdVar156 = (double *)((long)pdVar156 + lVar154 * 8 + local_4928 + 0x80);
        dVar198 = pdVar156[1];
        local_4aa0.m_data[lVar167 + 0x10] = *pdVar156 * local_39f0;
        (local_4aa0.m_data + lVar167 + 0x10)[1] = dVar198 * (double)pdStack_39e8;
        if (((((pCVar162->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_rows <= lVar163) ||
             (lVar154 = (pCVar162->m_SD).
                        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                        m_cols, lVar154 < (long)local_4a80)) || (local_4aa0.m_rows <= lVar165)) ||
           (local_4aa0.m_cols < 0x24)) goto LAB_00751a80;
        pdVar156 = (pCVar162->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                   .m_storage.m_data;
        lVar154 = lVar154 * lVar163;
        lVar167 = local_4aa0.m_cols * lVar165;
        pdVar164 = (double *)((long)pdVar156 + lVar154 * 8 + (long)local_4a00);
        dVar198 = pdVar164[1];
        local_4aa0.m_data[lVar167 + 0x12] = *pdVar164 * local_39e0;
        (local_4aa0.m_data + lVar167 + 0x12)[1] = dVar198 * dStack_39d8;
        pdVar164 = (double *)((long)pdVar156 + lVar154 * 8 + (long)local_4a00 + 0x10U);
        dVar198 = pdVar164[1];
        local_4aa0.m_data[lVar167 + 0x14] = *pdVar164 * (double)local_39d0;
        (local_4aa0.m_data + lVar167 + 0x14)[1] = dVar198 * dStack_39c8;
        pdVar164 = (double *)((long)pdVar156 + lVar154 * 8 + (long)local_4a00 + 0x20U);
        dVar198 = pdVar164[1];
        local_4aa0.m_data[lVar167 + 0x16] = *pdVar164 * local_39c0;
        (local_4aa0.m_data + lVar167 + 0x16)[1] = dVar198 * (double)pdStack_39b8;
        pdVar164 = (double *)((long)pdVar156 + lVar154 * 8 + (long)local_4a00 + 0x30U);
        dVar198 = pdVar164[1];
        local_4aa0.m_data[lVar167 + 0x18] = *pdVar164 * local_39b0;
        (local_4aa0.m_data + lVar167 + 0x18)[1] = dVar198 * dStack_39a8;
        pdVar164 = (double *)((long)pdVar156 + lVar154 * 8 + (long)local_4a00 + 0x40U);
        dVar198 = pdVar164[1];
        local_4aa0.m_data[lVar167 + 0x1a] = *pdVar164 * local_39a0;
        (local_4aa0.m_data + lVar167 + 0x1a)[1] = dVar198 * dStack_3998;
        pdVar164 = (double *)((long)pdVar156 + lVar154 * 8 + (long)local_4a00 + 0x50U);
        dVar198 = pdVar164[1];
        local_4aa0.m_data[lVar167 + 0x1c] = *pdVar164 * local_3990;
        (local_4aa0.m_data + lVar167 + 0x1c)[1] = dVar198 * dStack_3988;
        pdVar164 = (double *)((long)pdVar156 + lVar154 * 8 + (long)local_4a00 + 0x60U);
        dVar198 = pdVar164[1];
        local_4aa0.m_data[lVar167 + 0x1e] = *pdVar164 * local_3980;
        (local_4aa0.m_data + lVar167 + 0x1e)[1] = dVar198 * dStack_3978;
        pdVar164 = (double *)((long)pdVar156 + lVar154 * 8 + (long)local_4a00 + 0x70U);
        dVar198 = pdVar164[1];
        local_4aa0.m_data[lVar167 + 0x20] = *pdVar164 * local_3970;
        (local_4aa0.m_data + lVar167 + 0x20)[1] = dVar198 * dStack_3968;
        pdVar156 = (double *)((long)pdVar156 + lVar154 * 8 + (long)local_4a00 + 0x80U);
        dVar198 = pdVar156[1];
        local_4aa0.m_data[lVar167 + 0x22] = *pdVar156 * local_3960;
        (local_4aa0.m_data + lVar167 + 0x22)[1] = dVar198 * dStack_3958;
        if ((((pCVar162->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar163) ||
            (lVar154 = (pCVar162->m_SD).
                       super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                       m_cols, lVar154 < local_4a78)) ||
           ((local_4aa0.m_rows <= lVar165 || (local_4aa0.m_cols < 0x36)))) goto LAB_00751a80;
        pdVar156 = (pCVar162->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                   .m_storage.m_data;
        lVar154 = lVar154 * lVar163;
        lVar161 = local_4aa0.m_cols * lVar165;
        lVar167 = CONCAT71(uStack_493f,local_4940);
        pdVar164 = (double *)((long)pdVar156 + lVar154 * 8 + lVar167);
        dVar198 = pdVar164[1];
        local_4aa0.m_data[lVar161 + 0x24] = *pdVar164 * local_3950;
        (local_4aa0.m_data + lVar161 + 0x24)[1] = dVar198 * dStack_3948;
        pdVar164 = (double *)((long)pdVar156 + lVar154 * 8 + lVar167 + 0x10);
        dVar198 = pdVar164[1];
        local_4aa0.m_data[lVar161 + 0x26] = *pdVar164 * local_3940;
        (local_4aa0.m_data + lVar161 + 0x26)[1] = dVar198 * dStack_3938;
        pdVar164 = (double *)((long)pdVar156 + lVar154 * 8 + lVar167 + 0x20);
        dVar198 = pdVar164[1];
        local_4aa0.m_data[lVar161 + 0x28] = *pdVar164 * local_3930;
        (local_4aa0.m_data + lVar161 + 0x28)[1] = dVar198 * dStack_3928;
        pdVar164 = (double *)((long)pdVar156 + lVar154 * 8 + lVar167 + 0x30);
        dVar198 = pdVar164[1];
        local_4aa0.m_data[lVar161 + 0x2a] = *pdVar164 * local_3920;
        (local_4aa0.m_data + lVar161 + 0x2a)[1] = dVar198 * dStack_3918;
        pdVar164 = (double *)((long)pdVar156 + lVar154 * 8 + lVar167 + 0x40);
        dVar198 = pdVar164[1];
        local_4aa0.m_data[lVar161 + 0x2c] = *pdVar164 * local_3910;
        (local_4aa0.m_data + lVar161 + 0x2c)[1] = dVar198 * dStack_3908;
        pdVar164 = (double *)((long)pdVar156 + lVar154 * 8 + lVar167 + 0x50);
        dVar198 = pdVar164[1];
        local_4aa0.m_data[lVar161 + 0x2e] = *pdVar164 * local_3900;
        (local_4aa0.m_data + lVar161 + 0x2e)[1] = dVar198 * dStack_38f8;
        pdVar164 = (double *)((long)pdVar156 + lVar154 * 8 + lVar167 + 0x60);
        dVar198 = pdVar164[1];
        local_4aa0.m_data[lVar161 + 0x30] = *pdVar164 * local_38f0;
        (local_4aa0.m_data + lVar161 + 0x30)[1] = dVar198 * dStack_38e8;
        pdVar164 = (double *)((long)pdVar156 + lVar154 * 8 + lVar167 + 0x70);
        dVar198 = pdVar164[1];
        local_4aa0.m_data[lVar161 + 0x32] = *pdVar164 * local_38e0;
        (local_4aa0.m_data + lVar161 + 0x32)[1] = dVar198 * dStack_38d8;
        pdVar156 = (double *)((long)pdVar156 + lVar154 * 8 + lVar167 + 0x80);
        dVar198 = pdVar156[1];
        local_4aa0.m_data[lVar161 + 0x34] = *pdVar156 * local_38d0;
        (local_4aa0.m_data + lVar161 + 0x34)[1] = dVar198 * dStack_38c8;
        if ((((pCVar162->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar163) ||
            (uVar160 = (pCVar162->m_SD).
                       super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                       m_cols, (long)uVar160 < local_4a78)) ||
           ((uVar160 < local_4a80 || ((local_4aa0.m_rows <= lVar165 || (local_4aa0.m_cols < 0x48))))
           )) goto LAB_00751a80;
        pdVar164 = (pCVar162->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                   .m_storage.m_data;
        lVar154 = uVar160 * lVar163;
        lVar167 = local_4aa0.m_cols * lVar165;
        dVar198 = (pdVar164 + lVar170 + lVar154)[1];
        dVar199 = (pdVar164 + lVar168 + lVar154)[1];
        local_4aa0.m_data[lVar167 + 0x36] =
             pdVar164[lVar170 + lVar154] * local_39e0 + pdVar164[lVar168 + lVar154] * local_3950;
        (local_4aa0.m_data + lVar167 + 0x36)[1] = dVar198 * dStack_39d8 + dVar199 * dStack_3948;
        dVar198 = (pdVar164 + lVar170 + lVar154 + 2)[1];
        dVar199 = (pdVar164 + lVar168 + lVar154 + 2)[1];
        local_4aa0.m_data[lVar167 + 0x38] =
             pdVar164[lVar170 + lVar154 + 2] * (double)local_39d0 +
             pdVar164[lVar168 + lVar154 + 2] * local_3940;
        (local_4aa0.m_data + lVar167 + 0x38)[1] = dVar198 * dStack_39c8 + dVar199 * dStack_3938;
        dVar198 = (pdVar164 + lVar170 + lVar154 + 4)[1];
        dVar199 = (pdVar164 + lVar168 + lVar154 + 4)[1];
        local_4aa0.m_data[lVar167 + 0x3a] =
             pdVar164[lVar170 + lVar154 + 4] * local_39c0 +
             pdVar164[lVar168 + lVar154 + 4] * local_3930;
        (local_4aa0.m_data + lVar167 + 0x3a)[1] =
             dVar198 * (double)pdStack_39b8 + dVar199 * dStack_3928;
        dVar198 = (pdVar164 + lVar170 + lVar154 + 6)[1];
        dVar199 = (pdVar164 + lVar168 + lVar154 + 6)[1];
        local_4aa0.m_data[lVar167 + 0x3c] =
             pdVar164[lVar170 + lVar154 + 6] * local_39b0 +
             pdVar164[lVar168 + lVar154 + 6] * local_3920;
        (local_4aa0.m_data + lVar167 + 0x3c)[1] = dVar198 * dStack_39a8 + dVar199 * dStack_3918;
        dVar198 = (pdVar164 + lVar170 + lVar154 + 8)[1];
        dVar199 = (pdVar164 + lVar168 + lVar154 + 8)[1];
        local_4aa0.m_data[lVar167 + 0x3e] =
             pdVar164[lVar170 + lVar154 + 8] * local_39a0 +
             pdVar164[lVar168 + lVar154 + 8] * local_3910;
        (local_4aa0.m_data + lVar167 + 0x3e)[1] = dVar198 * dStack_3998 + dVar199 * dStack_3908;
        dVar198 = (pdVar164 + lVar170 + lVar154 + 10)[1];
        dVar199 = (pdVar164 + lVar168 + lVar154 + 10)[1];
        local_4aa0.m_data[lVar167 + 0x40] =
             pdVar164[lVar170 + lVar154 + 10] * local_3990 +
             pdVar164[lVar168 + lVar154 + 10] * local_3900;
        (local_4aa0.m_data + lVar167 + 0x40)[1] = dVar198 * dStack_3988 + dVar199 * dStack_38f8;
        dVar198 = (pdVar164 + lVar170 + lVar154 + 0xc)[1];
        dVar199 = (pdVar164 + lVar168 + lVar154 + 0xc)[1];
        local_4aa0.m_data[lVar167 + 0x42] =
             pdVar164[lVar170 + lVar154 + 0xc] * local_3980 +
             pdVar164[lVar168 + lVar154 + 0xc] * local_38f0;
        (local_4aa0.m_data + lVar167 + 0x42)[1] = dVar198 * dStack_3978 + dVar199 * dStack_38e8;
        dVar198 = (pdVar164 + lVar170 + lVar154 + 0xe)[1];
        dVar199 = (pdVar164 + lVar168 + lVar154 + 0xe)[1];
        local_4aa0.m_data[lVar167 + 0x44] =
             pdVar164[lVar170 + lVar154 + 0xe] * local_3970 +
             pdVar164[lVar168 + lVar154 + 0xe] * local_38e0;
        (local_4aa0.m_data + lVar167 + 0x44)[1] = dVar198 * dStack_3968 + dVar199 * dStack_38d8;
        dVar198 = (pdVar164 + lVar170 + lVar154 + 0x10)[1];
        dVar199 = (pdVar164 + lVar168 + lVar154 + 0x10)[1];
        local_4aa0.m_data[lVar167 + 0x46] =
             pdVar164[lVar170 + lVar154 + 0x10] * local_3960 +
             pdVar164[lVar168 + lVar154 + 0x10] * local_38d0;
        (local_4aa0.m_data + lVar167 + 0x46)[1] = dVar198 * dStack_3958 + dVar199 * dStack_38c8;
        if ((((pCVar162->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar163) ||
            (((dVar198 = (double)(pCVar162->m_SD).
                                 super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                                 m_storage.m_cols, (long)dVar198 < local_4a78 ||
              ((ulong)dVar198 < (ulong)dVar196)) || (local_4aa0.m_rows <= lVar165)))) ||
           (local_4aa0.m_cols < 0x5a)) goto LAB_00751a80;
        pdVar164 = (pCVar162->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                   .m_storage.m_data;
        lVar154 = (long)dVar198 * lVar163;
        lVar167 = local_4aa0.m_cols * lVar165;
        dVar198 = (pdVar164 + lVar170 + lVar154)[1];
        dVar199 = (pdVar164 + (long)((long)ppMVar157 + lVar154))[1];
        local_4aa0.m_data[lVar167 + 0x48] =
             pdVar164[lVar170 + lVar154] * local_3a70 +
             pdVar164[(long)((long)ppMVar157 + lVar154)] * local_3950;
        (local_4aa0.m_data + lVar167 + 0x48)[1] = dVar198 * dStack_3a68 + dVar199 * dStack_3948;
        dVar198 = (pdVar164 + lVar170 + lVar154 + 2)[1];
        dVar199 = (pdVar164 + (long)ppMVar157 + lVar154 + 2)[1];
        local_4aa0.m_data[lVar167 + 0x4a] =
             pdVar164[lVar170 + lVar154 + 2] * local_3a60 +
             pdVar164[(long)ppMVar157 + lVar154 + 2] * local_3940;
        (local_4aa0.m_data + lVar167 + 0x4a)[1] = dVar198 * dStack_3a58 + dVar199 * dStack_3938;
        dVar198 = (pdVar164 + lVar170 + lVar154 + 4)[1];
        dVar199 = (pdVar164 + (long)ppMVar157 + lVar154 + 4)[1];
        local_4aa0.m_data[lVar167 + 0x4c] =
             pdVar164[lVar170 + lVar154 + 4] * local_3a50 +
             pdVar164[(long)ppMVar157 + lVar154 + 4] * local_3930;
        (local_4aa0.m_data + lVar167 + 0x4c)[1] = dVar198 * dStack_3a48 + dVar199 * dStack_3928;
        dVar198 = (pdVar164 + lVar170 + lVar154 + 6)[1];
        dVar199 = (pdVar164 + (long)ppMVar157 + lVar154 + 6)[1];
        local_4aa0.m_data[lVar167 + 0x4e] =
             pdVar164[lVar170 + lVar154 + 6] * local_3a40 +
             pdVar164[(long)ppMVar157 + lVar154 + 6] * local_3920;
        (local_4aa0.m_data + lVar167 + 0x4e)[1] = dVar198 * dStack_3a38 + dVar199 * dStack_3918;
        dVar198 = (pdVar164 + lVar170 + lVar154 + 8)[1];
        dVar199 = (pdVar164 + (long)ppMVar157 + lVar154 + 8)[1];
        local_4aa0.m_data[lVar167 + 0x50] =
             pdVar164[lVar170 + lVar154 + 8] * local_3a30 +
             pdVar164[(long)ppMVar157 + lVar154 + 8] * local_3910;
        (local_4aa0.m_data + lVar167 + 0x50)[1] = dVar198 * dStack_3a28 + dVar199 * dStack_3908;
        dVar198 = (pdVar164 + lVar170 + lVar154 + 10)[1];
        dVar199 = (pdVar164 + (long)ppMVar157 + lVar154 + 10)[1];
        local_4aa0.m_data[lVar167 + 0x52] =
             pdVar164[lVar170 + lVar154 + 10] * local_3a20 +
             pdVar164[(long)ppMVar157 + lVar154 + 10] * local_3900;
        (local_4aa0.m_data + lVar167 + 0x52)[1] = dVar198 * dStack_3a18 + dVar199 * dStack_38f8;
        dVar198 = (pdVar164 + lVar170 + lVar154 + 0xc)[1];
        dVar199 = (pdVar164 + (long)ppMVar157 + lVar154 + 0xc)[1];
        local_4aa0.m_data[lVar167 + 0x54] =
             pdVar164[lVar170 + lVar154 + 0xc] * local_3a10 +
             pdVar164[(long)ppMVar157 + lVar154 + 0xc] * local_38f0;
        (local_4aa0.m_data + lVar167 + 0x54)[1] = dVar198 * dStack_3a08 + dVar199 * dStack_38e8;
        dVar198 = (pdVar164 + lVar170 + lVar154 + 0xe)[1];
        dVar199 = (pdVar164 + (long)ppMVar157 + lVar154 + 0xe)[1];
        local_4aa0.m_data[lVar167 + 0x56] =
             pdVar164[lVar170 + lVar154 + 0xe] * (double)local_3a00 +
             pdVar164[(long)ppMVar157 + lVar154 + 0xe] * local_38e0;
        (local_4aa0.m_data + lVar167 + 0x56)[1] = dVar198 * dStack_39f8 + dVar199 * dStack_38d8;
        dVar198 = (pdVar164 + lVar170 + lVar154 + 0x10)[1];
        dVar199 = (pdVar164 + (long)ppMVar157 + lVar154 + 0x10)[1];
        local_4aa0.m_data[lVar167 + 0x58] =
             pdVar164[lVar170 + lVar154 + 0x10] * local_39f0 +
             pdVar164[(long)ppMVar157 + lVar154 + 0x10] * local_38d0;
        (local_4aa0.m_data + lVar167 + 0x58)[1] =
             dVar198 * (double)pdStack_39e8 + dVar199 * dStack_38c8;
        if ((((pCVar162->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar163) ||
            (dVar198 = (double)(pCVar162->m_SD).
                               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                               m_storage.m_cols, (long)dVar198 < (long)local_4a80)) ||
           (((ulong)dVar198 < (ulong)dVar196 ||
            ((local_4aa0.m_rows <= lVar165 || (local_4aa0.m_cols < 0x6c)))))) goto LAB_00751a80;
        pdVar164 = (pCVar162->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                   .m_storage.m_data;
        lVar154 = (long)dVar198 * lVar163;
        lVar165 = local_4aa0.m_cols * lVar165;
        dVar198 = (pdVar164 + lVar168 + lVar154)[1];
        dVar199 = (pdVar164 + (long)((long)ppMVar157 + lVar154))[1];
        local_4aa0.m_data[lVar165 + 0x5a] =
             pdVar164[lVar168 + lVar154] * local_3a70 +
             pdVar164[(long)((long)ppMVar157 + lVar154)] * local_39e0;
        (local_4aa0.m_data + lVar165 + 0x5a)[1] = dVar198 * dStack_3a68 + dVar199 * dStack_39d8;
        dVar198 = (pdVar164 + lVar168 + lVar154 + 2)[1];
        dVar199 = (pdVar164 + (long)ppMVar157 + lVar154 + 2)[1];
        local_4aa0.m_data[lVar165 + 0x5c] =
             pdVar164[lVar168 + lVar154 + 2] * local_3a60 +
             pdVar164[(long)ppMVar157 + lVar154 + 2] * (double)local_39d0;
        (local_4aa0.m_data + lVar165 + 0x5c)[1] = dVar198 * dStack_3a58 + dVar199 * dStack_39c8;
        dVar198 = (pdVar164 + lVar168 + lVar154 + 4)[1];
        dVar199 = (pdVar164 + (long)ppMVar157 + lVar154 + 4)[1];
        local_4aa0.m_data[lVar165 + 0x5e] =
             pdVar164[lVar168 + lVar154 + 4] * local_3a50 +
             pdVar164[(long)ppMVar157 + lVar154 + 4] * local_39c0;
        (local_4aa0.m_data + lVar165 + 0x5e)[1] =
             dVar198 * dStack_3a48 + dVar199 * (double)pdStack_39b8;
        dVar198 = (pdVar164 + lVar168 + lVar154 + 6)[1];
        dVar199 = (pdVar164 + (long)ppMVar157 + lVar154 + 6)[1];
        local_4aa0.m_data[lVar165 + 0x60] =
             pdVar164[lVar168 + lVar154 + 6] * local_3a40 +
             pdVar164[(long)ppMVar157 + lVar154 + 6] * local_39b0;
        (local_4aa0.m_data + lVar165 + 0x60)[1] = dVar198 * dStack_3a38 + dVar199 * dStack_39a8;
        dVar198 = (pdVar164 + lVar168 + lVar154 + 8)[1];
        dVar199 = (pdVar164 + (long)ppMVar157 + lVar154 + 8)[1];
        local_4aa0.m_data[lVar165 + 0x62] =
             pdVar164[lVar168 + lVar154 + 8] * local_3a30 +
             pdVar164[(long)ppMVar157 + lVar154 + 8] * local_39a0;
        (local_4aa0.m_data + lVar165 + 0x62)[1] = dVar198 * dStack_3a28 + dVar199 * dStack_3998;
        dVar198 = (pdVar164 + lVar168 + lVar154 + 10)[1];
        dVar199 = (pdVar164 + (long)ppMVar157 + lVar154 + 10)[1];
        local_4aa0.m_data[lVar165 + 100] =
             pdVar164[lVar168 + lVar154 + 10] * local_3a20 +
             pdVar164[(long)ppMVar157 + lVar154 + 10] * local_3990;
        (local_4aa0.m_data + lVar165 + 100)[1] = dVar198 * dStack_3a18 + dVar199 * dStack_3988;
        dVar198 = (pdVar164 + lVar168 + lVar154 + 0xc)[1];
        dVar199 = (pdVar164 + (long)ppMVar157 + lVar154 + 0xc)[1];
        local_4aa0.m_data[lVar165 + 0x66] =
             pdVar164[lVar168 + lVar154 + 0xc] * local_3a10 +
             pdVar164[(long)ppMVar157 + lVar154 + 0xc] * local_3980;
        (local_4aa0.m_data + lVar165 + 0x66)[1] = dVar198 * dStack_3a08 + dVar199 * dStack_3978;
        dVar198 = (pdVar164 + lVar168 + lVar154 + 0xe)[1];
        dVar199 = (pdVar164 + (long)ppMVar157 + lVar154 + 0xe)[1];
        local_4aa0.m_data[lVar165 + 0x68] =
             pdVar164[lVar168 + lVar154 + 0xe] * (double)local_3a00 +
             pdVar164[(long)ppMVar157 + lVar154 + 0xe] * local_3970;
        (local_4aa0.m_data + lVar165 + 0x68)[1] = dVar198 * dStack_39f8 + dVar199 * dStack_3968;
        dVar198 = (pdVar164 + lVar168 + lVar154 + 0x10)[1];
        dVar199 = (pdVar164 + (long)ppMVar157 + lVar154 + 0x10)[1];
        local_4aa0.m_data[lVar165 + 0x6a] =
             pdVar164[lVar168 + lVar154 + 0x10] * local_39f0 +
             pdVar164[(long)ppMVar157 + lVar154 + 0x10] * local_3960;
        (local_4aa0.m_data + lVar165 + 0x6a)[1] =
             dVar198 * (double)pdStack_39e8 + dVar199 * dStack_3958;
        if (((pCVar162->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
             m_storage.m_rows <= lVar163) ||
           (((lVar154 = (pCVar162->m_SD).
                        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                        m_cols, lVar154 < (long)dVar196 ||
             (lVar165 = lVar159 + 2, local_4aa0.m_rows <= lVar165)) || (local_4aa0.m_cols < 0x12))))
        goto LAB_00751a80;
        pdVar156 = (pCVar162->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                   .m_storage.m_data;
        lVar154 = lVar154 * lVar163;
        lVar167 = local_4aa0.m_cols * lVar165;
        pdVar164 = (double *)((long)pdVar156 + lVar154 * 8 + local_4928);
        dVar198 = pdVar164[1];
        local_4aa0.m_data[lVar167] = *pdVar164 * local_38c0;
        (local_4aa0.m_data + lVar167)[1] = dVar198 * dStack_38b8;
        pdVar164 = (double *)((long)pdVar156 + lVar154 * 8 + local_4928 + 0x10);
        dVar198 = pdVar164[1];
        local_4aa0.m_data[lVar167 + 2] = *pdVar164 * local_38b0;
        (local_4aa0.m_data + lVar167 + 2)[1] = dVar198 * dStack_38a8;
        pdVar164 = (double *)((long)pdVar156 + lVar154 * 8 + local_4928 + 0x20);
        dVar198 = pdVar164[1];
        local_4aa0.m_data[lVar167 + 4] = *pdVar164 * local_38a0;
        (local_4aa0.m_data + lVar167 + 4)[1] = dVar198 * dStack_3898;
        pdVar164 = (double *)((long)pdVar156 + lVar154 * 8 + local_4928 + 0x30);
        dVar198 = pdVar164[1];
        local_4aa0.m_data[lVar167 + 6] = *pdVar164 * local_3890;
        (local_4aa0.m_data + lVar167 + 6)[1] = dVar198 * dStack_3888;
        pdVar164 = (double *)((long)pdVar156 + lVar154 * 8 + local_4928 + 0x40);
        dVar198 = pdVar164[1];
        local_4aa0.m_data[lVar167 + 8] = *pdVar164 * local_3880;
        (local_4aa0.m_data + lVar167 + 8)[1] = dVar198 * dStack_3878;
        pdVar164 = (double *)((long)pdVar156 + lVar154 * 8 + local_4928 + 0x50);
        dVar198 = pdVar164[1];
        local_4aa0.m_data[lVar167 + 10] = *pdVar164 * local_3870;
        (local_4aa0.m_data + lVar167 + 10)[1] = dVar198 * dStack_3868;
        pdVar164 = (double *)((long)pdVar156 + lVar154 * 8 + local_4928 + 0x60);
        dVar198 = pdVar164[1];
        local_4aa0.m_data[lVar167 + 0xc] = *pdVar164 * local_3860;
        (local_4aa0.m_data + lVar167 + 0xc)[1] = dVar198 * dStack_3858;
        pdVar164 = (double *)((long)pdVar156 + lVar154 * 8 + local_4928 + 0x70);
        dVar198 = pdVar164[1];
        local_4aa0.m_data[lVar167 + 0xe] = *pdVar164 * local_3850;
        (local_4aa0.m_data + lVar167 + 0xe)[1] = dVar198 * dStack_3848;
        pdVar156 = (double *)((long)pdVar156 + lVar154 * 8 + local_4928 + 0x80);
        dVar198 = pdVar156[1];
        local_4aa0.m_data[lVar167 + 0x10] = *pdVar156 * local_3840;
        (local_4aa0.m_data + lVar167 + 0x10)[1] = dVar198 * dStack_3838;
        if ((((pCVar162->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar163) ||
            (lVar154 = (pCVar162->m_SD).
                       super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                       m_cols, lVar154 < (long)local_4a80)) ||
           ((local_4aa0.m_rows <= lVar165 || (local_4aa0.m_cols < 0x24)))) goto LAB_00751a80;
        pdVar156 = (pCVar162->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                   .m_storage.m_data;
        lVar154 = lVar154 * lVar163;
        lVar167 = local_4aa0.m_cols * lVar165;
        pdVar164 = (double *)((long)pdVar156 + lVar154 * 8 + (long)local_4a00);
        dVar198 = pdVar164[1];
        local_4aa0.m_data[lVar167 + 0x12] = *pdVar164 * local_3830;
        (local_4aa0.m_data + lVar167 + 0x12)[1] = dVar198 * dStack_3828;
        pdVar164 = (double *)((long)pdVar156 + lVar154 * 8 + (long)local_4a00 + 0x10U);
        dVar198 = pdVar164[1];
        local_4aa0.m_data[lVar167 + 0x14] = *pdVar164 * local_3820;
        (local_4aa0.m_data + lVar167 + 0x14)[1] = dVar198 * dStack_3818;
        pdVar164 = (double *)((long)pdVar156 + lVar154 * 8 + (long)local_4a00 + 0x20U);
        dVar198 = pdVar164[1];
        local_4aa0.m_data[lVar167 + 0x16] = *pdVar164 * local_3810;
        (local_4aa0.m_data + lVar167 + 0x16)[1] = dVar198 * dStack_3808;
        pdVar164 = (double *)((long)pdVar156 + lVar154 * 8 + (long)local_4a00 + 0x30U);
        dVar198 = pdVar164[1];
        local_4aa0.m_data[lVar167 + 0x18] = *pdVar164 * local_3800;
        (local_4aa0.m_data + lVar167 + 0x18)[1] = dVar198 * dStack_37f8;
        pdVar164 = (double *)((long)pdVar156 + lVar154 * 8 + (long)local_4a00 + 0x40U);
        dVar198 = pdVar164[1];
        local_4aa0.m_data[lVar167 + 0x1a] = *pdVar164 * local_37f0;
        (local_4aa0.m_data + lVar167 + 0x1a)[1] = dVar198 * dStack_37e8;
        pdVar164 = (double *)((long)pdVar156 + lVar154 * 8 + (long)local_4a00 + 0x50U);
        dVar198 = pdVar164[1];
        local_4aa0.m_data[lVar167 + 0x1c] = *pdVar164 * local_37e0;
        (local_4aa0.m_data + lVar167 + 0x1c)[1] = dVar198 * dStack_37d8;
        pdVar164 = (double *)((long)pdVar156 + lVar154 * 8 + (long)local_4a00 + 0x60U);
        dVar198 = pdVar164[1];
        local_4aa0.m_data[lVar167 + 0x1e] = *pdVar164 * local_37d0;
        (local_4aa0.m_data + lVar167 + 0x1e)[1] = dVar198 * dStack_37c8;
        pdVar164 = (double *)((long)pdVar156 + lVar154 * 8 + (long)local_4a00 + 0x70U);
        dVar198 = pdVar164[1];
        local_4aa0.m_data[lVar167 + 0x20] = *pdVar164 * local_37c0;
        (local_4aa0.m_data + lVar167 + 0x20)[1] = dVar198 * dStack_37b8;
        pdVar156 = (double *)((long)pdVar156 + lVar154 * 8 + (long)local_4a00 + 0x80U);
        dVar198 = pdVar156[1];
        local_4aa0.m_data[lVar167 + 0x22] = *pdVar156 * local_37b0;
        (local_4aa0.m_data + lVar167 + 0x22)[1] = dVar198 * dStack_37a8;
        if (((((pCVar162->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_rows <= lVar163) ||
             (lVar154 = (pCVar162->m_SD).
                        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                        m_cols, lVar154 < local_4a78)) || (local_4aa0.m_rows <= lVar165)) ||
           (local_4aa0.m_cols < 0x36)) goto LAB_00751a80;
        pdVar156 = (pCVar162->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                   .m_storage.m_data;
        lVar154 = lVar154 * lVar163;
        lVar161 = local_4aa0.m_cols * lVar165;
        lVar167 = CONCAT71(uStack_493f,local_4940);
        pdVar164 = (double *)((long)pdVar156 + lVar154 * 8 + lVar167);
        dVar198 = pdVar164[1];
        local_4aa0.m_data[lVar161 + 0x24] = *pdVar164 * local_37a0;
        (local_4aa0.m_data + lVar161 + 0x24)[1] = dVar198 * dStack_3798;
        pdVar164 = (double *)((long)pdVar156 + lVar154 * 8 + lVar167 + 0x10);
        dVar198 = pdVar164[1];
        local_4aa0.m_data[lVar161 + 0x26] = *pdVar164 * local_3790;
        (local_4aa0.m_data + lVar161 + 0x26)[1] = dVar198 * dStack_3788;
        pdVar164 = (double *)((long)pdVar156 + lVar154 * 8 + lVar167 + 0x20);
        dVar198 = pdVar164[1];
        local_4aa0.m_data[lVar161 + 0x28] = *pdVar164 * local_3780;
        (local_4aa0.m_data + lVar161 + 0x28)[1] = dVar198 * dStack_3778;
        pdVar164 = (double *)((long)pdVar156 + lVar154 * 8 + lVar167 + 0x30);
        dVar198 = pdVar164[1];
        local_4aa0.m_data[lVar161 + 0x2a] = *pdVar164 * local_3770;
        (local_4aa0.m_data + lVar161 + 0x2a)[1] = dVar198 * dStack_3768;
        pdVar164 = (double *)((long)pdVar156 + lVar154 * 8 + lVar167 + 0x40);
        dVar198 = pdVar164[1];
        local_4aa0.m_data[lVar161 + 0x2c] = *pdVar164 * local_3760;
        (local_4aa0.m_data + lVar161 + 0x2c)[1] = dVar198 * dStack_3758;
        pdVar164 = (double *)((long)pdVar156 + lVar154 * 8 + lVar167 + 0x50);
        dVar198 = pdVar164[1];
        local_4aa0.m_data[lVar161 + 0x2e] = *pdVar164 * local_3750;
        (local_4aa0.m_data + lVar161 + 0x2e)[1] = dVar198 * dStack_3748;
        pdVar164 = (double *)((long)pdVar156 + lVar154 * 8 + lVar167 + 0x60);
        dVar198 = pdVar164[1];
        local_4aa0.m_data[lVar161 + 0x30] = *pdVar164 * local_3740;
        (local_4aa0.m_data + lVar161 + 0x30)[1] = dVar198 * dStack_3738;
        pdVar164 = (double *)((long)pdVar156 + lVar154 * 8 + lVar167 + 0x70);
        dVar198 = pdVar164[1];
        local_4aa0.m_data[lVar161 + 0x32] = *pdVar164 * local_3730;
        (local_4aa0.m_data + lVar161 + 0x32)[1] = dVar198 * dStack_3728;
        pdVar156 = (double *)((long)pdVar156 + lVar154 * 8 + lVar167 + 0x80);
        dVar198 = pdVar156[1];
        local_4aa0.m_data[lVar161 + 0x34] = *pdVar156 * local_3720;
        (local_4aa0.m_data + lVar161 + 0x34)[1] = dVar198 * dStack_3718;
        if (((((pCVar162->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_rows <= lVar163) ||
             (uVar160 = (pCVar162->m_SD).
                        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                        m_cols, (long)uVar160 < local_4a78)) || (uVar160 < local_4a80)) ||
           ((local_4aa0.m_rows <= lVar165 || (local_4aa0.m_cols < 0x48)))) goto LAB_00751a80;
        pdVar164 = (pCVar162->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                   .m_storage.m_data;
        lVar154 = uVar160 * lVar163;
        lVar167 = local_4aa0.m_cols * lVar165;
        dVar198 = (pdVar164 + lVar170 + lVar154)[1];
        dVar199 = (pdVar164 + lVar168 + lVar154)[1];
        local_4aa0.m_data[lVar167 + 0x36] =
             pdVar164[lVar170 + lVar154] * local_3830 + pdVar164[lVar168 + lVar154] * local_37a0;
        (local_4aa0.m_data + lVar167 + 0x36)[1] = dVar198 * dStack_3828 + dVar199 * dStack_3798;
        dVar198 = (pdVar164 + lVar170 + lVar154 + 2)[1];
        dVar199 = (pdVar164 + lVar168 + lVar154 + 2)[1];
        local_4aa0.m_data[lVar167 + 0x38] =
             pdVar164[lVar170 + lVar154 + 2] * local_3820 +
             pdVar164[lVar168 + lVar154 + 2] * local_3790;
        (local_4aa0.m_data + lVar167 + 0x38)[1] = dVar198 * dStack_3818 + dVar199 * dStack_3788;
        dVar198 = (pdVar164 + lVar170 + lVar154 + 4)[1];
        dVar199 = (pdVar164 + lVar168 + lVar154 + 4)[1];
        local_4aa0.m_data[lVar167 + 0x3a] =
             pdVar164[lVar170 + lVar154 + 4] * local_3810 +
             pdVar164[lVar168 + lVar154 + 4] * local_3780;
        (local_4aa0.m_data + lVar167 + 0x3a)[1] = dVar198 * dStack_3808 + dVar199 * dStack_3778;
        dVar198 = (pdVar164 + lVar170 + lVar154 + 6)[1];
        dVar199 = (pdVar164 + lVar168 + lVar154 + 6)[1];
        local_4aa0.m_data[lVar167 + 0x3c] =
             pdVar164[lVar170 + lVar154 + 6] * local_3800 +
             pdVar164[lVar168 + lVar154 + 6] * local_3770;
        (local_4aa0.m_data + lVar167 + 0x3c)[1] = dVar198 * dStack_37f8 + dVar199 * dStack_3768;
        dVar198 = (pdVar164 + lVar170 + lVar154 + 8)[1];
        dVar199 = (pdVar164 + lVar168 + lVar154 + 8)[1];
        local_4aa0.m_data[lVar167 + 0x3e] =
             pdVar164[lVar170 + lVar154 + 8] * local_37f0 +
             pdVar164[lVar168 + lVar154 + 8] * local_3760;
        (local_4aa0.m_data + lVar167 + 0x3e)[1] = dVar198 * dStack_37e8 + dVar199 * dStack_3758;
        dVar198 = (pdVar164 + lVar170 + lVar154 + 10)[1];
        dVar199 = (pdVar164 + lVar168 + lVar154 + 10)[1];
        local_4aa0.m_data[lVar167 + 0x40] =
             pdVar164[lVar170 + lVar154 + 10] * local_37e0 +
             pdVar164[lVar168 + lVar154 + 10] * local_3750;
        (local_4aa0.m_data + lVar167 + 0x40)[1] = dVar198 * dStack_37d8 + dVar199 * dStack_3748;
        dVar198 = (pdVar164 + lVar170 + lVar154 + 0xc)[1];
        dVar199 = (pdVar164 + lVar168 + lVar154 + 0xc)[1];
        local_4aa0.m_data[lVar167 + 0x42] =
             pdVar164[lVar170 + lVar154 + 0xc] * local_37d0 +
             pdVar164[lVar168 + lVar154 + 0xc] * local_3740;
        (local_4aa0.m_data + lVar167 + 0x42)[1] = dVar198 * dStack_37c8 + dVar199 * dStack_3738;
        dVar198 = (pdVar164 + lVar170 + lVar154 + 0xe)[1];
        dVar199 = (pdVar164 + lVar168 + lVar154 + 0xe)[1];
        local_4aa0.m_data[lVar167 + 0x44] =
             pdVar164[lVar170 + lVar154 + 0xe] * local_37c0 +
             pdVar164[lVar168 + lVar154 + 0xe] * local_3730;
        (local_4aa0.m_data + lVar167 + 0x44)[1] = dVar198 * dStack_37b8 + dVar199 * dStack_3728;
        dVar198 = (pdVar164 + lVar170 + lVar154 + 0x10)[1];
        dVar199 = (pdVar164 + lVar168 + lVar154 + 0x10)[1];
        local_4aa0.m_data[lVar167 + 0x46] =
             pdVar164[lVar170 + lVar154 + 0x10] * local_37b0 +
             pdVar164[lVar168 + lVar154 + 0x10] * local_3720;
        (local_4aa0.m_data + lVar167 + 0x46)[1] = dVar198 * dStack_37a8 + dVar199 * dStack_3718;
        if (((((pCVar162->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_rows <= lVar163) ||
             ((dVar198 = (double)(pCVar162->m_SD).
                                 super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                                 m_storage.m_cols, (long)dVar198 < local_4a78 ||
              ((ulong)dVar198 < (ulong)dVar196)))) || (local_4aa0.m_rows <= lVar165)) ||
           (local_4aa0.m_cols < 0x5a)) goto LAB_00751a80;
        pdVar164 = (pCVar162->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                   .m_storage.m_data;
        lVar154 = (long)dVar198 * lVar163;
        lVar167 = local_4aa0.m_cols * lVar165;
        dVar198 = (pdVar164 + lVar170 + lVar154)[1];
        dVar199 = (pdVar164 + (long)((long)ppMVar157 + lVar154))[1];
        local_4aa0.m_data[lVar167 + 0x48] =
             pdVar164[lVar170 + lVar154] * local_38c0 +
             pdVar164[(long)((long)ppMVar157 + lVar154)] * local_37a0;
        (local_4aa0.m_data + lVar167 + 0x48)[1] = dVar198 * dStack_38b8 + dVar199 * dStack_3798;
        dVar198 = (pdVar164 + lVar170 + lVar154 + 2)[1];
        dVar199 = (pdVar164 + (long)ppMVar157 + lVar154 + 2)[1];
        local_4aa0.m_data[lVar167 + 0x4a] =
             pdVar164[lVar170 + lVar154 + 2] * local_38b0 +
             pdVar164[(long)ppMVar157 + lVar154 + 2] * local_3790;
        (local_4aa0.m_data + lVar167 + 0x4a)[1] = dVar198 * dStack_38a8 + dVar199 * dStack_3788;
        dVar198 = (pdVar164 + lVar170 + lVar154 + 4)[1];
        dVar199 = (pdVar164 + (long)ppMVar157 + lVar154 + 4)[1];
        local_4aa0.m_data[lVar167 + 0x4c] =
             pdVar164[lVar170 + lVar154 + 4] * local_38a0 +
             pdVar164[(long)ppMVar157 + lVar154 + 4] * local_3780;
        (local_4aa0.m_data + lVar167 + 0x4c)[1] = dVar198 * dStack_3898 + dVar199 * dStack_3778;
        dVar198 = (pdVar164 + lVar170 + lVar154 + 6)[1];
        dVar199 = (pdVar164 + (long)ppMVar157 + lVar154 + 6)[1];
        local_4aa0.m_data[lVar167 + 0x4e] =
             pdVar164[lVar170 + lVar154 + 6] * local_3890 +
             pdVar164[(long)ppMVar157 + lVar154 + 6] * local_3770;
        (local_4aa0.m_data + lVar167 + 0x4e)[1] = dVar198 * dStack_3888 + dVar199 * dStack_3768;
        dVar198 = (pdVar164 + lVar170 + lVar154 + 8)[1];
        dVar199 = (pdVar164 + (long)ppMVar157 + lVar154 + 8)[1];
        local_4aa0.m_data[lVar167 + 0x50] =
             pdVar164[lVar170 + lVar154 + 8] * local_3880 +
             pdVar164[(long)ppMVar157 + lVar154 + 8] * local_3760;
        (local_4aa0.m_data + lVar167 + 0x50)[1] = dVar198 * dStack_3878 + dVar199 * dStack_3758;
        dVar198 = (pdVar164 + lVar170 + lVar154 + 10)[1];
        dVar199 = (pdVar164 + (long)ppMVar157 + lVar154 + 10)[1];
        local_4aa0.m_data[lVar167 + 0x52] =
             pdVar164[lVar170 + lVar154 + 10] * local_3870 +
             pdVar164[(long)ppMVar157 + lVar154 + 10] * local_3750;
        (local_4aa0.m_data + lVar167 + 0x52)[1] = dVar198 * dStack_3868 + dVar199 * dStack_3748;
        dVar198 = (pdVar164 + lVar170 + lVar154 + 0xc)[1];
        dVar199 = (pdVar164 + (long)ppMVar157 + lVar154 + 0xc)[1];
        local_4aa0.m_data[lVar167 + 0x54] =
             pdVar164[lVar170 + lVar154 + 0xc] * local_3860 +
             pdVar164[(long)ppMVar157 + lVar154 + 0xc] * local_3740;
        (local_4aa0.m_data + lVar167 + 0x54)[1] = dVar198 * dStack_3858 + dVar199 * dStack_3738;
        dVar198 = (pdVar164 + lVar170 + lVar154 + 0xe)[1];
        dVar199 = (pdVar164 + (long)ppMVar157 + lVar154 + 0xe)[1];
        local_4aa0.m_data[lVar167 + 0x56] =
             pdVar164[lVar170 + lVar154 + 0xe] * local_3850 +
             pdVar164[(long)ppMVar157 + lVar154 + 0xe] * local_3730;
        (local_4aa0.m_data + lVar167 + 0x56)[1] = dVar198 * dStack_3848 + dVar199 * dStack_3728;
        dVar198 = (pdVar164 + lVar170 + lVar154 + 0x10)[1];
        dVar199 = (pdVar164 + (long)ppMVar157 + lVar154 + 0x10)[1];
        local_4aa0.m_data[lVar167 + 0x58] =
             pdVar164[lVar170 + lVar154 + 0x10] * local_3840 +
             pdVar164[(long)ppMVar157 + lVar154 + 0x10] * local_3720;
        (local_4aa0.m_data + lVar167 + 0x58)[1] = dVar198 * dStack_3838 + dVar199 * dStack_3718;
        if (((((pCVar162->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_rows <= lVar163) ||
             (dVar198 = (double)(pCVar162->m_SD).
                                super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                                m_storage.m_cols, (long)dVar198 < (long)local_4a80)) ||
            ((ulong)dVar198 < (ulong)dVar196)) ||
           ((local_4aa0.m_rows <= lVar165 || (local_4aa0.m_cols < 0x6c)))) goto LAB_00751a80;
        pdVar164 = (pCVar162->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                   .m_storage.m_data;
        lVar154 = (long)dVar198 * lVar163;
        lVar165 = local_4aa0.m_cols * lVar165;
        lVar163 = lVar163 + 1;
        lVar159 = lVar159 + 3;
        dVar158 = (pdVar164 + lVar168 + lVar154)[1];
        dVar198 = (pdVar164 + (long)((long)ppMVar157 + lVar154))[1];
        local_4aa0.m_data[lVar165 + 0x5a] =
             pdVar164[lVar168 + lVar154] * local_38c0 +
             pdVar164[(long)((long)ppMVar157 + lVar154)] * local_3830;
        (local_4aa0.m_data + lVar165 + 0x5a)[1] = dVar158 * dStack_38b8 + dVar198 * dStack_3828;
        dVar158 = (pdVar164 + lVar168 + lVar154 + 2)[1];
        dVar198 = (pdVar164 + (long)ppMVar157 + lVar154 + 2)[1];
        local_4aa0.m_data[lVar165 + 0x5c] =
             pdVar164[lVar168 + lVar154 + 2] * local_38b0 +
             pdVar164[(long)ppMVar157 + lVar154 + 2] * local_3820;
        (local_4aa0.m_data + lVar165 + 0x5c)[1] = dVar158 * dStack_38a8 + dVar198 * dStack_3818;
        dVar158 = (pdVar164 + lVar168 + lVar154 + 4)[1];
        dVar198 = (pdVar164 + (long)ppMVar157 + lVar154 + 4)[1];
        local_4aa0.m_data[lVar165 + 0x5e] =
             pdVar164[lVar168 + lVar154 + 4] * local_38a0 +
             pdVar164[(long)ppMVar157 + lVar154 + 4] * local_3810;
        (local_4aa0.m_data + lVar165 + 0x5e)[1] = dVar158 * dStack_3898 + dVar198 * dStack_3808;
        dVar158 = (pdVar164 + lVar168 + lVar154 + 6)[1];
        dVar198 = (pdVar164 + (long)ppMVar157 + lVar154 + 6)[1];
        local_4aa0.m_data[lVar165 + 0x60] =
             pdVar164[lVar168 + lVar154 + 6] * local_3890 +
             pdVar164[(long)ppMVar157 + lVar154 + 6] * local_3800;
        (local_4aa0.m_data + lVar165 + 0x60)[1] = dVar158 * dStack_3888 + dVar198 * dStack_37f8;
        dVar158 = (pdVar164 + lVar168 + lVar154 + 8)[1];
        dVar198 = (pdVar164 + (long)ppMVar157 + lVar154 + 8)[1];
        local_4aa0.m_data[lVar165 + 0x62] =
             pdVar164[lVar168 + lVar154 + 8] * local_3880 +
             pdVar164[(long)ppMVar157 + lVar154 + 8] * local_37f0;
        (local_4aa0.m_data + lVar165 + 0x62)[1] = dVar158 * dStack_3878 + dVar198 * dStack_37e8;
        dVar158 = (pdVar164 + lVar168 + lVar154 + 10)[1];
        dVar198 = (pdVar164 + (long)ppMVar157 + lVar154 + 10)[1];
        local_4aa0.m_data[lVar165 + 100] =
             pdVar164[lVar168 + lVar154 + 10] * local_3870 +
             pdVar164[(long)ppMVar157 + lVar154 + 10] * local_37e0;
        (local_4aa0.m_data + lVar165 + 100)[1] = dVar158 * dStack_3868 + dVar198 * dStack_37d8;
        dVar158 = (pdVar164 + lVar168 + lVar154 + 0xc)[1];
        dVar198 = (pdVar164 + (long)ppMVar157 + lVar154 + 0xc)[1];
        local_4aa0.m_data[lVar165 + 0x66] =
             pdVar164[lVar168 + lVar154 + 0xc] * local_3860 +
             pdVar164[(long)ppMVar157 + lVar154 + 0xc] * local_37d0;
        (local_4aa0.m_data + lVar165 + 0x66)[1] = dVar158 * dStack_3858 + dVar198 * dStack_37c8;
        dVar158 = (pdVar164 + lVar168 + lVar154 + 0xe)[1];
        dVar198 = (pdVar164 + (long)ppMVar157 + lVar154 + 0xe)[1];
        local_4aa0.m_data[lVar165 + 0x68] =
             pdVar164[lVar168 + lVar154 + 0xe] * local_3850 +
             pdVar164[(long)ppMVar157 + lVar154 + 0xe] * local_37c0;
        (local_4aa0.m_data + lVar165 + 0x68)[1] = dVar158 * dStack_3848 + dVar198 * dStack_37b8;
        dVar158 = (pdVar164 + lVar168 + lVar154 + 0x10)[1];
        dVar198 = (pdVar164 + (long)ppMVar157 + lVar154 + 0x10)[1];
        local_4aa0.m_data[lVar165 + 0x6a] =
             pdVar164[lVar168 + lVar154 + 0x10] * local_3840 +
             pdVar164[(long)ppMVar157 + lVar154 + 0x10] * local_37b0;
        (local_4aa0.m_data + lVar165 + 0x6a)[1] = dVar158 * dStack_3838 + dVar198 * dStack_37a8;
      } while (lVar163 != 0x18);
      pLVar169 = (pCVar162->m_layers).
                 super__Vector_base<chrono::fea::ChElementShellANCF_3833::Layer,_Eigen::aligned_allocator<chrono::fea::ChElementShellANCF_3833::Layer>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      lVar159 = (long)pLVar169[local_49e8].m_material.
                      super___shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr;
      pCVar162 = (ChElementShellANCF_3833 *)
                 pLVar169[local_49e8].m_material.
                 super___shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
      local_4a00 = dVar196;
      if (pCVar162 == (ChElementShellANCF_3833 *)0x0) {
        pCVar162 = (ChElementShellANCF_3833 *)local_47a0;
        memcpy(pCVar162,(void *)(lVar159 + 0x20),0x120);
        dst = local_4a48;
      }
      else {
        if (__libc_single_threaded == '\0') {
          LOCK();
          pCVar107 = (ChKblockGeneric *)
                     ((long)&(pCVar162->super_ChElementShell).super_ChElementGeneric + 8);
          *(int *)&(pCVar107->super_ChKblock)._vptr_ChKblock =
               *(int *)&(pCVar107->super_ChKblock)._vptr_ChKblock + 1;
          UNLOCK();
        }
        else {
          pCVar107 = (ChKblockGeneric *)
                     ((long)&(pCVar162->super_ChElementShell).super_ChElementGeneric + 8);
          *(int *)&(pCVar107->super_ChKblock)._vptr_ChKblock =
               *(int *)&(pCVar107->super_ChKblock)._vptr_ChKblock + 1;
        }
        memcpy(local_47a0,(void *)(lVar159 + 0x20),0x120);
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pCVar162);
        pLVar169 = (pCVar108->m_layers).
                   super__Vector_base<chrono::fea::ChElementShellANCF_3833::Layer,_Eigen::aligned_allocator<chrono::fea::ChElementShellANCF_3833::Layer>_>
                   ._M_impl.super__Vector_impl_data._M_start;
      }
      RotateReorderStiffnessMatrix
                (pCVar162,(ChMatrixNM<double,_6,_6> *)local_47a0,pLVar169[lVar149].m_theta);
      local_4a20 = 0.0;
      local_4a38._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      lStack_4a28 = 0;
      this_00 = (DenseStorage<double,__1,__1,__1,_1> *)(local_4a38 + 8);
      Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize(this_00,0x1e60,0x48,0x6c);
      pCVar162 = local_4a50;
      if ((((local_4aa0.m_rows < 0x48) || (local_4aa0.m_cols < 0x12)) ||
          (((ulong)local_4aa0.m_cols < 0x24 ||
           ((((ulong)local_4aa0.m_cols < 0x36 || ((ulong)local_4aa0.m_cols < 0x48)) ||
            ((ulong)local_4aa0.m_cols < 0x5a)))))) || ((ulong)local_4aa0.m_cols < 0x6c)) {
LAB_00751ab6:
        __function = 
        "Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 72, 18>::Block(XprType &, Index, Index) [XprType = Eigen::Matrix<double, -1, -1, 1>, BlockRows = 72, BlockCols = 18, InnerPanel = false]"
        ;
        goto LAB_00751aac;
      }
      local_49e0._0_8_ = local_4a38._8_8_;
      avStack_49c8[0].m_value = 0;
      avStack_49c8[1].m_value = 0;
      dStack_49b8 = local_4a20;
      local_49d0 = this_00;
      if ((lStack_4a28 < 0x48) || ((long)local_4a20 < 0x12)) goto LAB_00751ab6;
      local_2d50[0] = (Matrix<double,_24,_6,_1,_24,_6> *)local_47a0._0_8_;
      local_2d40 = local_4aa0.m_data;
      local_2d10 = local_4aa0.m_data + 0x12;
      local_2ce0 = local_4aa0.m_data + 0x24;
      local_2cb0 = local_4aa0.m_data + 0x36;
      local_2c80 = local_4aa0.m_data + 0x48;
      local_2c50 = local_4aa0.m_data + 0x5a;
      local_2d30 = local_4aa0.m_cols;
      local_2d20 = (pointer)local_47a0._8_8_;
      local_4840._0_8_ = local_4a38._8_8_;
      local_48f0.m_functor = (assign_op<double,_double> *)&local_3710;
      local_4840._16_8_ = local_4a20;
      local_2d00 = local_4aa0.m_cols;
      local_2cf0 = (pointer)local_47a0._16_8_;
      local_2cd0 = local_4aa0.m_cols;
      local_2cc0 = (ChLoadableUV)local_47a0._24_8_;
      local_2ca0 = local_4aa0.m_cols;
      local_2c90 = (ChLoadableUVW)local_47a0._32_8_;
      local_2c70 = local_4aa0.m_cols;
      local_2c60 = (pointer)local_47a0._40_8_;
      local_48f0.m_dst = (DstEvaluatorType *)local_4840;
      local_2c40 = local_4aa0.m_cols;
      local_48f0.m_dstExpr = (DstXprType *)local_49e0;
      local_48f0.m_src = (SrcEvaluatorType *)local_2d80;
      Eigen::internal::dense_assignment_loop<$6a6cce9$>::run(&local_48f0);
      if (((local_4aa0.m_rows < 0x48) ||
          ((local_4aa0.m_cols < 0x12 || ((ulong)local_4aa0.m_cols < 0x24)))) ||
         (((ulong)local_4aa0.m_cols < 0x36 ||
          ((((ulong)local_4aa0.m_cols < 0x48 || ((ulong)local_4aa0.m_cols < 0x5a)) ||
           ((ulong)local_4aa0.m_cols < 0x6c)))))) goto LAB_00751ab6;
      local_49e0._0_8_ = local_4a38._8_8_ + 0x90;
      avStack_49c8[0].m_value = 0;
      avStack_49c8[1].m_value = 0x12;
      dStack_49b8 = local_4a20;
      local_49d0 = this_00;
      if ((lStack_4a28 < 0x48) || ((long)local_4a20 < 0x24)) goto LAB_00751ab6;
      local_2d50[0] = (Matrix<double,_24,_6,_1,_24,_6> *)local_47a0._48_8_;
      local_2d40 = local_4aa0.m_data;
      local_2d10 = local_4aa0.m_data + 0x12;
      local_2ce0 = local_4aa0.m_data + 0x24;
      local_2cb0 = local_4aa0.m_data + 0x36;
      local_2c80 = local_4aa0.m_data + 0x48;
      local_2c50 = local_4aa0.m_data + 0x5a;
      local_2d30 = local_4aa0.m_cols;
      local_2d20 = (pointer)local_47a0._56_8_;
      local_48f0.m_functor = (assign_op<double,_double> *)&local_3710;
      local_4840._16_8_ = local_4a20;
      local_2d00 = local_4aa0.m_cols;
      local_2cf0 = (pointer)local_47a0._64_8_;
      local_2cd0 = local_4aa0.m_cols;
      local_2cc0 = (ChLoadableUV)local_47a0._72_8_;
      local_2ca0 = local_4aa0.m_cols;
      local_2c90 = (ChLoadableUVW)local_47a0._80_8_;
      local_2c70 = local_4aa0.m_cols;
      local_2c60 = (pointer)local_47a0._88_8_;
      local_48f0.m_dst = (DstEvaluatorType *)local_4840;
      local_2c40 = local_4aa0.m_cols;
      local_48f0.m_dstExpr = (DstXprType *)local_49e0;
      local_48f0.m_src = (SrcEvaluatorType *)local_2d80;
      local_4840._0_8_ = local_49e0._0_8_;
      Eigen::internal::dense_assignment_loop<$6a6cce9$>::run(&local_48f0);
      if ((((local_4aa0.m_rows < 0x48) ||
           ((local_4aa0.m_cols < 0x12 || ((ulong)local_4aa0.m_cols < 0x24)))) ||
          ((ulong)local_4aa0.m_cols < 0x36)) ||
         ((((ulong)local_4aa0.m_cols < 0x48 || ((ulong)local_4aa0.m_cols < 0x5a)) ||
          ((ulong)local_4aa0.m_cols < 0x6c)))) goto LAB_00751ab6;
      local_49e0._0_8_ = local_4a38._8_8_ + 0x120;
      avStack_49c8[0].m_value = 0;
      avStack_49c8[1].m_value = 0x24;
      dStack_49b8 = local_4a20;
      local_49d0 = this_00;
      if ((lStack_4a28 < 0x48) || ((long)local_4a20 < 0x36)) goto LAB_00751ab6;
      local_2d50[0] = local_4740;
      local_2d40 = local_4aa0.m_data;
      local_2d10 = local_4aa0.m_data + 0x12;
      local_2ce0 = local_4aa0.m_data + 0x24;
      local_2cb0 = local_4aa0.m_data + 0x36;
      local_2c80 = local_4aa0.m_data + 0x48;
      local_2c50 = local_4aa0.m_data + 0x5a;
      local_2d30 = local_4aa0.m_cols;
      local_2d20 = local_4738;
      local_48f0.m_functor = (assign_op<double,_double> *)&local_3710;
      local_4840._16_8_ = local_4a20;
      local_2d00 = local_4aa0.m_cols;
      local_2cf0 = local_4730;
      local_2cd0 = local_4aa0.m_cols;
      local_2cc0 = local_4728;
      local_2ca0 = local_4aa0.m_cols;
      local_2c90 = local_4720;
      local_2c70 = local_4aa0.m_cols;
      local_2c60 = local_4718;
      local_48f0.m_dst = (DstEvaluatorType *)local_4840;
      local_2c40 = local_4aa0.m_cols;
      local_48f0.m_dstExpr = (DstXprType *)local_49e0;
      local_48f0.m_src = (SrcEvaluatorType *)local_2d80;
      local_4840._0_8_ = local_49e0._0_8_;
      Eigen::internal::dense_assignment_loop<$6a6cce9$>::run(&local_48f0);
      if ((((local_4aa0.m_rows < 0x48) ||
           ((local_4aa0.m_cols < 0x12 || ((ulong)local_4aa0.m_cols < 0x24)))) ||
          ((ulong)local_4aa0.m_cols < 0x36)) ||
         ((((ulong)local_4aa0.m_cols < 0x48 || ((ulong)local_4aa0.m_cols < 0x5a)) ||
          ((ulong)local_4aa0.m_cols < 0x6c)))) goto LAB_00751ab6;
      local_49e0._0_8_ = local_4a38._8_8_ + 0x1b0;
      avStack_49c8[0].m_value = 0;
      avStack_49c8[1].m_value = 0x36;
      dStack_49b8 = local_4a20;
      local_49d0 = this_00;
      if ((lStack_4a28 < 0x48) || ((long)local_4a20 < 0x48)) goto LAB_00751ab6;
      local_2d50[0] = local_4710;
      local_2d40 = local_4aa0.m_data;
      local_2ce0 = local_4aa0.m_data + 0x24;
      local_2cb0 = local_4aa0.m_data + 0x36;
      local_2c80 = local_4aa0.m_data + 0x48;
      local_2d30 = local_4aa0.m_cols;
      local_2d20 = local_4708;
      local_48f0.m_functor = (assign_op<double,_double> *)&local_3710;
      local_4840._16_8_ = local_4a20;
      local_2d10 = local_4aa0.m_data + 0x12;
      local_2c50 = local_4aa0.m_data + 0x5a;
      local_2d00 = local_4aa0.m_cols;
      local_2cf0 = local_4700;
      local_2cd0 = local_4aa0.m_cols;
      local_2cc0 = local_46f8;
      local_2ca0 = local_4aa0.m_cols;
      local_2c90 = local_46f0;
      local_2c70 = local_4aa0.m_cols;
      local_2c60 = local_46e8;
      local_48f0.m_dst = (DstEvaluatorType *)local_4840;
      local_2c40 = local_4aa0.m_cols;
      local_48f0.m_dstExpr = (DstXprType *)local_49e0;
      local_48f0.m_src = (SrcEvaluatorType *)local_2d80;
      local_4840._0_8_ = local_49e0._0_8_;
      Eigen::internal::dense_assignment_loop<$6a6cce9$>::run(&local_48f0);
      if (((local_4aa0.m_rows < 0x48) ||
          ((local_4aa0.m_cols < 0x12 || ((ulong)local_4aa0.m_cols < 0x24)))) ||
         (((ulong)local_4aa0.m_cols < 0x36 ||
          ((((ulong)local_4aa0.m_cols < 0x48 || ((ulong)local_4aa0.m_cols < 0x5a)) ||
           ((ulong)local_4aa0.m_cols < 0x6c)))))) goto LAB_00751ab6;
      local_49e0._0_8_ = local_4a38._8_8_ + 0x240;
      avStack_49c8[0].m_value = 0;
      avStack_49c8[1].m_value = 0x48;
      dStack_49b8 = local_4a20;
      local_49d0 = this_00;
      if ((lStack_4a28 < 0x48) || ((long)local_4a20 < 0x5a)) goto LAB_00751ab6;
      local_2d50[0] = local_46e0;
      local_2d40 = local_4aa0.m_data;
      local_2d10 = local_4aa0.m_data + 0x12;
      local_2ce0 = local_4aa0.m_data + 0x24;
      local_2cb0 = local_4aa0.m_data + 0x36;
      local_2c80 = local_4aa0.m_data + 0x48;
      local_2c50 = local_4aa0.m_data + 0x5a;
      local_2d30 = local_4aa0.m_cols;
      local_2d20 = local_46d8;
      local_48f0.m_functor = (assign_op<double,_double> *)&local_3710;
      local_4840._16_8_ = local_4a20;
      local_2d00 = local_4aa0.m_cols;
      local_2cf0 = local_46d0;
      local_2cd0 = local_4aa0.m_cols;
      local_2cc0 = local_46c8;
      local_2ca0 = local_4aa0.m_cols;
      local_2c90 = local_46c0;
      local_2c70 = local_4aa0.m_cols;
      local_2c60 = local_46b8;
      local_48f0.m_dst = (DstEvaluatorType *)local_4840;
      local_2c40 = local_4aa0.m_cols;
      local_48f0.m_dstExpr = (DstXprType *)local_49e0;
      local_48f0.m_src = (SrcEvaluatorType *)local_2d80;
      local_4840._0_8_ = local_49e0._0_8_;
      Eigen::internal::dense_assignment_loop<$6a6cce9$>::run(&local_48f0);
      if ((((local_4aa0.m_rows < 0x48) ||
           ((local_4aa0.m_cols < 0x12 || ((ulong)local_4aa0.m_cols < 0x24)))) ||
          ((ulong)local_4aa0.m_cols < 0x36)) ||
         ((((ulong)local_4aa0.m_cols < 0x48 || ((ulong)local_4aa0.m_cols < 0x5a)) ||
          ((ulong)local_4aa0.m_cols < 0x6c)))) goto LAB_00751ab6;
      local_49e0._0_8_ = local_4a38._8_8_ + 0x2d0;
      avStack_49c8[0].m_value = 0;
      avStack_49c8[1].m_value = 0x5a;
      dStack_49b8 = local_4a20;
      local_49d0 = this_00;
      if ((lStack_4a28 < 0x48) || ((long)local_4a20 < 0x6c)) goto LAB_00751ab6;
      local_2d50[0] = local_46b0;
      local_2d40 = local_4aa0.m_data;
      local_2d10 = local_4aa0.m_data + 0x12;
      local_2ce0 = local_4aa0.m_data + 0x24;
      local_2cb0 = local_4aa0.m_data + 0x36;
      local_2c80 = local_4aa0.m_data + 0x48;
      local_2c50 = local_4aa0.m_data + 0x5a;
      local_2d30 = local_4aa0.m_cols;
      local_2d20 = local_46a8;
      local_4840._16_8_ = local_4a20;
      local_2d00 = local_4aa0.m_cols;
      local_2cf0 = local_46a0;
      local_2cd0 = local_4aa0.m_cols;
      local_2cc0 = local_4698;
      local_2ca0 = local_4aa0.m_cols;
      local_2c90 = local_4690;
      local_2c70 = local_4aa0.m_cols;
      local_2c60 = local_4688;
      local_48f0.m_dst = (DstEvaluatorType *)local_4840;
      local_2c40 = local_4aa0.m_cols;
      local_48f0.m_dstExpr = (DstXprType *)local_49e0;
      local_48f0.m_src = (SrcEvaluatorType *)local_2d80;
      local_48f0.m_functor = (assign_op<double,_double> *)&local_3710;
      local_4840._0_8_ = local_49e0._0_8_;
      Eigen::internal::dense_assignment_loop<$6a6cce9$>::run(&local_48f0);
      if ((double)local_4a70.m_cols != local_4a20) {
        __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                      ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,
                      "Eigen::Product<Eigen::Matrix<double, -1, -1, 1>, Eigen::Transpose<Eigen::Matrix<double, -1, -1, 1>>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, -1, -1, 1>, Rhs = Eigen::Transpose<Eigen::Matrix<double, -1, -1, 1>>, Option = 0]"
                     );
      }
      local_2d80 = (undefined1  [8])&local_4a70;
      TStack_2d78.m_matrix = (non_const_type)this_00;
      if (((dst->
           super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
           ).
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
           .
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
           .m_rows.m_value != local_4a70.m_rows) ||
         ((dst->
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
          ).
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
          .
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
          .m_cols.m_value != lStack_4a28)) {
        __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                      "/usr/include/eigen3/Eigen/src/Core/ProductEvaluators.h",0xa1,
                      "static void Eigen::internal::Assignment<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, Eigen::Product<Eigen::Matrix<double, -1, -1, 1>, Eigen::Transpose<Eigen::Matrix<double, -1, -1, 1>>>, Eigen::internal::add_assign_op<double, double>>::run(DstXprType &, const SrcXprType &, const internal::add_assign_op<Scalar, Scalar> &) [DstXprType = Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, SrcXprType = Eigen::Product<Eigen::Matrix<double, -1, -1, 1>, Eigen::Transpose<Eigen::Matrix<double, -1, -1, 1>>>, Functor = Eigen::internal::add_assign_op<double, double>, Kind = Eigen::internal::Dense2Dense, EnableIf = void]"
                     );
      }
      Eigen::internal::
      generic_product_impl<Eigen::Matrix<double,-1,-1,1,-1,-1>,Eigen::Transpose<Eigen::Matrix<double,-1,-1,1,-1,-1>>,Eigen::DenseShape,Eigen::DenseShape,8>
      ::addTo<Eigen::Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::OuterStride<_1>>>
                (dst,(Matrix<double,__1,__1,_1,__1,__1> *)&local_4a70,&TStack_2d78);
      dVar158 = local_4920;
      dVar196 = local_4a00;
      auVar184._8_8_ = local_4640._1000_8_;
      auVar184._0_8_ = local_4640._992_8_;
      auVar177._8_8_ = local_4640._440_8_;
      auVar177._0_8_ = local_4640._432_8_;
      auVar176._8_8_ = local_4640._56_8_;
      auVar176._0_8_ = local_4640._48_8_;
      auVar174._8_8_ = local_4640._40_8_;
      auVar174._0_8_ = local_4640._32_8_;
      TStack_2d78.m_matrix = (non_const_type)local_49e0;
      auVar171 = vmulpd_avx512vl(auVar184,local_3d50);
      auVar172 = vmulpd_avx512vl(auVar177,auVar177);
      auVar173 = vmulpd_avx512vl(auVar176,auVar176);
      auVar174 = vmulpd_avx512vl(auVar174,auVar174);
      local_49e0._0_8_ =
           (double)local_4640._0_8_ * (double)local_4640._1296_8_ +
           (double)local_4640._432_8_ * local_3f80 + (double)local_4640._864_8_ * local_3dd0;
      local_49e0._8_8_ =
           (double)local_4640._8_8_ * (double)local_4640._1304_8_ +
           (double)local_4640._440_8_ * dStack_3f78 + (double)local_4640._872_8_ * dStack_3dc8;
      local_4980 = (double)local_4640._96_8_ * (double)local_4640._1392_8_ +
                   (double)local_4640._528_8_ * local_3f20 +
                   (double)local_4640._960_8_ * local_3dc0[10];
      dStack_4978 = (double)local_4640._104_8_ * (double)local_4640._1400_8_ +
                    (double)local_4640._536_8_ * dStack_3f18 +
                    (double)local_4640._968_8_ * local_3dc0[0xb];
      local_49d0 = (DenseStorage<double,__1,__1,__1,_1> *)
                   ((double)local_4640._16_8_ * (double)local_4640._1312_8_ +
                    (double)local_4640._448_8_ * local_3f70[0] +
                   (double)local_4640._880_8_ * local_3dc0[0]);
      avStack_49c8[0].m_value =
           (long)((double)local_4640._24_8_ * (double)local_4640._1320_8_ +
                  (double)local_4640._456_8_ * local_3f70[1] +
                 (double)local_4640._888_8_ * local_3dc0[1]);
      auVar185._0_8_ = (double)local_4640._480_8_ * (double)local_4640._480_8_;
      auVar185._8_8_ = (double)local_4640._488_8_ * (double)local_4640._488_8_;
      auVar173 = vaddpd_avx512vl(auVar173,auVar185);
      avStack_49c8[1].m_value =
           (long)((double)local_4640._32_8_ * (double)local_4640._1328_8_ +
                  (double)local_4640._464_8_ * local_3f70[2] +
                 (double)local_4640._896_8_ * local_3dc0[2]);
      dStack_49b8 = (double)local_4640._40_8_ * (double)local_4640._1336_8_ +
                    (double)local_4640._472_8_ * local_3f70[3] +
                    (double)local_4640._904_8_ * local_3dc0[3];
      local_49b0 = (double)local_4640._48_8_ * (double)local_4640._1344_8_ +
                   (double)local_4640._480_8_ * local_3f50 +
                   (double)local_4640._912_8_ * local_3dc0[4];
      dStack_49a8 = (double)local_4640._56_8_ * (double)local_4640._1352_8_ +
                    (double)local_4640._488_8_ * dStack_3f48 +
                    (double)local_4640._920_8_ * local_3dc0[5];
      local_49a0 = (double)local_4640._64_8_ * (double)local_4640._1360_8_ +
                   (double)local_4640._496_8_ * local_3f40 +
                   (double)local_4640._928_8_ * local_3dc0[6];
      dStack_4998 = (double)local_4640._72_8_ * (double)local_4640._1368_8_ +
                    (double)local_4640._504_8_ * dStack_3f38 +
                    (double)local_4640._936_8_ * local_3dc0[7];
      auVar178._8_8_ = dStack_4668;
      auVar178._0_8_ = local_4670;
      local_4990 = (double)local_4640._80_8_ * (double)local_4640._1376_8_ +
                   (double)local_4640._512_8_ * local_3f30 +
                   (double)local_4640._944_8_ * local_3dc0[8];
      dStack_4988 = (double)local_4640._88_8_ * (double)local_4640._1384_8_ +
                    (double)local_4640._520_8_ * dStack_3f28 +
                    (double)local_4640._952_8_ * local_3dc0[9];
      auVar186._0_8_ =
           (double)local_4640._112_8_ * (double)local_4640._1408_8_ +
           (double)local_4640._544_8_ * local_3f10;
      auVar186._8_8_ =
           (double)local_4640._120_8_ * (double)local_4640._1416_8_ +
           (double)local_4640._552_8_ * dStack_3f08;
      auVar183._8_8_ = local_4640._984_8_;
      auVar183._0_8_ = local_4640._976_8_;
      auVar175 = vmulpd_avx512vl(auVar183,local_3d60);
      local_4970 = vaddpd_avx512vl(auVar186,auVar175);
      auVar180._8_8_ = local_4640._568_8_;
      auVar180._0_8_ = local_4640._560_8_;
      auVar175 = vmulpd_avx512vl(auVar180,local_3f00);
      auVar192._0_8_ = (double)local_4640._128_8_ * (double)local_4640._1424_8_;
      auVar192._8_8_ = (double)local_4640._136_8_ * (double)local_4640._1432_8_;
      auVar176 = vmulpd_avx512vl(auVar180,auVar180);
      auVar177 = vmulpd_avx512vl(auVar184,auVar184);
      auVar175 = vaddpd_avx512vl(auVar192,auVar175);
      local_4960._0_16_ = vaddpd_avx512vl(auVar175,auVar171);
      auVar175._8_8_ = local_4640._24_8_;
      auVar175._0_8_ = local_4640._16_8_;
      auVar171 = vmulpd_avx512vl(auVar175,auVar175);
      auVar224._0_8_ = (double)local_4640._0_8_ * (double)local_4640._0_8_;
      auVar224._8_8_ = (double)local_4640._8_8_ * (double)local_4640._8_8_;
      auVar172 = vaddpd_avx512vl(auVar224,auVar172);
      auVar6._8_8_ = local_4640._872_8_;
      auVar6._0_8_ = local_4640._864_8_;
      auVar175 = vmulpd_avx512vl(auVar6,auVar6);
      auVar172 = vaddpd_avx512vl(auVar172,auVar175);
      auVar179._8_8_ = local_4640._456_8_;
      auVar179._0_8_ = local_4640._448_8_;
      auVar175 = vmulpd_avx512vl(auVar179,auVar179);
      auVar171 = vaddpd_avx512vl(auVar171,auVar175);
      auVar181._8_8_ = local_4640._888_8_;
      auVar181._0_8_ = local_4640._880_8_;
      auVar175 = vmulpd_avx512vl(auVar181,auVar181);
      auVar171 = vaddpd_avx512vl(auVar171,auVar175);
      auVar5._8_8_ = local_4640._472_8_;
      auVar5._0_8_ = local_4640._464_8_;
      auVar171 = vaddpd_avx512vl(auVar171,auVar178);
      auVar175 = vmulpd_avx512vl(auVar5,auVar5);
      auVar175 = vaddpd_avx512vl(auVar174,auVar175);
      auVar182._8_8_ = local_4640._904_8_;
      auVar182._0_8_ = local_4640._896_8_;
      auVar174 = vmulpd_avx512vl(auVar182,auVar182);
      auVar175 = vaddpd_avx512vl(auVar175,auVar174);
      auVar178 = vaddpd_avx512vl(auVar175,auVar178);
      local_2d80 = (undefined1  [8])pCVar162->m_Alpha;
      local_48f0.m_dst =
           (DstEvaluatorType *)
           (local_4680 * (auVar172._0_8_ + local_4670) +
           (double)local_2d80 * (double)local_49e0._0_8_);
      local_48f0.m_src =
           (SrcEvaluatorType *)
           (dStack_4678 * (auVar172._8_8_ + dStack_4668) +
           (double)local_2d80 * (double)local_49e0._8_8_);
      local_48f0.m_functor =
           (assign_op<double,_double> *)
           (local_4680 * auVar171._0_8_ + (double)local_2d80 * (double)local_49d0);
      local_48f0.m_dstExpr =
           (DstXprType *)
           (dStack_4678 * auVar171._8_8_ + (double)local_2d80 * (double)avStack_49c8[0].m_value);
      local_48d0 = auVar178._0_8_ * local_4680 +
                   (double)local_2d80 * (double)avStack_49c8[1].m_value;
      dStack_48c8 = auVar178._8_8_ * dStack_4678 + (double)local_2d80 * dStack_49b8;
      local_48c0 = local_4680 *
                   (local_4670 +
                   auVar173._0_8_ + (double)local_4640._912_8_ * (double)local_4640._912_8_) +
                   (double)local_2d80 * local_49b0;
      dStack_48b8 = dStack_4678 *
                    (dStack_4668 +
                    auVar173._8_8_ + (double)local_4640._920_8_ * (double)local_4640._920_8_) +
                    (double)local_2d80 * dStack_49a8;
      local_48b0 = local_4680 *
                   (local_4670 +
                   (double)local_4640._64_8_ * (double)local_4640._64_8_ +
                   (double)local_4640._496_8_ * (double)local_4640._496_8_ +
                   (double)local_4640._928_8_ * (double)local_4640._928_8_) +
                   (double)local_2d80 * local_49a0;
      dStack_48a8 = dStack_4678 *
                    (dStack_4668 +
                    (double)local_4640._72_8_ * (double)local_4640._72_8_ +
                    (double)local_4640._504_8_ * (double)local_4640._504_8_ +
                    (double)local_4640._936_8_ * (double)local_4640._936_8_) +
                    (double)local_2d80 * dStack_4998;
      local_48a0 = local_4680 *
                   (local_4670 +
                   (double)local_4640._80_8_ * (double)local_4640._80_8_ +
                   (double)local_4640._512_8_ * (double)local_4640._512_8_ +
                   (double)local_4640._944_8_ * (double)local_4640._944_8_) +
                   (double)local_2d80 * local_4990;
      dStack_4898 = dStack_4678 *
                    (dStack_4668 +
                    (double)local_4640._88_8_ * (double)local_4640._88_8_ +
                    (double)local_4640._520_8_ * (double)local_4640._520_8_ +
                    (double)local_4640._952_8_ * (double)local_4640._952_8_) +
                    (double)local_2d80 * dStack_4988;
      local_4890 = local_4680 *
                   (local_4670 +
                   (double)local_4640._96_8_ * (double)local_4640._96_8_ +
                   (double)local_4640._528_8_ * (double)local_4640._528_8_ +
                   (double)local_4640._960_8_ * (double)local_4640._960_8_) +
                   (double)local_2d80 * local_4980;
      dStack_4888 = dStack_4678 *
                    (dStack_4668 +
                    (double)local_4640._104_8_ * (double)local_4640._104_8_ +
                    (double)local_4640._536_8_ * (double)local_4640._536_8_ +
                    (double)local_4640._968_8_ * (double)local_4640._968_8_) +
                    (double)local_2d80 * dStack_4978;
      local_4880 = local_4680 *
                   (local_4670 +
                   (double)local_4640._112_8_ * (double)local_4640._112_8_ +
                   (double)local_4640._544_8_ * (double)local_4640._544_8_ +
                   (double)local_4640._976_8_ * (double)local_4640._976_8_) +
                   (double)local_2d80 * (double)local_4970._0_8_;
      dStack_4878 = dStack_4678 *
                    (dStack_4668 +
                    (double)local_4640._120_8_ * (double)local_4640._120_8_ +
                    (double)local_4640._552_8_ * (double)local_4640._552_8_ +
                    (double)local_4640._984_8_ * (double)local_4640._984_8_) +
                    (double)local_2d80 * (double)local_4970._8_8_;
      local_4870 = local_4680 *
                   (local_4670 +
                   (double)local_4640._128_8_ * (double)local_4640._128_8_ + auVar176._0_8_ +
                   auVar177._0_8_) + (double)local_2d80 * (double)local_4960._0_8_;
      dStack_4868 = dStack_4678 *
                    (dStack_4668 +
                    (double)local_4640._136_8_ * (double)local_4640._136_8_ + auVar176._8_8_ +
                    auVar177._8_8_) + (double)local_2d80 * (double)local_4960._8_8_;
      if (((pCVar162->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_rows < (long)local_4920) ||
         ((pCVar162->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
          m_storage.m_cols < 1)) {
LAB_00751acd:
        __function = 
        "Eigen::Block<Eigen::Matrix<double, -1, -1>, 18, 1>::Block(XprType &, Index, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = 18, BlockCols = 1, InnerPanel = false]"
        ;
        goto LAB_00751aac;
      }
      pdVar164 = (pCVar162->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data;
      auVar73._8_8_ = local_4640._1144_8_;
      auVar73._0_8_ = local_4640._1136_8_;
      auVar188._8_8_ = local_4640._584_8_;
      auVar188._0_8_ = local_4640._576_8_;
      auVar50._8_8_ = local_4640._200_8_;
      auVar50._0_8_ = local_4640._192_8_;
      auVar49._8_8_ = local_4640._184_8_;
      auVar49._0_8_ = local_4640._176_8_;
      auVar171 = vmulpd_avx512vl(auVar73,local_3cc0);
      auVar172 = vmulpd_avx512vl(auVar188,auVar188);
      auVar173 = vmulpd_avx512vl(auVar50,auVar50);
      auVar178 = vmulpd_avx512vl(auVar49,auVar49);
      local_48f0.m_dst = (DstEvaluatorType *)((double)local_48f0.m_dst * pdVar164[lVar10 * 0x12]);
      local_48f0.m_src =
           (SrcEvaluatorType *)((double)local_48f0.m_src * (pdVar164 + lVar10 * 0x12)[1]);
      local_48f0.m_functor =
           (assign_op<double,_double> *)((double)local_48f0.m_functor * pdVar164[lVar10 * 0x12 + 2])
      ;
      local_48f0.m_dstExpr =
           (DstXprType *)((double)local_48f0.m_dstExpr * (pdVar164 + lVar10 * 0x12 + 2)[1]);
      local_48d0 = local_48d0 * pdVar164[lVar10 * 0x12 + 4];
      dStack_48c8 = dStack_48c8 * (pdVar164 + lVar10 * 0x12 + 4)[1];
      local_48c0 = local_48c0 * pdVar164[lVar10 * 0x12 + 6];
      dStack_48b8 = dStack_48b8 * (pdVar164 + lVar10 * 0x12 + 6)[1];
      local_48b0 = local_48b0 * pdVar164[lVar10 * 0x12 + 8];
      dStack_48a8 = dStack_48a8 * (pdVar164 + lVar10 * 0x12 + 8)[1];
      local_48a0 = local_48a0 * pdVar164[lVar10 * 0x12 + 10];
      dStack_4898 = dStack_4898 * (pdVar164 + lVar10 * 0x12 + 10)[1];
      local_4890 = local_4890 * pdVar164[lVar10 * 0x12 + 0xc];
      dStack_4888 = dStack_4888 * (pdVar164 + lVar10 * 0x12 + 0xc)[1];
      local_4880 = local_4880 * pdVar164[lVar10 * 0x12 + 0xe];
      dStack_4878 = dStack_4878 * (pdVar164 + lVar10 * 0x12 + 0xe)[1];
      TStack_2d78.m_matrix = (non_const_type)local_49e0;
      local_4870 = local_4870 * pdVar164[lVar10 * 0x12 + 0x10];
      dStack_4868 = dStack_4868 * (pdVar164 + lVar10 * 0x12 + 0x10)[1];
      local_49e0._0_8_ =
           (double)local_4640._144_8_ * (double)local_4640._1440_8_ +
           (double)local_4640._576_8_ * local_3ef0 + (double)local_4640._1008_8_ * local_3d40[0];
      local_49e0._8_8_ =
           (double)local_4640._152_8_ * (double)local_4640._1448_8_ +
           (double)local_4640._584_8_ * dStack_3ee8 + (double)local_4640._1016_8_ * local_3d40[1];
      local_49d0 = (DenseStorage<double,__1,__1,__1,_1> *)
                   ((double)local_4640._160_8_ * (double)local_4640._1456_8_ +
                    (double)local_4640._592_8_ * local_3ee0[0] +
                   (double)local_4640._1024_8_ * local_3d40[2]);
      avStack_49c8[0].m_value =
           (long)((double)local_4640._168_8_ * (double)local_4640._1464_8_ +
                  (double)local_4640._600_8_ * local_3ee0[1] +
                 (double)local_4640._1032_8_ * local_3d40[3]);
      avStack_49c8[1].m_value =
           (long)((double)local_4640._176_8_ * (double)local_4640._1472_8_ +
                  (double)local_4640._608_8_ * local_3ee0[2] +
                 (double)local_4640._1040_8_ * local_3d40[4]);
      dStack_49b8 = (double)local_4640._184_8_ * (double)local_4640._1480_8_ +
                    (double)local_4640._616_8_ * local_3ee0[3] +
                    (double)local_4640._1048_8_ * local_3d40[5];
      auVar193._0_8_ = (double)local_4640._624_8_ * (double)local_4640._624_8_;
      auVar193._8_8_ = (double)local_4640._632_8_ * (double)local_4640._632_8_;
      auVar173 = vaddpd_avx512vl(auVar173,auVar193);
      local_49b0 = (double)local_4640._192_8_ * (double)local_4640._1488_8_ +
                   (double)local_4640._624_8_ * local_3ec0 +
                   (double)local_4640._1056_8_ * local_3d40[6];
      dStack_49a8 = (double)local_4640._200_8_ * (double)local_4640._1496_8_ +
                    (double)local_4640._632_8_ * dStack_3eb8 +
                    (double)local_4640._1064_8_ * local_3d40[7];
      local_49a0 = (double)local_4640._208_8_ * (double)local_4640._1504_8_ +
                   (double)local_4640._640_8_ * local_3eb0 +
                   (double)local_4640._1072_8_ * local_3d40[8];
      dStack_4998 = (double)local_4640._216_8_ * (double)local_4640._1512_8_ +
                    (double)local_4640._648_8_ * dStack_3ea8 +
                    (double)local_4640._1080_8_ * local_3d40[9];
      local_4990 = (double)local_4640._656_8_ * local_3ea0 +
                   (double)local_4640._224_8_ * (double)local_4640._1520_8_ +
                   (double)local_4640._1088_8_ * local_3d40[10];
      dStack_4988 = (double)local_4640._664_8_ * dStack_3e98 +
                    (double)local_4640._232_8_ * (double)local_4640._1528_8_ +
                    (double)local_4640._1096_8_ * local_3d40[0xb];
      auVar45._8_8_ = dStack_4668;
      auVar45._0_8_ = local_4670;
      local_4980 = (double)local_4640._240_8_ * (double)local_4640._1536_8_ +
                   (double)local_4640._672_8_ * local_3e90 +
                   (double)local_4640._1104_8_ * local_3d40[0xc];
      dStack_4978 = (double)local_4640._248_8_ * (double)local_4640._1544_8_ +
                    (double)local_4640._680_8_ * dStack_3e88 +
                    (double)local_4640._1112_8_ * local_3d40[0xd];
      local_4970._0_8_ =
           (double)local_4640._256_8_ * (double)local_4640._1552_8_ +
           (double)local_4640._688_8_ * local_3e80 + (double)local_4640._1120_8_ * local_3d40[0xe];
      local_4970._8_8_ =
           (double)local_4640._264_8_ * (double)local_4640._1560_8_ +
           (double)local_4640._696_8_ * dStack_3e78 + (double)local_4640._1128_8_ * local_3d40[0xf];
      auVar189._8_8_ = local_4640._712_8_;
      auVar189._0_8_ = local_4640._704_8_;
      auVar175 = vmulpd_avx512vl(auVar189,local_3e70);
      auVar187._8_8_ = local_4640._280_8_;
      auVar187._0_8_ = local_4640._272_8_;
      auVar174 = vmulpd_avx512vl(auVar187,local_4640._1568_16_);
      auVar175 = vaddpd_avx512vl(auVar174,auVar175);
      auVar174 = vmulpd_avx512vl(auVar73,auVar73);
      local_4960._0_16_ = vaddpd_avx512vl(auVar175,auVar171);
      auVar191._8_8_ = local_4640._168_8_;
      auVar191._0_8_ = local_4640._160_8_;
      auVar48._8_8_ = local_4640._152_8_;
      auVar48._0_8_ = local_4640._144_8_;
      auVar171 = vmulpd_avx512vl(auVar191,auVar191);
      auVar175 = vmulpd_avx512vl(auVar48,auVar48);
      auVar172 = vaddpd_avx512vl(auVar175,auVar172);
      auVar190._8_8_ = local_4640._1016_8_;
      auVar190._0_8_ = local_4640._1008_8_;
      auVar175 = vmulpd_avx512vl(auVar190,auVar190);
      auVar172 = vaddpd_avx512vl(auVar172,auVar175);
      auVar59._8_8_ = local_4640._600_8_;
      auVar59._0_8_ = local_4640._592_8_;
      auVar172 = vaddpd_avx512vl(auVar172,auVar45);
      auVar175 = vmulpd_avx512vl(auVar59,auVar59);
      auVar171 = vaddpd_avx512vl(auVar171,auVar175);
      auVar69._8_8_ = local_4640._1032_8_;
      auVar69._0_8_ = local_4640._1024_8_;
      auVar175 = vmulpd_avx512vl(auVar69,auVar69);
      auVar171 = vaddpd_avx512vl(auVar171,auVar175);
      auVar60._8_8_ = local_4640._616_8_;
      auVar60._0_8_ = local_4640._608_8_;
      auVar171 = vaddpd_avx512vl(auVar171,auVar45);
      auVar175 = vmulpd_avx512vl(auVar60,auVar60);
      auVar178 = vaddpd_avx512vl(auVar178,auVar175);
      auVar70._8_8_ = local_4640._1048_8_;
      auVar70._0_8_ = local_4640._1040_8_;
      auVar175 = vmulpd_avx512vl(auVar70,auVar70);
      auVar178 = vaddpd_avx512vl(auVar178,auVar175);
      auVar178 = vaddpd_avx512vl(auVar178,auVar45);
      local_2d80 = (undefined1  [8])pCVar162->m_Alpha;
      local_4840._0_8_ = local_4680 * auVar172._0_8_ + (double)local_2d80 * (double)local_49e0._0_8_
      ;
      local_4840._8_8_ =
           dStack_4678 * auVar172._8_8_ + (double)local_2d80 * (double)local_49e0._8_8_;
      local_4840._16_8_ = local_4680 * auVar171._0_8_ + (double)local_2d80 * (double)local_49d0;
      adStack_4828[0] =
           dStack_4678 * auVar171._8_8_ + (double)local_2d80 * (double)avStack_49c8[0].m_value;
      adStack_4828[1] =
           auVar178._0_8_ * local_4680 + (double)local_2d80 * (double)avStack_49c8[1].m_value;
      adStack_4828[2] = auVar178._8_8_ * dStack_4678 + (double)local_2d80 * dStack_49b8;
      adStack_4828[3] =
           local_4680 *
           (local_4670 + auVar173._0_8_ + (double)local_4640._1056_8_ * (double)local_4640._1056_8_)
           + (double)local_2d80 * local_49b0;
      dStack_4808 = dStack_4678 *
                    (dStack_4668 +
                    auVar173._8_8_ + (double)local_4640._1064_8_ * (double)local_4640._1064_8_) +
                    (double)local_2d80 * dStack_49a8;
      local_4800 = local_4680 *
                   (local_4670 +
                   (double)local_4640._208_8_ * (double)local_4640._208_8_ +
                   (double)local_4640._640_8_ * (double)local_4640._640_8_ +
                   (double)local_4640._1072_8_ * (double)local_4640._1072_8_) +
                   (double)local_2d80 * local_49a0;
      dStack_47f8 = dStack_4678 *
                    (dStack_4668 +
                    (double)local_4640._216_8_ * (double)local_4640._216_8_ +
                    (double)local_4640._648_8_ * (double)local_4640._648_8_ +
                    (double)local_4640._1080_8_ * (double)local_4640._1080_8_) +
                    (double)local_2d80 * dStack_4998;
      local_47f0 = local_4680 *
                   (local_4670 +
                   (double)local_4640._224_8_ * (double)local_4640._224_8_ +
                   (double)local_4640._656_8_ * (double)local_4640._656_8_ +
                   (double)local_4640._1088_8_ * (double)local_4640._1088_8_) +
                   (double)local_2d80 * local_4990;
      dStack_47e8 = dStack_4678 *
                    (dStack_4668 +
                    (double)local_4640._232_8_ * (double)local_4640._232_8_ +
                    (double)local_4640._664_8_ * (double)local_4640._664_8_ +
                    (double)local_4640._1096_8_ * (double)local_4640._1096_8_) +
                    (double)local_2d80 * dStack_4988;
      local_47e0 = local_4680 *
                   (local_4670 +
                   (double)local_4640._240_8_ * (double)local_4640._240_8_ +
                   (double)local_4640._672_8_ * (double)local_4640._672_8_ +
                   (double)local_4640._1104_8_ * (double)local_4640._1104_8_) +
                   (double)local_2d80 * local_4980;
      dStack_47d8 = dStack_4678 *
                    (dStack_4668 +
                    (double)local_4640._248_8_ * (double)local_4640._248_8_ +
                    (double)local_4640._680_8_ * (double)local_4640._680_8_ +
                    (double)local_4640._1112_8_ * (double)local_4640._1112_8_) +
                    (double)local_2d80 * dStack_4978;
      local_47d0 = local_4680 *
                   (local_4670 +
                   (double)local_4640._256_8_ * (double)local_4640._256_8_ +
                   (double)local_4640._688_8_ * (double)local_4640._688_8_ +
                   (double)local_4640._1120_8_ * (double)local_4640._1120_8_) +
                   (double)local_2d80 * (double)local_4970._0_8_;
      dStack_47c8 = dStack_4678 *
                    (dStack_4668 +
                    (double)local_4640._264_8_ * (double)local_4640._264_8_ +
                    (double)local_4640._696_8_ * (double)local_4640._696_8_ +
                    (double)local_4640._1128_8_ * (double)local_4640._1128_8_) +
                    (double)local_2d80 * (double)local_4970._8_8_;
      local_47c0 = local_4680 *
                   (local_4670 +
                   (double)local_4640._272_8_ * (double)local_4640._272_8_ +
                   (double)local_4640._704_8_ * (double)local_4640._704_8_ + auVar174._0_8_) +
                   (double)local_2d80 * (double)local_4960._0_8_;
      dStack_47b8 = dStack_4678 *
                    (dStack_4668 +
                    (double)local_4640._280_8_ * (double)local_4640._280_8_ +
                    (double)local_4640._712_8_ * (double)local_4640._712_8_ + auVar174._8_8_) +
                    (double)local_2d80 * (double)local_4960._8_8_;
      if (((pCVar162->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_rows < (long)local_4920) ||
         ((pCVar162->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
          m_storage.m_cols < 1)) goto LAB_00751acd;
      pdVar164 = (pCVar162->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data;
      auVar77._8_8_ = local_4640._1288_8_;
      auVar77._0_8_ = local_4640._1280_8_;
      auVar63._8_8_ = local_4640._728_8_;
      auVar63._0_8_ = local_4640._720_8_;
      auVar55._8_8_ = local_4640._344_8_;
      auVar55._0_8_ = local_4640._336_8_;
      auVar54._8_8_ = local_4640._328_8_;
      auVar54._0_8_ = local_4640._320_8_;
      auVar171 = vmulpd_avx512vl(auVar77,local_3c30);
      auVar172 = vmulpd_avx512vl(auVar63,auVar63);
      auVar173 = vmulpd_avx512vl(auVar55,auVar55);
      auVar178 = vmulpd_avx512vl(auVar54,auVar54);
      local_4840._0_8_ =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           ((double)local_4840._0_8_ * pdVar164[lVar10 * 0x12]);
      local_4840._8_8_ = (double)local_4840._8_8_ * (pdVar164 + lVar10 * 0x12)[1];
      local_4840._16_8_ = (double)local_4840._16_8_ * pdVar164[lVar10 * 0x12 + 2];
      adStack_4828[0] = adStack_4828[0] * (pdVar164 + lVar10 * 0x12 + 2)[1];
      adStack_4828[1] = adStack_4828[1] * pdVar164[lVar10 * 0x12 + 4];
      adStack_4828[2] = adStack_4828[2] * (pdVar164 + lVar10 * 0x12 + 4)[1];
      adStack_4828[3] = adStack_4828[3] * pdVar164[lVar10 * 0x12 + 6];
      dStack_4808 = dStack_4808 * (pdVar164 + lVar10 * 0x12 + 6)[1];
      local_4800 = local_4800 * pdVar164[lVar10 * 0x12 + 8];
      dStack_47f8 = dStack_47f8 * (pdVar164 + lVar10 * 0x12 + 8)[1];
      local_47f0 = local_47f0 * pdVar164[lVar10 * 0x12 + 10];
      dStack_47e8 = dStack_47e8 * (pdVar164 + lVar10 * 0x12 + 10)[1];
      local_47e0 = local_47e0 * pdVar164[lVar10 * 0x12 + 0xc];
      dStack_47d8 = dStack_47d8 * (pdVar164 + lVar10 * 0x12 + 0xc)[1];
      local_47d0 = local_47d0 * pdVar164[lVar10 * 0x12 + 0xe];
      dStack_47c8 = dStack_47c8 * (pdVar164 + lVar10 * 0x12 + 0xe)[1];
      local_47c0 = local_47c0 * pdVar164[lVar10 * 0x12 + 0x10];
      dStack_47b8 = dStack_47b8 * (pdVar164 + lVar10 * 0x12 + 0x10)[1];
      local_49e0._0_8_ =
           (double)local_4640._288_8_ * local_4010 + (double)local_4640._720_8_ * local_3e60 +
           (double)local_4640._1152_8_ * local_3cb0[0];
      local_49e0._8_8_ =
           (double)local_4640._296_8_ * dStack_4008 + (double)local_4640._728_8_ * dStack_3e58 +
           (double)local_4640._1160_8_ * local_3cb0[1];
      local_49d0 = (DenseStorage<double,__1,__1,__1,_1> *)
                   ((double)local_4640._304_8_ * local_4000[0] +
                    (double)local_4640._736_8_ * local_3e50[0] +
                   (double)local_4640._1168_8_ * local_3cb0[2]);
      avStack_49c8[0].m_value =
           (long)((double)local_4640._312_8_ * local_4000[1] +
                  (double)local_4640._744_8_ * local_3e50[1] +
                 (double)local_4640._1176_8_ * local_3cb0[3]);
      avStack_49c8[1].m_value =
           (long)((double)local_4640._320_8_ * local_4000[2] +
                  (double)local_4640._752_8_ * local_3e50[2] +
                 (double)local_4640._1184_8_ * local_3cb0[4]);
      dStack_49b8 = (double)local_4640._328_8_ * local_4000[3] +
                    (double)local_4640._760_8_ * local_3e50[3] +
                    (double)local_4640._1192_8_ * local_3cb0[5];
      auVar194._0_8_ = (double)local_4640._768_8_ * (double)local_4640._768_8_;
      auVar194._8_8_ = (double)local_4640._776_8_ * (double)local_4640._776_8_;
      auVar173 = vaddpd_avx512vl(auVar173,auVar194);
      local_49b0 = (double)local_4640._336_8_ * local_3fe0 + (double)local_4640._768_8_ * local_3e30
                   + (double)local_4640._1200_8_ * local_3cb0[6];
      dStack_49a8 = (double)local_4640._344_8_ * dStack_3fd8 +
                    (double)local_4640._776_8_ * dStack_3e28 +
                    (double)local_4640._1208_8_ * local_3cb0[7];
      local_49a0 = (double)local_4640._352_8_ * local_3fd0 + (double)local_4640._784_8_ * local_3e20
                   + (double)local_4640._1216_8_ * local_3cb0[8];
      dStack_4998 = (double)local_4640._360_8_ * dStack_3fc8 +
                    (double)local_4640._792_8_ * dStack_3e18 +
                    (double)local_4640._1224_8_ * local_3cb0[9];
      local_4990 = (double)local_4640._800_8_ * local_3e10 + (double)local_4640._368_8_ * local_3fc0
                   + (double)local_4640._1232_8_ * local_3cb0[10];
      dStack_4988 = (double)local_4640._808_8_ * dStack_3e08 +
                    (double)local_4640._376_8_ * dStack_3fb8 +
                    (double)local_4640._1240_8_ * local_3cb0[0xb];
      auVar46._8_8_ = dStack_4668;
      auVar46._0_8_ = local_4670;
      local_4980 = (double)local_4640._384_8_ * local_3fb0 + (double)local_4640._816_8_ * local_3e00
                   + (double)local_4640._1248_8_ * local_3cb0[0xc];
      dStack_4978 = (double)local_4640._392_8_ * dStack_3fa8 +
                    (double)local_4640._824_8_ * dStack_3df8 +
                    (double)local_4640._1256_8_ * local_3cb0[0xd];
      local_4970._0_8_ =
           (double)local_4640._400_8_ * local_3fa0 + (double)local_4640._832_8_ * local_3df0 +
           (double)local_4640._1264_8_ * local_3cb0[0xe];
      local_4970._8_8_ =
           (double)local_4640._408_8_ * dStack_3f98 + (double)local_4640._840_8_ * dStack_3de8 +
           (double)local_4640._1272_8_ * local_3cb0[0xf];
      auVar66._8_8_ = local_4640._856_8_;
      auVar66._0_8_ = local_4640._848_8_;
      auVar175 = vmulpd_avx512vl(auVar66,local_3de0);
      auVar56._8_8_ = local_4640._424_8_;
      auVar56._0_8_ = local_4640._416_8_;
      auVar174 = vmulpd_avx512vl(auVar56,local_3f90);
      auVar175 = vaddpd_avx512vl(auVar174,auVar175);
      auVar174 = vmulpd_avx512vl(auVar77,auVar77);
      local_4960._0_16_ = vaddpd_avx512vl(auVar175,auVar171);
      auVar53._8_8_ = local_4640._312_8_;
      auVar53._0_8_ = local_4640._304_8_;
      auVar52._8_8_ = local_4640._296_8_;
      auVar52._0_8_ = local_4640._288_8_;
      auVar171 = vmulpd_avx512vl(auVar53,auVar53);
      auVar175 = vmulpd_avx512vl(auVar52,auVar52);
      auVar172 = vaddpd_avx512vl(auVar175,auVar172);
      auVar74._8_8_ = local_4640._1160_8_;
      auVar74._0_8_ = local_4640._1152_8_;
      auVar175 = vmulpd_avx512vl(auVar74,auVar74);
      auVar172 = vaddpd_avx512vl(auVar172,auVar175);
      auVar64._8_8_ = local_4640._744_8_;
      auVar64._0_8_ = local_4640._736_8_;
      auVar172 = vaddpd_avx512vl(auVar172,auVar46);
      auVar175 = vmulpd_avx512vl(auVar64,auVar64);
      auVar171 = vaddpd_avx512vl(auVar171,auVar175);
      auVar75._8_8_ = local_4640._1176_8_;
      auVar75._0_8_ = local_4640._1168_8_;
      auVar175 = vmulpd_avx512vl(auVar75,auVar75);
      auVar171 = vaddpd_avx512vl(auVar171,auVar175);
      auVar65._8_8_ = local_4640._760_8_;
      auVar65._0_8_ = local_4640._752_8_;
      auVar171 = vaddpd_avx512vl(auVar171,auVar46);
      auVar175 = vmulpd_avx512vl(auVar65,auVar65);
      auVar178 = vaddpd_avx512vl(auVar178,auVar175);
      auVar76._8_8_ = local_4640._1192_8_;
      auVar76._0_8_ = local_4640._1184_8_;
      auVar175 = vmulpd_avx512vl(auVar76,auVar76);
      auVar178 = vaddpd_avx512vl(auVar178,auVar175);
      auVar178 = vaddpd_avx512vl(auVar178,auVar46);
      local_2d80 = (undefined1  [8])pCVar162->m_Alpha;
      TStack_2d78.m_matrix = (non_const_type)local_49e0;
      local_3710 = local_4680 * auVar172._0_8_ + (double)local_2d80 * (double)local_49e0._0_8_;
      dStack_3708 = dStack_4678 * auVar172._8_8_ + (double)local_2d80 * (double)local_49e0._8_8_;
      local_3700[0] = local_4680 * auVar171._0_8_ + (double)local_2d80 * (double)local_49d0;
      local_3700[1] =
           dStack_4678 * auVar171._8_8_ + (double)local_2d80 * (double)avStack_49c8[0].m_value;
      local_3700[2] =
           auVar178._0_8_ * local_4680 + (double)local_2d80 * (double)avStack_49c8[1].m_value;
      local_3700[3] = auVar178._8_8_ * dStack_4678 + (double)local_2d80 * dStack_49b8;
      local_36e0 = local_4680 *
                   (local_4670 +
                   auVar173._0_8_ + (double)local_4640._1200_8_ * (double)local_4640._1200_8_) +
                   (double)local_2d80 * local_49b0;
      dStack_36d8 = dStack_4678 *
                    (dStack_4668 +
                    auVar173._8_8_ + (double)local_4640._1208_8_ * (double)local_4640._1208_8_) +
                    (double)local_2d80 * dStack_49a8;
      local_36d0 = local_4680 *
                   (local_4670 +
                   (double)local_4640._352_8_ * (double)local_4640._352_8_ +
                   (double)local_4640._784_8_ * (double)local_4640._784_8_ +
                   (double)local_4640._1216_8_ * (double)local_4640._1216_8_) +
                   (double)local_2d80 * local_49a0;
      dStack_36c8 = dStack_4678 *
                    (dStack_4668 +
                    (double)local_4640._360_8_ * (double)local_4640._360_8_ +
                    (double)local_4640._792_8_ * (double)local_4640._792_8_ +
                    (double)local_4640._1224_8_ * (double)local_4640._1224_8_) +
                    (double)local_2d80 * dStack_4998;
      local_36c0 = local_4680 *
                   (local_4670 +
                   (double)local_4640._368_8_ * (double)local_4640._368_8_ +
                   (double)local_4640._800_8_ * (double)local_4640._800_8_ +
                   (double)local_4640._1232_8_ * (double)local_4640._1232_8_) +
                   (double)local_2d80 * local_4990;
      dStack_36b8 = dStack_4678 *
                    (dStack_4668 +
                    (double)local_4640._376_8_ * (double)local_4640._376_8_ +
                    (double)local_4640._808_8_ * (double)local_4640._808_8_ +
                    (double)local_4640._1240_8_ * (double)local_4640._1240_8_) +
                    (double)local_2d80 * dStack_4988;
      local_36b0 = local_4680 *
                   (local_4670 +
                   (double)local_4640._384_8_ * (double)local_4640._384_8_ +
                   (double)local_4640._816_8_ * (double)local_4640._816_8_ +
                   (double)local_4640._1248_8_ * (double)local_4640._1248_8_) +
                   (double)local_2d80 * local_4980;
      dStack_36a8 = dStack_4678 *
                    (dStack_4668 +
                    (double)local_4640._392_8_ * (double)local_4640._392_8_ +
                    (double)local_4640._824_8_ * (double)local_4640._824_8_ +
                    (double)local_4640._1256_8_ * (double)local_4640._1256_8_) +
                    (double)local_2d80 * dStack_4978;
      local_36a0 = local_4680 *
                   (local_4670 +
                   (double)local_4640._400_8_ * (double)local_4640._400_8_ +
                   (double)local_4640._832_8_ * (double)local_4640._832_8_ +
                   (double)local_4640._1264_8_ * (double)local_4640._1264_8_) +
                   (double)local_2d80 * (double)local_4970._0_8_;
      dStack_3698 = dStack_4678 *
                    (dStack_4668 +
                    (double)local_4640._408_8_ * (double)local_4640._408_8_ +
                    (double)local_4640._840_8_ * (double)local_4640._840_8_ +
                    (double)local_4640._1272_8_ * (double)local_4640._1272_8_) +
                    (double)local_2d80 * (double)local_4970._8_8_;
      local_3690 = local_4680 *
                   (local_4670 +
                   (double)local_4640._416_8_ * (double)local_4640._416_8_ +
                   (double)local_4640._848_8_ * (double)local_4640._848_8_ + auVar174._0_8_) +
                   (double)local_2d80 * (double)local_4960._0_8_;
      dStack_3688 = dStack_4678 *
                    (dStack_4668 +
                    (double)local_4640._424_8_ * (double)local_4640._424_8_ +
                    (double)local_4640._856_8_ * (double)local_4640._856_8_ + auVar174._8_8_) +
                    (double)local_2d80 * (double)local_4960._8_8_;
      if (((pCVar162->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_rows < (long)local_4920) ||
         ((pCVar162->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
          m_storage.m_cols < 1)) goto LAB_00751acd;
      pdVar164 = (pCVar162->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data;
      local_3710 = local_3710 * pdVar164[lVar10 * 0x12];
      dStack_3708 = dStack_3708 * (pdVar164 + lVar10 * 0x12)[1];
      local_3700[0] = local_3700[0] * pdVar164[lVar10 * 0x12 + 2];
      local_3700[1] = local_3700[1] * (pdVar164 + lVar10 * 0x12 + 2)[1];
      local_3700[2] = local_3700[2] * pdVar164[lVar10 * 0x12 + 4];
      local_3700[3] = local_3700[3] * (pdVar164 + lVar10 * 0x12 + 4)[1];
      local_36e0 = local_36e0 * pdVar164[lVar10 * 0x12 + 6];
      dStack_36d8 = dStack_36d8 * (pdVar164 + lVar10 * 0x12 + 6)[1];
      local_36d0 = local_36d0 * pdVar164[lVar10 * 0x12 + 8];
      dStack_36c8 = dStack_36c8 * (pdVar164 + lVar10 * 0x12 + 8)[1];
      local_36c0 = local_36c0 * pdVar164[lVar10 * 0x12 + 10];
      dStack_36b8 = dStack_36b8 * (pdVar164 + lVar10 * 0x12 + 10)[1];
      local_36b0 = local_36b0 * pdVar164[lVar10 * 0x12 + 0xc];
      dStack_36a8 = dStack_36a8 * (pdVar164 + lVar10 * 0x12 + 0xc)[1];
      local_36a0 = local_36a0 * pdVar164[lVar10 * 0x12 + 0xe];
      dStack_3698 = dStack_3698 * (pdVar164 + lVar10 * 0x12 + 0xe)[1];
      uVar160 = 0xfffffffffffffffe;
      local_3690 = local_3690 * pdVar164[lVar10 * 0x12 + 0x10];
      dStack_3688 = dStack_3688 * (pdVar164 + lVar10 * 0x12 + 0x10)[1];
      do {
        dVar198 = *(double *)(local_4640 + uVar160 * 8 + 0x138);
        dVar199 = *(double *)(local_4640 + uVar160 * 8 + 0x2e8);
        dVar208 = *(double *)(local_4640 + uVar160 * 8 + 0xa8);
        dVar14 = *(double *)(local_4640 + uVar160 * 8 + 600);
        dVar15 = *(double *)(local_4640 + uVar160 * 8 + 0x5b8);
        dVar16 = local_3ee0[uVar160 + 1];
        dVar17 = local_4000[uVar160 + 1];
        dVar18 = *(double *)(local_4640 + uVar160 * 8 + 0x498);
        dVar19 = local_3d40[uVar160 + 3];
        dVar20 = local_3e50[uVar160 + 1];
        dVar21 = *(double *)(local_4640 + uVar160 * 8 + 0x408);
        dVar22 = local_3cb0[uVar160 + 3];
        (&local_49d0)[uVar160] =
             (DenseStorage<double,__1,__1,__1,_1> *)
             (*(double *)(local_4640 + uVar160 * 8 + 0x130) *
              *(double *)(local_4640 + uVar160 * 8 + 0x5b0) +
              *(double *)(local_4640 + uVar160 * 8 + 0x2e0) * local_3ee0[uVar160] +
              *(double *)(local_4640 + uVar160 * 8 + 0x490) * local_3d40[uVar160 + 2] +
              *(double *)(local_4640 + uVar160 * 8 + 0xa0) * local_4000[uVar160] +
              *(double *)(local_4640 + uVar160 * 8 + 0x250) * local_3e50[uVar160] +
             *(double *)(local_4640 + uVar160 * 8 + 0x400) * local_3cb0[uVar160 + 2]);
        avStack_49c8[uVar160].m_value =
             (long)(dVar198 * dVar15 + dVar199 * dVar16 + dVar18 * dVar19 + dVar208 * dVar17 +
                    dVar14 * dVar20 + dVar21 * dVar22);
        uVar148 = local_4640._1288_8_;
        uVar147 = local_4640._1280_8_;
        uVar146 = local_4640._1272_8_;
        uVar145 = local_4640._1264_8_;
        uVar144 = local_4640._1256_8_;
        uVar143 = local_4640._1248_8_;
        uVar134 = local_4640._856_8_;
        uVar133 = local_4640._848_8_;
        uVar132 = local_4640._840_8_;
        uVar131 = local_4640._832_8_;
        uVar130 = local_4640._824_8_;
        uVar129 = local_4640._816_8_;
        uVar120 = local_4640._424_8_;
        uVar119 = local_4640._416_8_;
        uVar118 = local_4640._408_8_;
        uVar117 = local_4640._400_8_;
        uVar116 = local_4640._392_8_;
        uVar115 = local_4640._384_8_;
        uVar160 = uVar160 + 2;
      } while (uVar160 < 0x10);
      auVar200._0_8_ =
           (double)local_4640._176_8_ * (double)local_4640._320_8_ +
           (double)local_4640._608_8_ * (double)local_4640._752_8_ +
           (double)local_4640._1040_8_ * (double)local_4640._1184_8_;
      auVar200._8_8_ =
           (double)local_4640._184_8_ * (double)local_4640._328_8_ +
           (double)local_4640._616_8_ * (double)local_4640._760_8_ +
           (double)local_4640._1048_8_ * (double)local_4640._1192_8_;
      auVar225._0_8_ =
           (double)local_4640._192_8_ * (double)local_4640._336_8_ +
           (double)local_4640._624_8_ * (double)local_4640._768_8_ +
           (double)local_4640._1056_8_ * (double)local_4640._1200_8_;
      auVar225._8_8_ =
           (double)local_4640._200_8_ * (double)local_4640._344_8_ +
           (double)local_4640._632_8_ * (double)local_4640._776_8_ +
           (double)local_4640._1064_8_ * (double)local_4640._1208_8_;
      auVar227._0_8_ =
           (double)local_4640._208_8_ * (double)local_4640._352_8_ +
           (double)local_4640._640_8_ * (double)local_4640._784_8_ +
           (double)local_4640._1072_8_ * (double)local_4640._1216_8_;
      auVar227._8_8_ =
           (double)local_4640._216_8_ * (double)local_4640._360_8_ +
           (double)local_4640._648_8_ * (double)local_4640._792_8_ +
           (double)local_4640._1080_8_ * (double)local_4640._1224_8_;
      auVar228._0_8_ =
           (double)local_4640._224_8_ * (double)local_4640._368_8_ +
           (double)local_4640._656_8_ * (double)local_4640._800_8_ +
           (double)local_4640._1088_8_ * (double)local_4640._1232_8_;
      auVar228._8_8_ =
           (double)local_4640._232_8_ * (double)local_4640._376_8_ +
           (double)local_4640._664_8_ * (double)local_4640._808_8_ +
           (double)local_4640._1096_8_ * (double)local_4640._1240_8_;
      auVar229._0_8_ =
           (double)local_4640._384_8_ * (double)local_4640._240_8_ +
           (double)local_4640._816_8_ * (double)local_4640._672_8_ +
           (double)local_4640._1248_8_ * (double)local_4640._1104_8_;
      auVar229._8_8_ =
           (double)local_4640._392_8_ * (double)local_4640._248_8_ +
           (double)local_4640._824_8_ * (double)local_4640._680_8_ +
           (double)local_4640._1256_8_ * (double)local_4640._1112_8_;
      auVar209._0_8_ =
           (double)local_4640._832_8_ * (double)local_4640._688_8_ +
           (double)local_4640._400_8_ * (double)local_4640._256_8_;
      auVar209._8_8_ =
           (double)local_4640._840_8_ * (double)local_4640._696_8_ +
           (double)local_4640._408_8_ * (double)local_4640._264_8_;
      auVar220._0_8_ = (double)local_4640._1264_8_ * (double)local_4640._1120_8_;
      auVar220._8_8_ = (double)local_4640._1272_8_ * (double)local_4640._1128_8_;
      auVar171 = vaddpd_avx512vl(auVar209,auVar220);
      auVar210._0_8_ =
           (double)local_4640._848_8_ * (double)local_4640._704_8_ +
           (double)local_4640._416_8_ * (double)local_4640._272_8_;
      auVar210._8_8_ =
           (double)local_4640._856_8_ * (double)local_4640._712_8_ +
           (double)local_4640._424_8_ * (double)local_4640._280_8_;
      auVar222._0_8_ = (double)local_4640._1280_8_ * (double)local_4640._1136_8_;
      auVar222._8_8_ = (double)local_4640._1288_8_ * (double)local_4640._1144_8_;
      auVar172 = vaddpd_avx512vl(auVar210,auVar222);
      local_2d80 = (undefined1  [8])pCVar162->m_Alpha;
      TStack_2d78.m_matrix = (non_const_type)local_49e0;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = (Matrix<double,_24,_6,_1,_24,_6> *)pCVar162->m_Alpha;
      auVar173 = vmovddup_avx512vl(auVar7);
      auVar23._8_8_ = local_49e0._8_8_;
      auVar23._0_8_ = local_49e0._0_8_;
      auVar178 = vmulpd_avx512vl(auVar173,auVar23);
      local_3680 = auVar178._0_8_ +
                   (double)local_4640._144_8_ * (double)local_4640._288_8_ +
                   (double)local_4640._576_8_ * (double)local_4640._720_8_ +
                   (double)local_4640._1008_8_ * (double)local_4640._1152_8_;
      dStack_3678 = auVar178._8_8_ +
                    (double)local_4640._152_8_ * (double)local_4640._296_8_ +
                    (double)local_4640._584_8_ * (double)local_4640._728_8_ +
                    (double)local_4640._1016_8_ * (double)local_4640._1160_8_;
      auVar26._8_8_ = avStack_49c8[0].m_value;
      auVar26._0_8_ = local_49d0;
      auVar178 = vmulpd_avx512vl(auVar173,auVar26);
      local_3670[0] =
           auVar178._0_8_ +
           (double)local_4640._160_8_ * (double)local_4640._304_8_ +
           (double)local_4640._592_8_ * (double)local_4640._736_8_ +
           (double)local_4640._1024_8_ * (double)local_4640._1168_8_;
      local_3670[1] =
           auVar178._8_8_ +
           (double)local_4640._168_8_ * (double)local_4640._312_8_ +
           (double)local_4640._600_8_ * (double)local_4640._744_8_ +
           (double)local_4640._1032_8_ * (double)local_4640._1176_8_;
      auVar29._8_8_ = dStack_49b8;
      auVar29._0_8_ = avStack_49c8[1].m_value;
      auVar178 = vmulpd_avx512vl(auVar173,auVar29);
      local_3660 = vaddpd_avx512vl(auVar200,auVar178);
      auVar32._8_8_ = dStack_49a8;
      auVar32._0_8_ = local_49b0;
      auVar178 = vmulpd_avx512vl(auVar173,auVar32);
      local_3650 = vaddpd_avx512vl(auVar225,auVar178);
      auVar35._8_8_ = dStack_4998;
      auVar35._0_8_ = local_49a0;
      auVar178 = vmulpd_avx512vl(auVar173,auVar35);
      local_3640 = vaddpd_avx512vl(auVar227,auVar178);
      auVar38._8_8_ = dStack_4988;
      auVar38._0_8_ = local_4990;
      auVar178 = vmulpd_avx512vl(auVar173,auVar38);
      local_3630 = vaddpd_avx512vl(auVar228,auVar178);
      auVar41._8_8_ = dStack_4978;
      auVar41._0_8_ = local_4980;
      auVar178 = vmulpd_avx512vl(auVar173,auVar41);
      local_3620 = vaddpd_avx512vl(auVar229,auVar178);
      auVar178 = vmulpd_avx512vl(auVar173,local_4970);
      local_3610 = vaddpd_avx512vl(auVar171,auVar178);
      auVar171 = vmulpd_avx512vl(auVar173,local_4960._0_16_);
      local_3600 = vaddpd_avx512vl(auVar172,auVar171);
      if (((pCVar162->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_rows < (long)dVar158) ||
         ((pCVar162->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
          m_storage.m_cols < 1)) goto LAB_00751acd;
      pdVar164 = (pCVar162->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data;
      local_3680 = local_3680 * pdVar164[lVar10 * 0x12];
      dStack_3678 = dStack_3678 * (pdVar164 + lVar10 * 0x12)[1];
      local_3670[0] = local_3670[0] * pdVar164[lVar10 * 0x12 + 2];
      local_3670[1] = local_3670[1] * (pdVar164 + lVar10 * 0x12 + 2)[1];
      dVar198 = local_3660._0_8_;
      local_3660._8_8_ = local_3660._8_8_ * (pdVar164 + lVar10 * 0x12 + 4)[1];
      local_3660._0_8_ = dVar198 * pdVar164[lVar10 * 0x12 + 4];
      dVar198 = local_3650._0_8_;
      local_3650._8_8_ = local_3650._8_8_ * (pdVar164 + lVar10 * 0x12 + 6)[1];
      local_3650._0_8_ = dVar198 * pdVar164[lVar10 * 0x12 + 6];
      dVar198 = local_3640._0_8_;
      local_3640._8_8_ = local_3640._8_8_ * (pdVar164 + lVar10 * 0x12 + 8)[1];
      local_3640._0_8_ = dVar198 * pdVar164[lVar10 * 0x12 + 8];
      dVar198 = local_3630._0_8_;
      local_3630._8_8_ = local_3630._8_8_ * (pdVar164 + lVar10 * 0x12 + 10)[1];
      local_3630._0_8_ = dVar198 * pdVar164[lVar10 * 0x12 + 10];
      dVar198 = local_3620._0_8_;
      local_3620._8_8_ = local_3620._8_8_ * (pdVar164 + lVar10 * 0x12 + 0xc)[1];
      local_3620._0_8_ = dVar198 * pdVar164[lVar10 * 0x12 + 0xc];
      local_3610 = vmulpd_avx512vl(local_3610,*(undefined1 (*) [16])(pdVar164 + lVar10 * 0x12 + 0xe)
                                  );
      local_3600 = vmulpd_avx512vl(local_3600,
                                   *(undefined1 (*) [16])(pdVar164 + lVar10 * 0x12 + 0x10));
      uVar160 = 0xfffffffffffffffe;
      do {
        dVar198 = *(double *)(local_4640 + uVar160 * 8 + 0x138);
        dVar199 = *(double *)(local_4640 + uVar160 * 8 + 0x2e8);
        dVar208 = *(double *)(local_4640 + uVar160 * 8 + 0x18);
        dVar14 = *(double *)(local_4640 + uVar160 * 8 + 0x1c8);
        dVar15 = *(double *)(local_4640 + uVar160 * 8 + 0x528);
        dVar16 = local_3f70[uVar160 + 1];
        dVar17 = local_4000[uVar160 + 1];
        dVar18 = *(double *)(local_4640 + uVar160 * 8 + 0x498);
        dVar19 = local_3dc0[uVar160 + 1];
        dVar20 = local_3e50[uVar160 + 1];
        dVar21 = *(double *)(local_4640 + uVar160 * 8 + 0x378);
        dVar22 = local_3cb0[uVar160 + 3];
        (&local_49d0)[uVar160] =
             (DenseStorage<double,__1,__1,__1,_1> *)
             (*(double *)(local_4640 + uVar160 * 8 + 0x490) * local_3dc0[uVar160] +
              *(double *)(local_4640 + uVar160 * 8 + 0x2e0) * local_3f70[uVar160] +
              *(double *)(local_4640 + uVar160 * 8 + 0x130) *
              *(double *)(local_4640 + uVar160 * 8 + 0x520) +
              *(double *)(local_4640 + uVar160 * 8 + 0x10) * local_4000[uVar160] +
              *(double *)(local_4640 + uVar160 * 8 + 0x1c0) * local_3e50[uVar160] +
             *(double *)(local_4640 + uVar160 * 8 + 0x370) * local_3cb0[uVar160 + 2]);
        avStack_49c8[uVar160].m_value =
             (long)(dVar18 * dVar19 + dVar199 * dVar16 + dVar198 * dVar15 + dVar208 * dVar17 +
                    dVar14 * dVar20 + dVar21 * dVar22);
        uVar142 = local_4640._1000_8_;
        uVar141 = local_4640._992_8_;
        uVar140 = local_4640._984_8_;
        uVar139 = local_4640._976_8_;
        uVar138 = local_4640._968_8_;
        uVar137 = local_4640._960_8_;
        uVar136 = local_4640._952_8_;
        uVar135 = local_4640._944_8_;
        uVar128 = local_4640._568_8_;
        uVar127 = local_4640._560_8_;
        uVar126 = local_4640._552_8_;
        uVar125 = local_4640._544_8_;
        uVar124 = local_4640._536_8_;
        uVar123 = local_4640._528_8_;
        uVar122 = local_4640._520_8_;
        uVar121 = local_4640._512_8_;
        uVar114 = local_4640._136_8_;
        uVar113 = local_4640._128_8_;
        uVar112 = local_4640._120_8_;
        uVar111 = local_4640._112_8_;
        uVar110 = local_4640._104_8_;
        uVar109 = local_4640._96_8_;
        uVar160 = uVar160 + 2;
      } while (uVar160 < 0x10);
      auVar214._0_8_ =
           (double)local_4640._96_8_ * (double)uVar115 +
           (double)local_4640._528_8_ * (double)uVar129;
      auVar214._8_8_ =
           (double)local_4640._104_8_ * (double)uVar116 +
           (double)local_4640._536_8_ * (double)uVar130;
      auVar215._0_8_ = (double)local_4640._960_8_ * (double)uVar143;
      auVar215._8_8_ = (double)local_4640._968_8_ * (double)uVar144;
      auVar171 = vaddpd_avx512vl(auVar214,auVar215);
      auVar201._0_8_ =
           (double)local_4640._32_8_ * (double)local_4640._320_8_ +
           (double)local_4640._464_8_ * (double)local_4640._752_8_;
      auVar201._8_8_ =
           (double)local_4640._40_8_ * (double)local_4640._328_8_ +
           (double)local_4640._472_8_ * (double)local_4640._760_8_;
      auVar211._0_8_ = (double)local_4640._896_8_ * (double)local_4640._1184_8_;
      auVar211._8_8_ = (double)local_4640._904_8_ * (double)local_4640._1192_8_;
      auVar172 = vaddpd_avx512vl(auVar201,auVar211);
      auVar202._0_8_ =
           (double)local_4640._480_8_ * (double)local_4640._768_8_ +
           (double)local_4640._48_8_ * (double)local_4640._336_8_;
      auVar202._8_8_ =
           (double)local_4640._488_8_ * (double)local_4640._776_8_ +
           (double)local_4640._56_8_ * (double)local_4640._344_8_;
      auVar226._0_8_ = (double)local_4640._912_8_ * (double)local_4640._1200_8_;
      auVar226._8_8_ = (double)local_4640._920_8_ * (double)local_4640._1208_8_;
      auVar173 = vaddpd_avx512vl(auVar202,auVar226);
      auVar203._0_8_ =
           (double)local_4640._64_8_ * (double)local_4640._352_8_ +
           (double)local_4640._496_8_ * (double)local_4640._784_8_;
      auVar203._8_8_ =
           (double)local_4640._72_8_ * (double)local_4640._360_8_ +
           (double)local_4640._504_8_ * (double)local_4640._792_8_;
      auVar212._0_8_ = (double)local_4640._928_8_ * (double)local_4640._1216_8_;
      auVar212._8_8_ = (double)local_4640._936_8_ * (double)local_4640._1224_8_;
      auVar178 = vaddpd_avx512vl(auVar203,auVar212);
      auVar204._0_8_ =
           (double)local_4640._80_8_ * (double)local_4640._368_8_ +
           (double)local_4640._512_8_ * (double)local_4640._800_8_;
      auVar204._8_8_ =
           (double)local_4640._88_8_ * (double)local_4640._376_8_ +
           (double)local_4640._520_8_ * (double)local_4640._808_8_;
      auVar213._0_8_ = (double)local_4640._944_8_ * (double)local_4640._1232_8_;
      auVar213._8_8_ = (double)local_4640._952_8_ * (double)local_4640._1240_8_;
      auVar175 = vaddpd_avx512vl(auVar204,auVar213);
      auVar216._0_8_ =
           (double)local_4640._112_8_ * (double)uVar117 +
           (double)local_4640._544_8_ * (double)uVar131;
      auVar216._8_8_ =
           (double)local_4640._120_8_ * (double)uVar118 +
           (double)local_4640._552_8_ * (double)uVar132;
      auVar217._0_8_ = (double)uVar145 * (double)local_4640._976_8_;
      auVar217._8_8_ = (double)uVar146 * (double)local_4640._984_8_;
      auVar174 = vaddpd_avx512vl(auVar216,auVar217);
      auVar218._0_8_ =
           (double)local_4640._128_8_ * (double)uVar119 +
           (double)uVar133 * (double)local_4640._560_8_;
      auVar218._8_8_ =
           (double)local_4640._136_8_ * (double)uVar120 +
           (double)uVar134 * (double)local_4640._568_8_;
      auVar219._0_8_ = (double)uVar147 * (double)local_4640._992_8_;
      auVar219._8_8_ = (double)uVar148 * (double)local_4640._1000_8_;
      auVar176 = vaddpd_avx512vl(auVar218,auVar219);
      local_2d80 = (undefined1  [8])pCVar162->m_Alpha;
      TStack_2d78.m_matrix = (non_const_type)local_49e0;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = (Matrix<double,_24,_6,_1,_24,_6> *)pCVar162->m_Alpha;
      auVar177 = vmovddup_avx512vl(auVar8);
      auVar24._8_8_ = local_49e0._8_8_;
      auVar24._0_8_ = local_49e0._0_8_;
      auVar179 = vmulpd_avx512vl(auVar177,auVar24);
      local_35f0 = auVar179._0_8_ +
                   (double)local_4640._864_8_ * (double)local_4640._1152_8_ +
                   (double)local_4640._432_8_ * (double)local_4640._720_8_ +
                   (double)local_4640._0_8_ * (double)local_4640._288_8_;
      dStack_35e8 = auVar179._8_8_ +
                    (double)local_4640._872_8_ * (double)local_4640._1160_8_ +
                    (double)local_4640._440_8_ * (double)local_4640._728_8_ +
                    (double)local_4640._8_8_ * (double)local_4640._296_8_;
      auVar27._8_8_ = avStack_49c8[0].m_value;
      auVar27._0_8_ = local_49d0;
      auVar179 = vmulpd_avx512vl(auVar177,auVar27);
      local_35e0[0] =
           (double)local_4640._16_8_ * (double)local_4640._304_8_ +
           (double)local_4640._448_8_ * (double)local_4640._736_8_ +
           (double)local_4640._880_8_ * (double)local_4640._1168_8_ + auVar179._0_8_;
      local_35e0[1] =
           (double)local_4640._24_8_ * (double)local_4640._312_8_ +
           (double)local_4640._456_8_ * (double)local_4640._744_8_ +
           (double)local_4640._888_8_ * (double)local_4640._1176_8_ + auVar179._8_8_;
      auVar30._8_8_ = dStack_49b8;
      auVar30._0_8_ = avStack_49c8[1].m_value;
      auVar179 = vmulpd_avx512vl(auVar177,auVar30);
      local_35d0 = vaddpd_avx512vl(auVar172,auVar179);
      auVar33._8_8_ = dStack_49a8;
      auVar33._0_8_ = local_49b0;
      auVar172 = vmulpd_avx512vl(auVar177,auVar33);
      local_35c0 = vaddpd_avx512vl(auVar173,auVar172);
      auVar36._8_8_ = dStack_4998;
      auVar36._0_8_ = local_49a0;
      auVar172 = vmulpd_avx512vl(auVar177,auVar36);
      local_35b0 = vaddpd_avx512vl(auVar178,auVar172);
      auVar39._8_8_ = dStack_4988;
      auVar39._0_8_ = local_4990;
      auVar172 = vmulpd_avx512vl(auVar177,auVar39);
      local_35a0 = vaddpd_avx512vl(auVar175,auVar172);
      auVar42._8_8_ = dStack_4978;
      auVar42._0_8_ = local_4980;
      auVar172 = vmulpd_avx512vl(auVar177,auVar42);
      local_3590 = vaddpd_avx512vl(auVar171,auVar172);
      auVar171 = vmulpd_avx512vl(auVar177,local_4970);
      local_3580 = vaddpd_avx512vl(auVar174,auVar171);
      auVar171 = vmulpd_avx512vl(auVar177,local_4960._0_16_);
      local_3570 = vaddpd_avx512vl(auVar176,auVar171);
      if (((pCVar162->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_rows < (long)dVar158) ||
         ((pCVar162->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
          m_storage.m_cols < 1)) goto LAB_00751acd;
      pdVar164 = (pCVar162->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data;
      local_35f0 = local_35f0 * pdVar164[lVar10 * 0x12];
      dStack_35e8 = dStack_35e8 * (pdVar164 + lVar10 * 0x12)[1];
      local_35e0[0] = local_35e0[0] * pdVar164[lVar10 * 0x12 + 2];
      local_35e0[1] = local_35e0[1] * (pdVar164 + lVar10 * 0x12 + 2)[1];
      dVar198 = local_35d0._0_8_;
      local_35d0._8_8_ = local_35d0._8_8_ * (pdVar164 + lVar10 * 0x12 + 4)[1];
      local_35d0._0_8_ = dVar198 * pdVar164[lVar10 * 0x12 + 4];
      dVar198 = local_35c0._0_8_;
      local_35c0._8_8_ = local_35c0._8_8_ * (pdVar164 + lVar10 * 0x12 + 6)[1];
      local_35c0._0_8_ = dVar198 * pdVar164[lVar10 * 0x12 + 6];
      dVar198 = local_35b0._0_8_;
      local_35b0._8_8_ = local_35b0._8_8_ * (pdVar164 + lVar10 * 0x12 + 8)[1];
      local_35b0._0_8_ = dVar198 * pdVar164[lVar10 * 0x12 + 8];
      local_35a0 = vmulpd_avx512vl(local_35a0,*(undefined1 (*) [16])(pdVar164 + lVar10 * 0x12 + 10))
      ;
      local_3590 = vmulpd_avx512vl(local_3590,*(undefined1 (*) [16])(pdVar164 + lVar10 * 0x12 + 0xc)
                                  );
      local_3580 = vmulpd_avx512vl(local_3580,*(undefined1 (*) [16])(pdVar164 + lVar10 * 0x12 + 0xe)
                                  );
      local_3570 = vmulpd_avx512vl(local_3570,
                                   *(undefined1 (*) [16])(pdVar164 + lVar10 * 0x12 + 0x10));
      uVar160 = 0xfffffffffffffffe;
      do {
        dVar198 = *(double *)(local_4640 + uVar160 * 8 + 0xa8);
        dVar199 = *(double *)(local_4640 + uVar160 * 8 + 600);
        dVar208 = *(double *)(local_4640 + uVar160 * 8 + 0x18);
        dVar14 = *(double *)(local_4640 + uVar160 * 8 + 0x1c8);
        dVar15 = *(double *)(local_4640 + uVar160 * 8 + 0x528);
        dVar16 = local_3f70[uVar160 + 1];
        dVar17 = *(double *)(local_4640 + uVar160 * 8 + 0x5b8);
        dVar18 = *(double *)(local_4640 + uVar160 * 8 + 0x408);
        dVar19 = local_3dc0[uVar160 + 1];
        dVar20 = local_3ee0[uVar160 + 1];
        dVar21 = *(double *)(local_4640 + uVar160 * 8 + 0x378);
        dVar22 = local_3d40[uVar160 + 3];
        (&local_49d0)[uVar160] =
             (DenseStorage<double,__1,__1,__1,_1> *)
             (*(double *)(local_4640 + uVar160 * 8 + 0x370) * local_3d40[uVar160 + 2] +
             *(double *)(local_4640 + uVar160 * 8 + 0x1c0) * local_3ee0[uVar160] +
             *(double *)(local_4640 + uVar160 * 8 + 0xa0) *
             *(double *)(local_4640 + uVar160 * 8 + 0x520) +
             *(double *)(local_4640 + uVar160 * 8 + 0x250) * local_3f70[uVar160] +
             *(double *)(local_4640 + uVar160 * 8 + 0x400) * local_3dc0[uVar160] +
             *(double *)(local_4640 + uVar160 * 8 + 0x10) *
             *(double *)(local_4640 + uVar160 * 8 + 0x5b0));
        avStack_49c8[uVar160].m_value =
             (long)(dVar21 * dVar22 +
                   dVar14 * dVar20 +
                   dVar198 * dVar15 + dVar199 * dVar16 + dVar18 * dVar19 + dVar208 * dVar17);
        uVar160 = uVar160 + 2;
      } while (uVar160 < 0x10);
      auVar47._8_8_ = local_4640._88_8_;
      auVar47._0_8_ = local_4640._80_8_;
      auVar223._0_8_ = (double)uVar121 * (double)local_4640._656_8_;
      auVar223._8_8_ = (double)uVar122 * (double)local_4640._664_8_;
      auVar57._8_8_ = local_4640._488_8_;
      auVar57._0_8_ = local_4640._480_8_;
      TStack_2d78.m_matrix = (non_const_type)local_49e0;
      auVar51._8_8_ = local_4640._232_8_;
      auVar51._0_8_ = local_4640._224_8_;
      auVar171 = vmulpd_avx512vl(auVar47,auVar51);
      auVar61._8_8_ = local_4640._632_8_;
      auVar61._0_8_ = local_4640._624_8_;
      auVar172 = vmulpd_avx512vl(auVar57,auVar61);
      auVar230._0_8_ = (double)local_4640._64_8_ * (double)local_4640._208_8_;
      auVar230._8_8_ = (double)local_4640._72_8_ * (double)local_4640._216_8_;
      auVar171 = vaddpd_avx512vl(auVar171,auVar223);
      auVar221._0_8_ = (double)local_4640._48_8_ * (double)local_4640._192_8_;
      auVar221._8_8_ = (double)local_4640._56_8_ * (double)local_4640._200_8_;
      auVar172 = vaddpd_avx512vl(auVar221,auVar172);
      auVar67._8_8_ = local_4640._920_8_;
      auVar67._0_8_ = local_4640._912_8_;
      auVar71._8_8_ = local_4640._1064_8_;
      auVar71._0_8_ = local_4640._1056_8_;
      auVar173 = vmulpd_avx512vl(auVar67,auVar71);
      auVar172 = vaddpd_avx512vl(auVar172,auVar173);
      auVar58._8_8_ = local_4640._504_8_;
      auVar58._0_8_ = local_4640._496_8_;
      auVar62._8_8_ = local_4640._648_8_;
      auVar62._0_8_ = local_4640._640_8_;
      auVar173 = vmulpd_avx512vl(auVar58,auVar62);
      auVar173 = vaddpd_avx512vl(auVar230,auVar173);
      auVar68._8_8_ = local_4640._936_8_;
      auVar68._0_8_ = local_4640._928_8_;
      auVar72._8_8_ = local_4640._1080_8_;
      auVar72._0_8_ = local_4640._1072_8_;
      auVar178 = vmulpd_avx512vl(auVar68,auVar72);
      auVar173 = vaddpd_avx512vl(auVar173,auVar178);
      local_2d80 = (undefined1  [8])pCVar162->m_Alpha;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = local_2d80;
      auVar178 = vmovddup_avx512vl(auVar9);
      auVar25._8_8_ = local_49e0._8_8_;
      auVar25._0_8_ = local_49e0._0_8_;
      auVar175 = vmulpd_avx512vl(auVar178,auVar25);
      local_3560 = (double)local_4640._864_8_ * (double)local_4640._1008_8_ +
                   (double)local_4640._432_8_ * (double)local_4640._576_8_ +
                   (double)local_4640._0_8_ * (double)local_4640._144_8_ + auVar175._0_8_;
      dStack_3558 = (double)local_4640._872_8_ * (double)local_4640._1016_8_ +
                    (double)local_4640._440_8_ * (double)local_4640._584_8_ +
                    (double)local_4640._8_8_ * (double)local_4640._152_8_ + auVar175._8_8_;
      auVar28._8_8_ = avStack_49c8[0].m_value;
      auVar28._0_8_ = local_49d0;
      auVar175 = vmulpd_avx512vl(auVar178,auVar28);
      local_3550[0] =
           (double)local_4640._16_8_ * (double)local_4640._160_8_ +
           (double)local_4640._448_8_ * (double)local_4640._592_8_ +
           (double)local_4640._880_8_ * (double)local_4640._1024_8_ + auVar175._0_8_;
      local_3550[1] =
           (double)local_4640._24_8_ * (double)local_4640._168_8_ +
           (double)local_4640._456_8_ * (double)local_4640._600_8_ +
           (double)local_4640._888_8_ * (double)local_4640._1032_8_ + auVar175._8_8_;
      auVar31._8_8_ = dStack_49b8;
      auVar31._0_8_ = avStack_49c8[1].m_value;
      auVar175 = vmulpd_avx512vl(auVar178,auVar31);
      local_3550[2] =
           (double)local_4640._32_8_ * (double)local_4640._176_8_ +
           (double)local_4640._464_8_ * (double)local_4640._608_8_ +
           (double)local_4640._896_8_ * (double)local_4640._1040_8_ + auVar175._0_8_;
      local_3550[3] =
           (double)local_4640._40_8_ * (double)local_4640._184_8_ +
           (double)local_4640._472_8_ * (double)local_4640._616_8_ +
           (double)local_4640._904_8_ * (double)local_4640._1048_8_ + auVar175._8_8_;
      auVar34._8_8_ = dStack_49a8;
      auVar34._0_8_ = local_49b0;
      auVar175 = vmulpd_avx512vl(auVar178,auVar34);
      local_3530 = auVar172._0_8_ + auVar175._0_8_;
      dStack_3528 = auVar172._8_8_ + auVar175._8_8_;
      auVar37._8_8_ = dStack_4998;
      auVar37._0_8_ = local_49a0;
      auVar172 = vmulpd_avx512vl(auVar178,auVar37);
      local_3520 = auVar173._0_8_ + auVar172._0_8_;
      dStack_3518 = auVar173._8_8_ + auVar172._8_8_;
      auVar40._8_8_ = dStack_4988;
      auVar40._0_8_ = local_4990;
      auVar172 = vmulpd_avx512vl(auVar178,auVar40);
      local_3510 = auVar171._0_8_ + (double)uVar135 * (double)local_4640._1088_8_ + auVar172._0_8_;
      dStack_3508 = auVar171._8_8_ + (double)uVar136 * (double)local_4640._1096_8_ + auVar172._8_8_;
      auVar43._8_8_ = dStack_4978;
      auVar43._0_8_ = local_4980;
      auVar171 = vmulpd_avx512vl(auVar178,auVar43);
      local_3500 = (double)uVar109 * (double)local_4640._240_8_ +
                   (double)uVar123 * (double)local_4640._672_8_ +
                   (double)uVar137 * (double)local_4640._1104_8_ + auVar171._0_8_;
      dStack_34f8 = (double)uVar110 * (double)local_4640._248_8_ +
                    (double)uVar124 * (double)local_4640._680_8_ +
                    (double)uVar138 * (double)local_4640._1112_8_ + auVar171._8_8_;
      auVar171 = vmulpd_avx512vl(auVar178,local_4970);
      local_34f0 = (double)uVar111 * (double)local_4640._256_8_ +
                   (double)uVar125 * (double)local_4640._688_8_ +
                   (double)uVar139 * (double)local_4640._1120_8_ + auVar171._0_8_;
      dStack_34e8 = (double)uVar112 * (double)local_4640._264_8_ +
                    (double)uVar126 * (double)local_4640._696_8_ +
                    (double)uVar140 * (double)local_4640._1128_8_ + auVar171._8_8_;
      auVar171 = vmulpd_avx512vl(auVar178,local_4960._0_16_);
      local_34e0 = (double)uVar113 * (double)local_4640._272_8_ +
                   (double)uVar127 * (double)local_4640._704_8_ +
                   (double)uVar141 * (double)local_4640._1136_8_ + auVar171._0_8_;
      dStack_34d8 = (double)uVar114 * (double)local_4640._280_8_ +
                    (double)uVar128 * (double)local_4640._712_8_ +
                    (double)uVar142 * (double)local_4640._1144_8_ + auVar171._8_8_;
      if (((pCVar162->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_rows < (long)dVar158) ||
         ((pCVar162->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
          m_storage.m_cols < 1)) goto LAB_00751acd;
      pdVar164 = (pCVar162->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data;
      local_3560 = local_3560 * pdVar164[lVar10 * 0x12];
      dStack_3558 = dStack_3558 * (pdVar164 + lVar10 * 0x12)[1];
      local_3550[0] = local_3550[0] * pdVar164[lVar10 * 0x12 + 2];
      local_3550[1] = local_3550[1] * (pdVar164 + lVar10 * 0x12 + 2)[1];
      local_3550[2] = local_3550[2] * pdVar164[lVar10 * 0x12 + 4];
      local_3550[3] = local_3550[3] * (pdVar164 + lVar10 * 0x12 + 4)[1];
      dStack_3528 = dStack_3528 * (pdVar164 + lVar10 * 0x12 + 6)[1];
      local_3530 = local_3530 * pdVar164[lVar10 * 0x12 + 6];
      dStack_3518 = dStack_3518 * (pdVar164 + lVar10 * 0x12 + 8)[1];
      local_3520 = local_3520 * pdVar164[lVar10 * 0x12 + 8];
      local_3510 = local_3510 * pdVar164[lVar10 * 0x12 + 10];
      dStack_3508 = dStack_3508 * (pdVar164 + lVar10 * 0x12 + 10)[1];
      local_3500 = local_3500 * pdVar164[lVar10 * 0x12 + 0xc];
      dStack_34f8 = dStack_34f8 * (pdVar164 + lVar10 * 0x12 + 0xc)[1];
      local_34f0 = local_34f0 * pdVar164[lVar10 * 0x12 + 0xe];
      dStack_34e8 = dStack_34e8 * (pdVar164 + lVar10 * 0x12 + 0xe)[1];
      local_2ea0 = (_func_int **)local_47a0._8_8_;
      peStack_2e98 = (element_type *)local_4840;
      local_2f30 = (pointer)local_47a0._16_8_;
      peStack_2f28 = (element_type *)&local_3710;
      local_3380 = (ChLoadableUV)local_47a0._24_8_;
      peStack_3378 = (element_type *)&local_3680;
      local_3410 = (ChLoadableUVW)local_47a0._32_8_;
      peStack_3408 = (element_type *)&local_35f0;
      local_34a0 = (ChLoadableUVW)local_47a0._40_8_;
      peStack_3498 = (element_type *)&local_3560;
      uVar160 = 0xfffffffffffffffe;
      local_34e0 = local_34e0 * pdVar164[lVar10 * 0x12 + 0x10];
      dStack_34d8 = dStack_34d8 * (pdVar164 + lVar10 * 0x12 + 0x10)[1];
      local_2d80 = (undefined1  [8])local_47a0._0_8_;
      TStack_2d78.m_matrix = (non_const_type)&local_48f0;
      do {
        pDVar12 = (&local_48f0.m_dstExpr)[uVar160];
        dVar158 = local_3700[uVar160 + 1];
        dVar198 = *(double *)(local_3660 + uVar160 * 8 + -8);
        dVar199 = *(double *)(local_35d0 + uVar160 * 8 + -8);
        dVar208 = local_3550[uVar160 + 1];
        local_2e00[uVar160] =
             (double)local_47a0._40_8_ * local_3550[uVar160] +
             (double)local_47a0._32_8_ * local_35e0[uVar160] +
             (double)local_47a0._24_8_ * local_3670[uVar160] +
             (double)local_47a0._16_8_ * local_3700[uVar160] +
             (double)local_47a0._0_8_ * (double)(&local_48f0.m_functor)[uVar160] +
             (double)local_47a0._8_8_ * adStack_4828[uVar160 - 1];
        local_2e00[uVar160 + 1] =
             (double)local_47a0._40_8_ * dVar208 +
             (double)local_47a0._32_8_ * dVar199 +
             (double)local_47a0._24_8_ * dVar198 +
             (double)local_47a0._16_8_ * dVar158 +
             (double)local_47a0._0_8_ * (double)pDVar12 +
             (double)local_47a0._8_8_ * adStack_4828[uVar160];
        uVar160 = uVar160 + 2;
      } while (uVar160 < 0x10);
      uVar160 = 0xfffffffffffffffe;
      local_2d80 = (undefined1  [8])local_47a0._48_8_;
      local_2f30 = (pointer)local_47a0._56_8_;
      peStack_2f28 = (element_type *)local_4840;
      local_3380 = (ChLoadableUV)local_47a0._64_8_;
      peStack_3378 = (element_type *)&local_3710;
      local_3410 = (ChLoadableUVW)local_47a0._72_8_;
      peStack_3408 = (element_type *)&local_3680;
      local_34a0 = (ChLoadableUVW)local_47a0._80_8_;
      peStack_3498 = (element_type *)&local_35f0;
      do {
        pDVar12 = (&local_48f0.m_dstExpr)[uVar160];
        dVar158 = local_3700[uVar160 + 1];
        dVar198 = *(double *)(local_3660 + uVar160 * 8 + -8);
        dVar199 = *(double *)(local_35d0 + uVar160 * 8 + -8);
        dVar208 = local_3550[uVar160 + 1];
        local_2e90[uVar160] =
             (double)local_47a0._88_8_ * local_3550[uVar160] +
             (double)local_47a0._80_8_ * local_35e0[uVar160] +
             (double)local_47a0._72_8_ * local_3670[uVar160] +
             (double)local_47a0._64_8_ * local_3700[uVar160] +
             (double)local_47a0._48_8_ * (double)(&local_48f0.m_functor)[uVar160] +
             (double)local_47a0._56_8_ * adStack_4828[uVar160 - 1];
        local_2e90[uVar160 + 1] =
             (double)local_47a0._88_8_ * dVar208 +
             (double)local_47a0._80_8_ * dVar199 +
             (double)local_47a0._72_8_ * dVar198 +
             (double)local_47a0._64_8_ * dVar158 +
             (double)local_47a0._48_8_ * (double)pDVar12 +
             (double)local_47a0._56_8_ * adStack_4828[uVar160];
        uVar160 = uVar160 + 2;
      } while (uVar160 < 0x10);
      uVar160 = 0xfffffffffffffffe;
      local_2d80 = (undefined1  [8])local_4740;
      local_3380 = (ChLoadableUV)local_4738;
      peStack_3378 = (element_type *)local_4840;
      local_3410 = (ChLoadableUVW)local_4730;
      peStack_3408 = (element_type *)&local_3710;
      local_34a0 = (ChLoadableUVW)local_4728;
      peStack_3498 = (element_type *)&local_3680;
      do {
        pDVar12 = (&local_48f0.m_dstExpr)[uVar160];
        dVar158 = local_3700[uVar160 + 1];
        dVar198 = *(double *)(local_3660 + uVar160 * 8 + -8);
        dVar199 = *(double *)(local_35d0 + uVar160 * 8 + -8);
        dVar208 = local_3550[uVar160 + 1];
        local_2f20[uVar160] =
             (double)local_4718 * local_3550[uVar160] +
             (double)local_4720 * local_35e0[uVar160] +
             (double)local_4728 * local_3670[uVar160] +
             (double)local_4730 * local_3700[uVar160] +
             (double)local_4740 * (double)(&local_48f0.m_functor)[uVar160] +
             (double)local_4738 * adStack_4828[uVar160 - 1];
        local_2f20[uVar160 + 1] =
             (double)local_4718 * dVar208 +
             (double)local_4720 * dVar199 +
             (double)local_4728 * dVar198 +
             (double)local_4730 * dVar158 +
             (double)local_4740 * (double)pDVar12 + (double)local_4738 * adStack_4828[uVar160];
        uVar160 = uVar160 + 2;
      } while (uVar160 < 0x10);
      uVar160 = 0xfffffffffffffffe;
      local_2d80 = (undefined1  [8])local_4710;
      local_3410 = (ChLoadableUVW)local_4708;
      peStack_3408 = (element_type *)local_4840;
      local_34a0 = (ChLoadableUVW)local_4700;
      peStack_3498 = (element_type *)&local_3710;
      do {
        pDVar12 = (&local_48f0.m_dstExpr)[uVar160];
        dVar158 = local_3700[uVar160 + 1];
        dVar198 = *(double *)(local_3660 + uVar160 * 8 + -8);
        dVar199 = *(double *)(local_35d0 + uVar160 * 8 + -8);
        dVar208 = local_3550[uVar160 + 1];
        local_3370[uVar160] =
             (double)local_46e8 * local_3550[uVar160] +
             (double)local_46f0 * local_35e0[uVar160] +
             (double)local_46f8 * local_3670[uVar160] +
             (double)local_4700 * local_3700[uVar160] +
             (double)local_4710 * (double)(&local_48f0.m_functor)[uVar160] +
             (double)local_4708 * adStack_4828[uVar160 - 1];
        local_3370[uVar160 + 1] =
             (double)local_46e8 * dVar208 +
             (double)local_46f0 * dVar199 +
             (double)local_46f8 * dVar198 +
             (double)local_4700 * dVar158 +
             (double)local_4710 * (double)pDVar12 + (double)local_4708 * adStack_4828[uVar160];
        uVar160 = uVar160 + 2;
      } while (uVar160 < 0x10);
      uVar160 = 0xfffffffffffffffe;
      local_2d80 = (undefined1  [8])local_46e0;
      local_34a0 = (ChLoadableUVW)local_46d8;
      peStack_3498 = (element_type *)local_4840;
      local_4860 = (ChLoadableUVW)local_46b8;
      local_4858 = &local_3560;
      do {
        pDVar12 = (&local_48f0.m_dstExpr)[uVar160];
        dVar158 = local_3700[uVar160 + 1];
        dVar198 = *(double *)(local_3660 + uVar160 * 8 + -8);
        dVar199 = *(double *)(local_35d0 + uVar160 * 8 + -8);
        dVar208 = local_3550[uVar160 + 1];
        local_3400[uVar160] =
             (double)local_46b8 * local_3550[uVar160] +
             (double)local_46c0 * local_35e0[uVar160] +
             (double)local_46c8 * local_3670[uVar160] +
             (double)local_46d0 * local_3700[uVar160] +
             (double)local_46e0 * (double)(&local_48f0.m_functor)[uVar160] +
             (double)local_46d8 * adStack_4828[uVar160 - 1];
        local_3400[uVar160 + 1] =
             (double)local_46b8 * dVar208 +
             (double)local_46c0 * dVar199 +
             (double)local_46c8 * dVar198 +
             (double)local_46d0 * dVar158 +
             (double)local_46e0 * (double)pDVar12 + (double)local_46d8 * adStack_4828[uVar160];
        uVar160 = uVar160 + 2;
      } while (uVar160 < 0x10);
      uVar160 = 0xfffffffffffffffe;
      local_2d80 = (undefined1  [8])local_46b0;
      local_4a40 = local_46a8;
      local_4a10 = local_46a0;
      local_4910 = local_4698;
      local_4860 = local_4690;
      local_4858 = &local_35f0;
      local_34b0 = local_4688;
      local_34a8 = &local_3560;
      do {
        pDVar12 = (&local_48f0.m_dstExpr)[uVar160];
        dVar158 = local_3700[uVar160 + 1];
        dVar198 = *(double *)(local_3660 + uVar160 * 8 + -8);
        dVar199 = *(double *)(local_35d0 + uVar160 * 8 + -8);
        dVar208 = local_3550[uVar160 + 1];
        local_3490[uVar160] =
             (double)local_4688 * local_3550[uVar160] +
             (double)local_4690 * local_35e0[uVar160] +
             (double)local_4698 * local_3670[uVar160] +
             (double)local_46a0 * local_3700[uVar160] +
             (double)local_46b0 * (double)(&local_48f0.m_functor)[uVar160] +
             (double)local_46a8 * adStack_4828[uVar160 - 1];
        local_3490[uVar160 + 1] =
             (double)local_4688 * dVar208 +
             (double)local_4690 * dVar199 +
             (double)local_4698 * dVar198 +
             (double)local_46a0 * dVar158 +
             (double)local_46b0 * (double)pDVar12 + (double)local_46a8 * adStack_4828[uVar160];
        uVar160 = uVar160 + 2;
      } while (uVar160 < 0x10);
      lVar10 = (pCVar162->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_cols;
      local_4a38._0_8_ = (element_type *)local_4840;
      local_4a08 = (assign_op<double,_double> *)&local_3710;
      local_4908 = &local_3680;
      dVar158 = local_4920;
      if (lVar10 < (long)local_4a00) goto LAB_00751a80;
      uVar160 = (pCVar162->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                m_storage.m_rows;
      pdVar156 = (pCVar162->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                 m_storage.m_data;
      pdVar164 = local_2be0;
      uVar166 = 0;
      local_30d0 = local_2d90;
      uStack_30c8 = uStack_2d88;
      local_30e0 = local_2ea0;
      peStack_30d8 = peStack_2e98;
      local_3010 = local_2e00[0];
      dStack_3008 = local_2e00[1];
      local_3020 = local_2e00[2];
      dStack_3018 = local_2e00[3];
      local_3000 = local_2e10;
      dStack_2ff8 = dStack_2e08;
      local_32b0 = local_3440;
      local_32c0 = local_3430;
      local_32d0 = local_3420;
      local_32e0 = local_33c0;
      local_32f0 = local_33d0;
      local_30f0 = local_2e90[0];
      uStack_30e8 = local_2e90[1];
      local_3100 = local_2e90[2];
      uStack_30f8 = local_2e90[3];
      local_3030 = local_2de0;
      dStack_3028 = dStack_2dd8;
      local_3040 = (pointer)local_34a0;
      peStack_3038 = peStack_3498;
      local_3110 = local_2e70;
      uStack_3108 = uStack_2e68;
      local_3120 = (pointer)local_3380;
      peStack_3118 = peStack_3378;
      local_3050 = local_3490[0];
      dStack_3048 = local_3490[1];
      local_3060 = local_3490[2];
      dStack_3058 = local_3490[3];
      local_3130 = local_3370[0];
      dStack_3128 = local_3370[1];
      local_3140 = local_3370[2];
      dStack_3138 = local_3370[3];
      local_3070 = local_3470;
      dStack_3068 = dStack_3468;
      local_47b0 = (pointer)local_3410;
      peStack_47a8 = peStack_3408;
      local_3150 = local_3350;
      uStack_3148 = uStack_3348;
      local_3160 = local_2e60;
      uStack_3158 = uStack_2e58;
      dStack_4918 = local_3400[1];
      local_34c0 = local_3400[2];
      dStack_34b8 = local_3400[3];
      local_3170 = local_3340;
      uStack_3168 = uStack_3338;
      local_3180 = local_2e50;
      uStack_3178 = uStack_2e48;
      local_34d0 = local_33e0;
      dStack_34c8 = dStack_33d8;
      local_3080 = local_2dd0;
      dStack_3078 = dStack_2dc8;
      local_3190 = local_3330;
      uStack_3188 = uStack_3328;
      local_31a0 = local_2e40;
      uStack_3198 = uStack_2e38;
      local_3090 = local_3460;
      uStack_3088 = uStack_3458;
      local_30a0 = local_2dc0;
      dStack_3098 = dStack_2db8;
      local_31b0 = local_3320;
      dStack_31a8 = dStack_3318;
      local_31c0 = local_2e30;
      uStack_31b8 = uStack_2e28;
      local_30b0 = local_2db0;
      uStack_30a8 = uStack_2da8;
      local_30c0 = local_2da0;
      uStack_30b8 = uStack_2d98;
      local_31d0 = local_3310;
      uStack_31c8 = uStack_3308;
      local_31e0 = local_2e20;
      uStack_31d8 = uStack_2e18;
      local_3290 = local_33a0;
      local_32a0 = local_33b0;
      local_31f0 = local_3300;
      uStack_31e8 = uStack_32f8;
      local_3200 = local_2f30;
      peStack_31f8 = peStack_2f28;
      local_3210 = local_2f20[0];
      dStack_3208 = local_2f20[1];
      local_3220 = local_2f20[2];
      dStack_3218 = local_2f20[3];
      local_3230 = local_2f00;
      uStack_3228 = uStack_2ef8;
      local_3240 = local_2ef0;
      uStack_3238 = uStack_2ee8;
      local_3250 = local_2ee0;
      dStack_3248 = dStack_2ed8;
      local_3260 = local_2ed0;
      uStack_3258 = uStack_2ec8;
      local_3270 = local_2ec0;
      uStack_3268 = uStack_2eb8;
      local_3280 = local_2eb0;
      uStack_3278 = uStack_2ea8;
      auVar178 = local_33d0;
      auVar175 = local_33c0;
      auVar171 = local_33a0;
      auVar172 = local_33b0;
      auVar173 = local_3440;
      auVar176 = local_3430;
      auVar174 = local_3420;
      do {
        dVar158 = local_3400[0];
        if ((((~((long)uVar160 >> 0x3f) & uVar160) == uVar166) ||
            (dVar158 = local_3400[0], lVar10 < (long)local_4a80)) ||
           (dVar158 = local_3400[0], lVar10 < local_4a78)) goto LAB_00751a80;
        auVar106._8_8_ = peStack_3498;
        auVar106._0_8_ = local_34a0;
        auVar105._8_8_ = dStack_3468;
        auVar105._0_8_ = local_3470;
        auVar104._8_8_ = uStack_3458;
        auVar104._0_8_ = local_3460;
        dVar158 = (pdVar156 + local_4930)[1];
        dVar198 = (pdVar156 + (long)local_4658)[1];
        dVar199 = (pdVar156 + (long)local_4650)[1];
        pdVar164[-0x34] =
             local_2e10 * pdVar156[local_4930] + (double)local_34a0 * pdVar156[(long)local_4658] +
             (double)local_3410 * pdVar156[(long)local_4650];
        pdVar164[-0x33] =
             dStack_2e08 * dVar158 + (double)peStack_3498 * dVar198 + (double)peStack_3408 * dVar199
        ;
        dVar158 = (pdVar156 + local_4930 + 2)[1];
        dVar198 = (pdVar156 + (long)local_4658 + 2)[1];
        auVar177 = *(undefined1 (*) [16])(pdVar156 + (long)local_4650 + 2);
        auVar44._8_8_ = local_3400[1];
        auVar44._0_8_ = local_3400[0];
        auVar179 = vmulpd_avx512vl(auVar177,auVar44);
        pdVar164[-0x32] =
             local_2e00[0] * pdVar156[local_4930 + 2] +
             local_3490[0] * pdVar156[(long)local_4658 + 2] + auVar179._0_8_;
        pdVar164[-0x31] = local_2e00[1] * dVar158 + local_3490[1] * dVar198 + auVar179._8_8_;
        local_4a00 = pdVar156[local_4930 + 4];
        dStack_49f8 = (pdVar156 + local_4930 + 4)[1];
        pauVar2 = (undefined1 (*) [16])(pdVar156 + (long)local_4658 + 4);
        local_4900 = *(Matrix<double,_24,_6,_1,_24,_6> ***)*pauVar2;
        dStack_48f8 = *(double *)(*pauVar2 + 8);
        auVar191 = *pauVar2;
        pauVar2 = (undefined1 (*) [16])(pdVar156 + (long)local_4650 + 4);
        local_2f40 = *(double *)*pauVar2;
        dStack_2f38 = *(double *)(*pauVar2 + 8);
        auVar192 = *pauVar2;
        pdVar164[-0x30] =
             local_4a00 * local_2e00[2] + local_3490[2] * (double)local_4900 +
             local_2f40 * local_3400[2];
        pdVar164[-0x2f] =
             dStack_49f8 * local_2e00[3] + local_3490[3] * dStack_48f8 + dStack_2f38 * local_3400[3]
        ;
        pauVar2 = (undefined1 (*) [16])(pdVar156 + (long)local_4658 + 6);
        dStack_2f58 = *(double *)(*pauVar2 + 8);
        auVar224 = *pauVar2;
        pauVar3 = (undefined1 (*) [16])(pdVar156 + local_4930 + 6);
        dStack_2f48 = *(double *)(*pauVar3 + 8);
        auVar48 = *pauVar3;
        local_2f60 = *(double *)*pauVar2;
        pauVar4 = (undefined1 (*) [16])(pdVar156 + (long)local_4650 + 6);
        dStack_2f68 = *(double *)(*pauVar4 + 8);
        auVar45 = *pauVar4;
        local_2f50 = *(double *)*pauVar3;
        local_2f70 = *(double *)*pauVar4;
        pdVar164[-0x2e] =
             *(double *)*pauVar3 * local_2de0 + local_3470 * *(double *)*pauVar2 +
             *(double *)*pauVar4 * local_33e0;
        pdVar164[-0x2d] =
             dStack_2f48 * dStack_2dd8 + dStack_3468 * dStack_2f58 + dStack_2f68 * dStack_33d8;
        auVar179 = *(undefined1 (*) [16])(pdVar156 + (long)local_4658 + 8);
        pauVar2 = (undefined1 (*) [16])(pdVar156 + local_4930 + 8);
        dVar158 = *(double *)*pauVar2;
        dStack_4938 = *(double *)(*pauVar2 + 8);
        auVar50 = *pauVar2;
        auVar49 = *pauVar2;
        auVar180 = vmulpd_avx512vl(auVar104,auVar179);
        auVar5 = *(undefined1 (*) [16])(pdVar156 + (long)local_4650 + 8);
        local_4940 = SUB81(dVar158,0);
        uStack_493f = (undefined7)((ulong)dVar158 >> 8);
        auVar178 = vmulpd_avx512vl(auVar178,auVar5);
        pdVar164[-0x2c] = dVar158 * local_2dd0 + auVar180._0_8_ + auVar178._0_8_;
        pdVar164[-0x2b] = dStack_4938 * dStack_2dc8 + auVar180._8_8_ + auVar178._8_8_;
        auVar178 = *(undefined1 (*) [16])(pdVar156 + local_4930 + 10);
        auVar180 = *(undefined1 (*) [16])(pdVar156 + (long)local_4658 + 10);
        auVar181 = vmulpd_avx512vl(local_3450,auVar180);
        auVar6 = *(undefined1 (*) [16])(pdVar156 + (long)local_4650 + 10);
        auVar175 = vmulpd_avx512vl(auVar175,auVar6);
        pdVar164[-0x2a] = auVar178._0_8_ * local_2dc0 + auVar181._0_8_ + auVar175._0_8_;
        pdVar164[-0x29] = auVar178._8_8_ * dStack_2db8 + auVar181._8_8_ + auVar175._8_8_;
        auVar175 = *(undefined1 (*) [16])(pdVar156 + local_4930 + 0xc);
        auVar181 = *(undefined1 (*) [16])(pdVar156 + (long)local_4658 + 0xc);
        auVar103._8_8_ = uStack_2da8;
        auVar103._0_8_ = local_2db0;
        auVar182 = vmulpd_avx512vl(auVar175,auVar103);
        auVar183 = vmulpd_avx512vl(auVar173,auVar181);
        auVar183 = vaddpd_avx512vl(auVar182,auVar183);
        auVar182 = *(undefined1 (*) [16])(pdVar156 + (long)local_4650 + 0xc);
        auVar172 = vmulpd_avx512vl(auVar172,auVar182);
        auVar172 = vaddpd_avx512vl(auVar183,auVar172);
        *(undefined1 (*) [16])(pdVar164 + -0x28) = auVar172;
        auVar172 = *(undefined1 (*) [16])(pdVar156 + local_4930 + 0xe);
        auVar183 = *(undefined1 (*) [16])(pdVar156 + (long)local_4658 + 0xe);
        auVar102._8_8_ = uStack_2d98;
        auVar102._0_8_ = local_2da0;
        auVar184 = vmulpd_avx512vl(auVar172,auVar102);
        auVar185 = vmulpd_avx512vl(auVar176,auVar183);
        auVar185 = vaddpd_avx512vl(auVar184,auVar185);
        auVar184 = *(undefined1 (*) [16])(pdVar156 + (long)local_4650 + 0xe);
        auVar171 = vmulpd_avx512vl(auVar171,auVar184);
        auVar171 = vaddpd_avx512vl(auVar185,auVar171);
        *(undefined1 (*) [16])(pdVar164 + -0x26) = auVar171;
        auVar171 = *(undefined1 (*) [16])(pdVar156 + local_4930 + 0x10);
        auVar185 = *(undefined1 (*) [16])(pdVar156 + (long)local_4658 + 0x10);
        auVar101._8_8_ = uStack_2d88;
        auVar101._0_8_ = local_2d90;
        auVar186 = vmulpd_avx512vl(auVar171,auVar101);
        auVar187 = vmulpd_avx512vl(auVar174,auVar185);
        auVar187 = vaddpd_avx512vl(auVar186,auVar187);
        auVar186 = *(undefined1 (*) [16])(pdVar156 + (long)local_4650 + 0x10);
        auVar188 = vmulpd_avx512vl(local_3390,auVar186);
        auVar187 = vaddpd_avx512vl(auVar187,auVar188);
        *(undefined1 (*) [16])(pdVar164 + -0x24) = auVar187;
        dVar158 = local_3400[0];
        if ((long)uVar160 <= (long)uVar166 || lVar10 < (long)dVar196) goto LAB_00751a80;
        local_2f80 = *(undefined1 (*) [16])(pdVar156 + local_4930);
        auVar97._8_8_ = peStack_3378;
        auVar97._0_8_ = local_3380;
        local_2fb0 = auVar178;
        local_2ff0 = auVar179;
        local_2fd0 = auVar177;
        auVar177 = local_2fd0;
        uVar166 = uVar166 + 1;
        auVar188 = vmulpd_avx512vl(auVar106,local_2f80);
        pauVar2 = (undefined1 (*) [16])(pdVar156 + (long)local_4658);
        auVar187 = *pauVar2;
        auVar60 = local_2f80;
        local_2fc0 = *(undefined1 (*) [16])(pdVar156 + (long)local_4650);
        local_2f90 = *(double *)*pauVar2;
        dStack_2f88 = *(double *)(*pauVar2 + 8);
        auVar197._0_8_ = *(double *)*pauVar2 * (double)local_2ea0;
        auVar197._8_8_ = *(double *)(*pauVar2 + 8) * (double)peStack_2e98;
        auVar189 = vmulpd_avx512vl(auVar97,local_2fc0);
        auVar59 = local_2fc0;
        auVar188 = vaddpd_avx512vl(auVar188,auVar197);
        pdVar164[-0x22] = auVar188._0_8_ + auVar189._0_8_;
        pdVar164[-0x21] = auVar188._8_8_ + auVar189._8_8_;
        local_2fa0 = pdVar156[local_4930 + 2];
        dStack_2f98 = (pdVar156 + local_4930 + 2)[1];
        auVar205._0_8_ = local_3490[0] * local_2fa0;
        auVar205._8_8_ = local_3490[1] * dStack_2f98;
        local_2fe0 = *(undefined1 (*) [16])(pdVar156 + (long)local_4658 + 2);
        pdVar156 = pdVar156 + lVar10;
        auVar100._8_8_ = local_2e90[1];
        auVar100._0_8_ = local_2e90[0];
        auVar189 = vmulpd_avx512vl(local_2fe0,auVar100);
        auVar188 = local_2fe0;
        auVar96._8_8_ = local_3370[1];
        auVar96._0_8_ = local_3370[0];
        auVar189 = vaddpd_avx512vl(auVar205,auVar189);
        auVar190 = vmulpd_avx512vl(auVar96,auVar177);
        auVar78._8_8_ = dStack_33d8;
        auVar78._0_8_ = local_33e0;
        auVar189 = vaddpd_avx512vl(auVar189,auVar190);
        *(undefined1 (*) [16])(pdVar164 + -0x20) = auVar189;
        auVar206._0_8_ = local_3490[2] * local_4a00;
        auVar206._8_8_ = local_3490[3] * dStack_49f8;
        auVar99._8_8_ = local_2e90[3];
        auVar99._0_8_ = local_2e90[2];
        auVar191 = vmulpd_avx512vl(auVar191,auVar99);
        auVar95._8_8_ = local_3370[3];
        auVar95._0_8_ = local_3370[2];
        auVar191 = vaddpd_avx512vl(auVar206,auVar191);
        auVar192 = vmulpd_avx512vl(auVar95,auVar192);
        auVar192 = vaddpd_avx512vl(auVar191,auVar192);
        auVar98._8_8_ = uStack_2e68;
        auVar98._0_8_ = local_2e70;
        auVar191 = vmulpd_avx512vl(auVar224,auVar98);
        *(undefined1 (*) [16])(pdVar164 + -0x1e) = auVar192;
        auVar192 = vmulpd_avx512vl(auVar105,auVar48);
        auVar94._8_8_ = uStack_3348;
        auVar94._0_8_ = local_3350;
        auVar192 = vaddpd_avx512vl(auVar192,auVar191);
        auVar191 = vmulpd_avx512vl(auVar94,auVar45);
        auVar192 = vaddpd_avx512vl(auVar192,auVar191);
        auVar93._8_8_ = uStack_2e58;
        auVar93._0_8_ = local_2e60;
        auVar191 = vmulpd_avx512vl(auVar179,auVar93);
        auVar90._8_8_ = uStack_3328;
        auVar90._0_8_ = local_3330;
        *(undefined1 (*) [16])(pdVar164 + -0x1c) = auVar192;
        auVar192 = vmulpd_avx512vl(auVar104,auVar49);
        auVar92._8_8_ = uStack_3338;
        auVar92._0_8_ = local_3340;
        auVar192 = vaddpd_avx512vl(auVar192,auVar191);
        auVar191 = vmulpd_avx512vl(auVar92,auVar5);
        auVar192 = vaddpd_avx512vl(auVar192,auVar191);
        auVar91._8_8_ = uStack_2e48;
        auVar91._0_8_ = local_2e50;
        auVar191 = vmulpd_avx512vl(auVar180,auVar91);
        *(undefined1 (*) [16])(pdVar164 + -0x1a) = auVar192;
        auVar192 = vmulpd_avx512vl(local_3450,auVar178);
        auVar192 = vaddpd_avx512vl(auVar192,auVar191);
        auVar191 = vmulpd_avx512vl(auVar90,auVar6);
        auVar192 = vaddpd_avx512vl(auVar192,auVar191);
        auVar89._8_8_ = uStack_2e38;
        auVar89._0_8_ = local_2e40;
        auVar191 = vmulpd_avx512vl(auVar181,auVar89);
        *(undefined1 (*) [16])(pdVar164 + -0x18) = auVar192;
        auVar207._0_8_ = auVar175._0_8_ * auVar173._0_8_;
        auVar207._8_8_ = auVar175._8_8_ * auVar173._8_8_;
        auVar88._8_8_ = dStack_3318;
        auVar88._0_8_ = local_3320;
        auVar173 = vaddpd_avx512vl(auVar207,auVar191);
        auVar192 = vmulpd_avx512vl(auVar88,auVar182);
        auVar173 = vaddpd_avx512vl(auVar173,auVar192);
        auVar87._8_8_ = uStack_2e28;
        auVar87._0_8_ = local_2e30;
        auVar192 = vmulpd_avx512vl(auVar183,auVar87);
        *(undefined1 (*) [16])(pdVar164 + -0x16) = auVar173;
        auVar173 = vmulpd_avx512vl(auVar176,auVar172);
        auVar86._8_8_ = uStack_3308;
        auVar86._0_8_ = local_3310;
        auVar173 = vaddpd_avx512vl(auVar173,auVar192);
        auVar176 = vmulpd_avx512vl(auVar86,auVar184);
        auVar173 = vaddpd_avx512vl(auVar173,auVar176);
        auVar85._8_8_ = uStack_2e18;
        auVar85._0_8_ = local_2e20;
        auVar176 = vmulpd_avx512vl(auVar185,auVar85);
        *(undefined1 (*) [16])(pdVar164 + -0x14) = auVar173;
        auVar173 = vmulpd_avx512vl(auVar174,auVar171);
        auVar84._8_8_ = uStack_32f8;
        auVar84._0_8_ = local_3300;
        auVar173 = vaddpd_avx512vl(auVar173,auVar176);
        auVar174 = vmulpd_avx512vl(auVar84,auVar186);
        auVar173 = vaddpd_avx512vl(auVar173,auVar174);
        *(undefined1 (*) [16])(pdVar164 + -0x12) = auVar173;
        auVar173 = vmulpd_avx512vl(auVar97,auVar187);
        pdVar164[-0x10] =
             (double)local_2f80._0_8_ * (double)local_3410 + auVar173._0_8_ +
             (double)local_2fc0._0_8_ * (double)local_2f30;
        pdVar164[-0xf] =
             (double)local_2f80._8_8_ * (double)peStack_3408 + auVar173._8_8_ +
             (double)local_2fc0._8_8_ * (double)peStack_2f28;
        local_2fd0._0_8_ = auVar177._0_8_;
        local_2fd0._8_8_ = auVar177._8_8_;
        pdVar164[-0xe] =
             local_2fa0 * local_3400[0] + local_3370[0] * (double)local_2fe0._0_8_ +
             (double)local_2fd0._0_8_ * local_2f20[0];
        pdVar164[-0xd] =
             dStack_2f98 * local_3400[1] + local_3370[1] * (double)local_2fe0._8_8_ +
             (double)local_2fd0._8_8_ * local_2f20[1];
        auVar173 = vmulpd_avx512vl(auVar94,auVar224);
        pdVar164[-0xc] =
             local_3400[2] * local_4a00 + local_3370[2] * (double)local_4900 +
             local_2f40 * local_2f20[2];
        pdVar164[-0xb] =
             local_3400[3] * dStack_49f8 + local_3370[3] * dStack_48f8 + dStack_2f38 * local_2f20[3]
        ;
        auVar174 = vmulpd_avx512vl(auVar78,auVar48);
        auVar83._8_8_ = uStack_2ef8;
        auVar83._0_8_ = local_2f00;
        auVar176 = vmulpd_avx512vl(auVar45,auVar83);
        auVar179 = vmulpd_avx512vl(auVar92,auVar179);
        pdVar164[-10] = auVar174._0_8_ + auVar173._0_8_ + auVar176._0_8_;
        pdVar164[-9] = auVar174._8_8_ + auVar173._8_8_ + auVar176._8_8_;
        auVar173 = vmulpd_avx512vl(local_33d0,auVar50);
        auVar82._8_8_ = uStack_2ee8;
        auVar82._0_8_ = local_2ef0;
        auVar174 = vmulpd_avx512vl(auVar5,auVar82);
        auVar176 = vmulpd_avx512vl(auVar90,auVar180);
        pdVar164[-8] = auVar173._0_8_ + auVar179._0_8_ + auVar174._0_8_;
        pdVar164[-7] = auVar173._8_8_ + auVar179._8_8_ + auVar174._8_8_;
        auVar173 = vmulpd_avx512vl(local_33c0,auVar178);
        pdVar164[-6] = auVar173._0_8_ + auVar176._0_8_ + auVar6._0_8_ * local_2ee0;
        pdVar164[-5] = auVar173._8_8_ + auVar176._8_8_ + auVar6._8_8_ * dStack_2ed8;
        auVar81._8_8_ = uStack_2ec8;
        auVar81._0_8_ = local_2ed0;
        auVar173 = vmulpd_avx512vl(auVar182,auVar81);
        auVar178 = vmulpd_avx512vl(auVar86,auVar183);
        pdVar164[-4] = auVar175._0_8_ * local_33b0._0_8_ + auVar181._0_8_ * local_3320 +
                       auVar173._0_8_;
        pdVar164[-3] = auVar175._8_8_ * local_33b0._8_8_ + auVar181._8_8_ * dStack_3318 +
                       auVar173._8_8_;
        auVar172 = vmulpd_avx512vl(local_33a0,auVar172);
        auVar80._8_8_ = uStack_2eb8;
        auVar80._0_8_ = local_2ec0;
        auVar173 = vmulpd_avx512vl(auVar184,auVar80);
        auVar175 = vmulpd_avx512vl(auVar84,auVar185);
        pdVar164[-2] = auVar172._0_8_ + auVar178._0_8_ + auVar173._0_8_;
        pdVar164[-1] = auVar172._8_8_ + auVar178._8_8_ + auVar173._8_8_;
        auVar171 = vmulpd_avx512vl(local_3390,auVar171);
        auVar79._8_8_ = uStack_2ea8;
        auVar79._0_8_ = local_2eb0;
        auVar172 = vmulpd_avx512vl(auVar186,auVar79);
        *pdVar164 = auVar171._0_8_ + auVar175._0_8_ + auVar172._0_8_;
        pdVar164[1] = auVar171._8_8_ + auVar175._8_8_ + auVar172._8_8_;
        pdVar164 = pdVar164 + 0x36;
        auVar178 = local_32f0;
        auVar175 = local_32e0;
        auVar171 = local_3290;
        auVar172 = local_32a0;
        auVar173 = local_32b0;
        auVar176 = local_32c0;
        auVar174 = local_32d0;
        local_2fe0 = auVar188;
        local_2fd0 = auVar177;
        local_2fc0 = auVar59;
        local_2f80 = auVar60;
      } while (uVar166 != 0x18);
      local_4920 = (double)(pCVar162->m_SD).
                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                           m_storage.m_rows;
      local_47b0 = (pointer)(pCVar162->m_SD).
                            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                            m_storage.m_cols;
      ppMVar157 = local_2d50;
      dVar158 = 0.0;
      do {
        local_4a00 = dVar158;
        local_4900 = ppMVar157;
        lVar10 = (dst->
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                 ).m_stride.m_outer.m_value;
        lVar159 = (long)local_4a00 * 3;
        pdVar11 = (dst->
                  super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                  ).
                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  .
                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                  .m_data;
        lVar149 = (dst->
                  super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                  ).
                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  .
                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                  .m_rows.m_value;
        local_4940 = (long)local_4920 <= (long)local_4a00 || (long)local_47b0 < (long)local_4648;
        local_4a80 = (long)local_4a00 * 3 + 2;
        paVar1 = (assign_op<double,_double> *)
                 (*(long *)local_4848 + local_4928 + (long)local_47b0 * (long)local_4a00 * 8);
        local_4a78 = (long)local_4a00 * 3 + 1;
        ppMVar157 = local_4900;
        dVar158 = local_4a00;
        do {
          if ((bool)local_4940) {
            __function = 
            "Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 1, 54>::Block(XprType &, Index, Index) [XprType = Eigen::Matrix<double, -1, -1, 1>, BlockRows = 1, BlockCols = 54, InnerPanel = false]"
            ;
            goto LAB_00751aac;
          }
          local_4a10 = local_4850;
          local_4a40 = (pointer)local_4a38;
          uVar160 = 0xfffffffffffffffc;
          dVar196 = (double)local_4850 * *(double *)paVar1 *
                    *(double *)(local_2d80 + (long)dVar158 * 0x1b0);
          dVar198 = (double)local_4850 * *(double *)(paVar1 + 8) *
                    (double)(&TStack_2d78)[(long)dVar158 * 0x36].m_matrix;
          dVar199 = (double)local_4850 * *(double *)(paVar1 + 0x10) *
                    (double)avStack_2d68[(long)dVar158 * 0x36 + -1].m_value;
          dVar208 = (double)local_4850 * *(double *)(paVar1 + 0x18) *
                    (double)avStack_2d68[(long)dVar158 * 0x36].m_value;
          do {
            dVar196 = dVar196 + (double)local_4850 * *(double *)(paVar1 + uVar160 * 8 + 0x40) *
                                (double)ppMVar157[uVar160 + 2];
            dVar198 = dVar198 + (double)local_4850 * *(double *)(paVar1 + uVar160 * 8 + 0x40 + 8) *
                                (double)(ppMVar157 + uVar160 + 2)[1];
            lVar163 = uVar160 * 8;
            lVar168 = uVar160 + 4;
            uVar160 = uVar160 + 4;
            dVar199 = dVar199 + (double)local_4850 * *(double *)(paVar1 + lVar163 + 0x50) *
                                (double)ppMVar157[lVar168];
            dVar208 = dVar208 + (double)local_4850 * *(double *)(paVar1 + lVar163 + 0x50 + 8) *
                                (double)(ppMVar157 + lVar168)[1];
          } while (uVar160 < 0x2c);
          local_4a08 = paVar1;
          if ((lVar149 <= lVar159) ||
             (lVar163 = (long)dVar158 * 3,
             (local_4a48->
             super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
             ).
             super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
             .
             super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
             .m_cols.m_value <= lVar163)) {
LAB_00751a61:
            __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                          "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                          "Scalar &Eigen::DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, 1>::operator()(Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, Level = 1]"
                         );
          }
          dVar196 = dVar196 + dVar199 +
                    (double)local_4850 * *(double *)(paVar1 + 0x1a0) *
                    local_2be0[(long)dVar158 * 0x36] +
                    dVar198 + dVar208 +
                    (double)local_4850 * *(double *)(paVar1 + 0x1a8) *
                    local_2be0[(long)dVar158 * 0x36 + 1];
          pdVar11[lVar10 * lVar159 + (long)dVar158 * 3] =
               dVar196 + pdVar11[lVar10 * lVar159 + (long)dVar158 * 3];
          if (((lVar149 <= local_4a78) ||
              ((lVar168 = lVar163 + 1,
               (local_4a48->
               super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
               ).
               super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
               .
               super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
               .m_cols.m_value <= lVar168 ||
               (pdVar11[lVar10 * local_4a78 + (long)dVar158 * 3 + 1] =
                     dVar196 + pdVar11[lVar10 * local_4a78 + (long)dVar158 * 3 + 1],
               lVar149 <= (long)local_4a80)))) ||
             (lVar170 = lVar163 + 2,
             (local_4a48->
             super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
             ).
             super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
             .
             super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
             .m_cols.m_value <= lVar170)) goto LAB_00751a61;
          pdVar11[lVar10 * local_4a80 + (long)dVar158 * 3 + 2] =
               dVar196 + pdVar11[lVar10 * local_4a80 + (long)dVar158 * 3 + 2];
          if (local_4a00 != dVar158) {
            if (((((lVar149 <= lVar163) ||
                  ((local_4a48->
                   super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                   ).
                   super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                   .
                   super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                   .m_cols.m_value <= lVar159)) ||
                 (pdVar11[(long)local_4a00 * 3 + lVar163 * lVar10] =
                       dVar196 + pdVar11[(long)local_4a00 * 3 + lVar163 * lVar10],
                 lVar149 <= lVar168)) ||
                (((local_4a48->
                  super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                  ).
                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  .
                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                  .m_cols.m_value <= local_4a78 ||
                 (pdVar11[(long)local_4a00 * 3 + lVar168 * lVar10 + 1] =
                       dVar196 + pdVar11[(long)local_4a00 * 3 + lVar168 * lVar10 + 1],
                 lVar149 <= lVar170)))) ||
               ((local_4a48->
                super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                ).
                super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                .
                super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                .m_cols.m_value <= (long)local_4a80)) goto LAB_00751a61;
            pdVar11[(long)local_4a00 * 3 + lVar170 * lVar10 + 2] =
                 dVar196 + pdVar11[(long)local_4a00 * 3 + lVar170 * lVar10 + 2];
          }
          dVar158 = (double)((long)dVar158 + 1);
          ppMVar157 = ppMVar157 + 0x36;
        } while (dVar158 != 1.18575755001899e-322);
        ppMVar157 = local_4900 + 0x36;
        dVar158 = (double)((long)local_4a00 + 1U);
        dst = local_4a48;
      } while ((double)((long)local_4a00 + 1U) != 1.18575755001899e-322);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4a38._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        free(*(void **)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_4a38._8_8_ + -0x10))
                        ->_M_use_count);
      }
      uVar160 = local_4930;
      if (local_4aa0.m_data != (double *)0x0) {
        free((void *)local_4aa0.m_data[-1]);
      }
      this = local_4a50;
      if (local_4a70.m_data != (double *)0x0) {
        free((void *)local_4a70.m_data[-1]);
      }
      local_4944 = local_4944 + 0x36;
      local_4948 = local_4948 + 0x36;
      local_4930 = (ulong)((int)uVar160 + 0x36);
      local_49e8 = local_49e8 + 1;
    } while (local_49e8 < this->m_numLayers);
  }
  return;
}

Assistant:

void ChElementShellANCF_3833::ComputeInternalJacobianContIntDamping(ChMatrixRef& H, double Kfactor, double Rfactor) {
    // Calculate the Jacobian of the generalize internal force vector using the "Continuous Integration" style of method
    // assuming a linear viscoelastic material model (single term damping model).  For this style of method, the
    // Jacobian of the generalized internal force vector is integrated across the volume of the element every time this
    // calculation is performed. For a small number of layers this method can be more efficient than the
    // "Pre-Integration" style calculation method.

    MatrixNx6 ebar_ebardot;
    CalcCombinedCoordMatrix(ebar_ebardot);

    // Zero out the Jacobian matrix since the results from each layer will be added to this value
    H.setZero();

    // Sum the contribution to the Jacobian matrix layer by layer
    for (int kl = 0; kl < m_numLayers; kl++) {
        // No values from the generalized internal force vector are cached for reuse in the Jacobian.  Instead these
        // quantities are recalculated again during the Jacobian calculations.  This both simplifies the code and speeds
        // up the generalized internal force calculation while only having a minimal impact on the performance of the
        // Jacobian calculation speed.  The Jacobian calculation is performed in two major pieces.  First is the
        // calculation of the potentially non-symmetric and non-sparse component.  The second pieces is the symmetric
        // and sparse component.

        // =============================================================================
        // Calculate the deformation gradient and time derivative of the deformation gradient for all Gauss quadrature
        // points in a single matrix multiplication.  Note that since the shape function derivative matrix is ordered by
        // columns, the resulting deformation gradient will be ordered by block matrix (column vectors) components
        // Note that the indices of the components are in transposed order
        //      [F11  F21  F31  F11dot  F21dot  F31dot ]
        // FC = [F12  F22  F32  F12dot  F22dot  F32dot ]
        //      [F13  F23  F33  F13dot  F23dot  F33dot ]
        // =============================================================================

        ChMatrixNMc<double, 3 * NIP, 6> FC = m_SD.block<NSF, 3 * NIP>(0, 3 * NIP * kl).transpose() * ebar_ebardot;

        //==============================================================================
        //==============================================================================
        // Calculate the potentially non-symmetric and non-sparse component of the Jacobian matrix
        //==============================================================================
        //==============================================================================

        // =============================================================================
        // Calculate the partial derivative of the Green-Largrange strains with respect to the nodal coordinates
        // (transposed).  This calculation is performed in blocks across all the Gauss quadrature points at the same
        // time.  This value should be store in row major memory layout to align with the access patterns for
        // calculating this matrix.
        // PE = [(d epsilon1/d e)GQPnt1' (d epsilon1/d e)GQPnt2' ... (d epsilon1/d e)GQPntNIP'...
        //       (d epsilon2/d e)GQPnt1' (d epsilon2/d e)GQPnt2' ... (d epsilon2/d e)GQPntNIP'...
        //       (d epsilon3/d e)GQPnt1' (d epsilon3/d e)GQPnt2' ... (d epsilon3/d e)GQPntNIP'...
        //       (d epsilon4/d e)GQPnt1' (d epsilon4/d e)GQPnt2' ... (d epsilon4/d e)GQPntNIP'...
        //       (d epsilon5/d e)GQPnt1' (d epsilon5/d e)GQPnt2' ... (d epsilon5/d e)GQPntNIP'...
        //       (d epsilon6/d e)GQPnt1' (d epsilon6/d e)GQPnt2' ... (d epsilon6/d e)GQPntNIP']
        // Note that each partial derivative block shown is placed to the left of the previous block.
        // The explanation of the calculation above is just too long to write it all on a single line.
        // =============================================================================

        Eigen::Matrix<double, Eigen::Dynamic, Eigen::Dynamic, Eigen::RowMajor> PE;
        PE.resize(3 * NSF, 6 * NIP);

        for (auto i = 0; i < NSF; i++) {
            PE.block<1, NIP>(3 * i, 0 * NIP) = m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                                                   .cwiseProduct(FC.template block<NIP, 1>(0 * NIP, 0).transpose());
            PE.block<1, NIP>(3 * i, 1 * NIP) = m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                                                   .cwiseProduct(FC.template block<NIP, 1>(1 * NIP, 0).transpose());
            PE.block<1, NIP>(3 * i, 2 * NIP) = m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                                                   .cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 0).transpose());
            PE.block<1, NIP>(3 * i, 3 * NIP) = m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                                                   .cwiseProduct(FC.template block<NIP, 1>(1 * NIP, 0).transpose()) +
                                               m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                                                   .cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 0).transpose());
            PE.block<1, NIP>(3 * i, 4 * NIP) = m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                                                   .cwiseProduct(FC.template block<NIP, 1>(0 * NIP, 0).transpose()) +
                                               m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                                                   .cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 0).transpose());
            PE.block<1, NIP>(3 * i, 5 * NIP) = m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                                                   .cwiseProduct(FC.template block<NIP, 1>(0 * NIP, 0).transpose()) +
                                               m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                                                   .cwiseProduct(FC.template block<NIP, 1>(1 * NIP, 0).transpose());

            PE.block<1, NIP>((3 * i) + 1, 0) =
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP).cwiseProduct(FC.template block<NIP, 1>(0, 1).transpose());
            PE.block<1, NIP>((3 * i) + 1, NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP).cwiseProduct(FC.template block<NIP, 1>(NIP, 1).transpose());
            PE.block<1, NIP>((3 * i) + 1, 2 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                    .cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 1).transpose());
            PE.block<1, NIP>((3 * i) + 1, 3 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP).cwiseProduct(FC.template block<NIP, 1>(NIP, 1).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                    .cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 1).transpose());
            PE.block<1, NIP>((3 * i) + 1, 4 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP).cwiseProduct(FC.template block<NIP, 1>(0, 1).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                    .cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 1).transpose());
            PE.block<1, NIP>((3 * i) + 1, 5 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP).cwiseProduct(FC.template block<NIP, 1>(0, 1).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP).cwiseProduct(FC.template block<NIP, 1>(NIP, 1).transpose());

            PE.block<1, NIP>((3 * i) + 2, 0) =
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP).cwiseProduct(FC.template block<NIP, 1>(0, 2).transpose());
            PE.block<1, NIP>((3 * i) + 2, NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP).cwiseProduct(FC.template block<NIP, 1>(NIP, 2).transpose());
            PE.block<1, NIP>((3 * i) + 2, 2 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                    .cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 2).transpose());
            PE.block<1, NIP>((3 * i) + 2, 3 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP).cwiseProduct(FC.template block<NIP, 1>(NIP, 2).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                    .cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 2).transpose());
            PE.block<1, NIP>((3 * i) + 2, 4 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP).cwiseProduct(FC.template block<NIP, 1>(0, 2).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                    .cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 2).transpose());
            PE.block<1, NIP>((3 * i) + 2, 5 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP).cwiseProduct(FC.template block<NIP, 1>(0, 2).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP).cwiseProduct(FC.template block<NIP, 1>(NIP, 2).transpose());
        }

        // =============================================================================
        // Combine the deformation gradient, time derivative of the deformation gradient, damping coefficient, Gauss
        // quadrature weighting times the element Jacobian, and Jacobian component scale factors into a scaled block
        // deformation gradient matrix Calculate the deformation gradient and time derivative of the deformation
        // gradient for all Gauss quadrature points in a single matrix multiplication.  Note that the resulting combined
        // deformation gradient block matrix will be ordered by block matrix (column vectors) components Note that the
        // indices of the components are in transposed order
        //            [kGQ*(Kfactor+alpha*Rfactor)*F11+alpha*Rfactor*F11dot ... similar for F21 & F31 blocks]
        // FCscaled = [kGQ*(Kfactor+alpha*Rfactor)*F12+alpha*Rfactor*F12dot ... similar for F22 & F32 blocks]
        //            [kGQ*(Kfactor+alpha*Rfactor)*F13+alpha*Rfactor*F13dot ... similar for F23 & F33 blocks]
        // =============================================================================

        ChMatrixNMc<double, 3 * NIP, 3> FCscaled = (Kfactor + m_Alpha * Rfactor) * FC.template block<3 * NIP, 3>(0, 0) +
                                                   (m_Alpha * Kfactor) * FC.template block<3 * NIP, 3>(0, 3);

        for (auto i = 0; i < 3; i++) {
            FCscaled.template block<NIP, 1>(0, i).array() *= m_kGQ.block<NIP, 1>(kl * NIP, 0).array();
            FCscaled.template block<NIP, 1>(NIP, i).array() *= m_kGQ.block<NIP, 1>(kl * NIP, 0).array();
            FCscaled.template block<NIP, 1>(2 * NIP, i).array() *= m_kGQ.block<NIP, 1>(kl * NIP, 0).array();
        }

        // =============================================================================
        // Calculate the combination of the scaled partial derivative of the Green-Largrange strains with respect to the
        // nodal coordinates, the scaled partial derivative of the time derivative of the Green-Largrange strains with
        // respect to the nodal coordinates, the scaled partial derivative of the Green-Largrange strains with respect
        // to the time derivative of the nodal coordinates, and the other parameters to correctly integrate across the
        // volume of the element.  This calculation is performed in blocks across all the Gauss quadrature points at the
        // same time.  This value should be store in row major memory layout to align with the access patterns for
        // calculating this matrix.
        // =============================================================================

        Eigen::Matrix<double, Eigen::Dynamic, Eigen::Dynamic, Eigen::RowMajor> Scaled_Combined_PE;
        Scaled_Combined_PE.resize(3 * NSF, 6 * NIP);

        for (auto i = 0; i < NSF; i++) {
            Scaled_Combined_PE.block<1, NIP>(3 * i, 0) =
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(0, 0).transpose());
            Scaled_Combined_PE.block<1, NIP>(3 * i, NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(NIP, 0).transpose());
            Scaled_Combined_PE.block<1, NIP>(3 * i, 2 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(2 * NIP, 0).transpose());
            Scaled_Combined_PE.block<1, NIP>(3 * i, 3 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(NIP, 0).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(2 * NIP, 0).transpose());
            Scaled_Combined_PE.block<1, NIP>(3 * i, 4 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(0, 0).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(2 * NIP, 0).transpose());
            Scaled_Combined_PE.block<1, NIP>(3 * i, 5 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(0, 0).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(NIP, 0).transpose());

            Scaled_Combined_PE.block<1, NIP>((3 * i) + 1, 0) =
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(0, 1).transpose());
            Scaled_Combined_PE.block<1, NIP>((3 * i) + 1, NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(NIP, 1).transpose());
            Scaled_Combined_PE.block<1, NIP>((3 * i) + 1, 2 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(2 * NIP, 1).transpose());
            Scaled_Combined_PE.block<1, NIP>((3 * i) + 1, 3 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(NIP, 1).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(2 * NIP, 1).transpose());
            Scaled_Combined_PE.block<1, NIP>((3 * i) + 1, 4 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(0, 1).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(2 * NIP, 1).transpose());
            Scaled_Combined_PE.block<1, NIP>((3 * i) + 1, 5 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(0, 1).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(NIP, 1).transpose());

            Scaled_Combined_PE.block<1, NIP>((3 * i) + 2, 0) =
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(0, 2).transpose());
            Scaled_Combined_PE.block<1, NIP>((3 * i) + 2, NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(NIP, 2).transpose());
            Scaled_Combined_PE.block<1, NIP>((3 * i) + 2, 2 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(2 * NIP, 2).transpose());
            Scaled_Combined_PE.block<1, NIP>((3 * i) + 2, 3 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(NIP, 2).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(2 * NIP, 2).transpose());
            Scaled_Combined_PE.block<1, NIP>((3 * i) + 2, 4 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(0, 2).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(2 * NIP, 2).transpose());
            Scaled_Combined_PE.block<1, NIP>((3 * i) + 2, 5 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(0, 2).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(NIP, 2).transpose());
        }

        // =============================================================================
        // Get the stiffness tensor in 6x6 matrix form for the current layer at rotate it in the midsurface according to
        // the user specified angle.  Note that the matrix is reordered as well to match the Voigt notation used in this
        // element
        // =============================================================================

        ChMatrixNM<double, 6, 6> D = m_layers[kl].GetMaterial()->Get_E_eps();
        RotateReorderStiffnessMatrix(D, m_layers[kl].Get_theta());

        // =============================================================================
        // Multiply the scaled and combined partial derivative block matrix by the stiffness matrix for each individual
        // Gauss quadrature point
        // =============================================================================

        Eigen::Matrix<double, Eigen::Dynamic, Eigen::Dynamic, Eigen::RowMajor> DScaled_Combined_PE;
        DScaled_Combined_PE.resize(3 * NSF, 6 * NIP);

        DScaled_Combined_PE.template block<3 * NSF, NIP>(0, 0) =
            D(0, 0) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 0) +
            D(0, 1) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, NIP) +
            D(0, 2) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 2 * NIP) +
            D(0, 3) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 3 * NIP) +
            D(0, 4) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 4 * NIP) +
            D(0, 5) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 5 * NIP);
        DScaled_Combined_PE.template block<3 * NSF, NIP>(0, NIP) =
            D(1, 0) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 0) +
            D(1, 1) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, NIP) +
            D(1, 2) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 2 * NIP) +
            D(1, 3) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 3 * NIP) +
            D(1, 4) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 4 * NIP) +
            D(1, 5) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 5 * NIP);
        DScaled_Combined_PE.template block<3 * NSF, NIP>(0, 2 * NIP) =
            D(2, 0) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 0) +
            D(2, 1) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, NIP) +
            D(2, 2) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 2 * NIP) +
            D(2, 3) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 3 * NIP) +
            D(2, 4) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 4 * NIP) +
            D(2, 5) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 5 * NIP);
        DScaled_Combined_PE.template block<3 * NSF, NIP>(0, 3 * NIP) =
            D(3, 0) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 0) +
            D(3, 1) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, NIP) +
            D(3, 2) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 2 * NIP) +
            D(3, 3) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 3 * NIP) +
            D(3, 4) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 4 * NIP) +
            D(3, 5) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 5 * NIP);
        DScaled_Combined_PE.template block<3 * NSF, NIP>(0, 4 * NIP) =
            D(4, 0) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 0) +
            D(4, 1) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, NIP) +
            D(4, 2) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 2 * NIP) +
            D(4, 3) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 3 * NIP) +
            D(4, 4) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 4 * NIP) +
            D(4, 5) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 5 * NIP);
        DScaled_Combined_PE.template block<3 * NSF, NIP>(0, 5 * NIP) =
            D(5, 0) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 0) +
            D(5, 1) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, NIP) +
            D(5, 2) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 2 * NIP) +
            D(5, 3) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 3 * NIP) +
            D(5, 4) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 4 * NIP) +
            D(5, 5) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 5 * NIP);

        // =============================================================================
        // Multiply the partial derivative block matrix by the final scaled and combined partial derivative block matrix
        // to obtain the potentially non-symmetric and non-sparse component of the Jacobian matrix
        // =============================================================================

        H.noalias() += PE * DScaled_Combined_PE.transpose();

        //==============================================================================
        //==============================================================================
        // Calculate the sparse and symmetric component of the Jacobian matrix
        //==============================================================================
        //==============================================================================

        // =============================================================================
        // Calculate each individual value of the Green-Lagrange strain component by component across all the
        // Gauss-Quadrature points at a time for the current layer to better leverage vectorized CPU instructions.
        // Note that the scaled time derivatives of the Green-Lagrange strain are added to make the later calculation of
        // the 2nd Piola-Kirchoff stresses more efficient.  The combined result is then scaled by minus the Gauss
        // quadrature weight times the element Jacobian at the corresponding Gauss point (m_kGQ) again for efficiency.
        // Results are written in Voigt notation: epsilon = [E11,E22,E33,2*E23,2*E13,2*E12]
        // =============================================================================

        // Each entry in E1 = kGQ*(E11+alpha*E11dot)
        //                  = kGQ*(1/2*(F11*F11+F21*F21+F31*F31-1)+alpha*(F11*F11dot+F21*F21dot+F31*F31dot))
        VectorNIP E_BlockDamping = FC.template block<NIP, 1>(0, 0).cwiseProduct(FC.template block<NIP, 1>(0, 3)) +
                                   FC.template block<NIP, 1>(0, 1).cwiseProduct(FC.template block<NIP, 1>(0, 4)) +
                                   FC.template block<NIP, 1>(0, 2).cwiseProduct(FC.template block<NIP, 1>(0, 5));
        VectorNIP E1_Block = FC.template block<NIP, 1>(0, 0).cwiseProduct(FC.template block<NIP, 1>(0, 0)) +
                             FC.template block<NIP, 1>(0, 1).cwiseProduct(FC.template block<NIP, 1>(0, 1)) +
                             FC.template block<NIP, 1>(0, 2).cwiseProduct(FC.template block<NIP, 1>(0, 2));
        E1_Block.array() -= 1;
        E1_Block *= 0.5;
        E1_Block += m_Alpha * E_BlockDamping;
        E1_Block.array() *= m_kGQ.block<NIP, 1>(kl * NIP, 0).array();

        // Each entry in E2 = kGQ*(E22+alpha*E22dot)
        //                  = kGQ*(1/2*(F12*F12+F22*F22+F32*F32-1)+alpha*(F12*F12dot+F22*F22dot+F32*F32dot))
        E_BlockDamping.noalias() = FC.template block<NIP, 1>(NIP, 0).cwiseProduct(FC.template block<NIP, 1>(NIP, 3)) +
                                   FC.template block<NIP, 1>(NIP, 1).cwiseProduct(FC.template block<NIP, 1>(NIP, 4)) +
                                   FC.template block<NIP, 1>(NIP, 2).cwiseProduct(FC.template block<NIP, 1>(NIP, 5));
        VectorNIP E2_Block = FC.template block<NIP, 1>(NIP, 0).cwiseProduct(FC.template block<NIP, 1>(NIP, 0)) +
                             FC.template block<NIP, 1>(NIP, 1).cwiseProduct(FC.template block<NIP, 1>(NIP, 1)) +
                             FC.template block<NIP, 1>(NIP, 2).cwiseProduct(FC.template block<NIP, 1>(NIP, 2));
        E2_Block.array() -= 1;
        E2_Block *= 0.5;
        E2_Block += m_Alpha * E_BlockDamping;
        E2_Block.array() *= m_kGQ.block<NIP, 1>(kl * NIP, 0).array();

        // Each entry in E3 = kGQ*(E33+alpha*E33dot)
        //                  = kGQ*(1/2*(F13*F13+F23*F23+F33*F33-1)+alpha*(F13*F13dot+F23*F23dot+F33*F33dot))
        E_BlockDamping.noalias() =
            FC.template block<NIP, 1>(2 * NIP, 0).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 3)) +
            FC.template block<NIP, 1>(2 * NIP, 1).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 4)) +
            FC.template block<NIP, 1>(2 * NIP, 2).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 5));
        VectorNIP E3_Block = FC.template block<NIP, 1>(2 * NIP, 0).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 0)) +
                             FC.template block<NIP, 1>(2 * NIP, 1).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 1)) +
                             FC.template block<NIP, 1>(2 * NIP, 2).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 2));
        E3_Block.array() -= 1;
        E3_Block *= 0.5;
        E3_Block += m_Alpha * E_BlockDamping;
        E3_Block.array() *= m_kGQ.block<NIP, 1>(kl * NIP, 0).array();

        // Each entry in E4 = kGQ*(2*(E23+alpha*E23dot))
        //                  = kGQ*((F12*F13+F22*F23+F32*F33)
        //                    +alpha*(F12dot*F13+F22dot*F23+F32dot*F33 + F12*F13dot+F22*F23dot+F32*F33dot))
        E_BlockDamping.noalias() =
            FC.template block<NIP, 1>(2 * NIP, 0).cwiseProduct(FC.template block<NIP, 1>(NIP, 3)) +
            FC.template block<NIP, 1>(2 * NIP, 1).cwiseProduct(FC.template block<NIP, 1>(NIP, 4)) +
            FC.template block<NIP, 1>(2 * NIP, 2).cwiseProduct(FC.template block<NIP, 1>(NIP, 5)) +
            FC.template block<NIP, 1>(NIP, 0).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 3)) +
            FC.template block<NIP, 1>(NIP, 1).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 4)) +
            FC.template block<NIP, 1>(NIP, 2).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 5));
        VectorNIP E4_Block = FC.template block<NIP, 1>(NIP, 0).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 0)) +
                             FC.template block<NIP, 1>(NIP, 1).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 1)) +
                             FC.template block<NIP, 1>(NIP, 2).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 2));
        E4_Block += m_Alpha * E_BlockDamping;
        E4_Block.array() *= m_kGQ.block<NIP, 1>(kl * NIP, 0).array();

        // Each entry in E5 = kGQ*(2*(E13+alpha*E13dot))
        //                  = kGQ*((F11*F13+F21*F23+F31*F33)
        //                    +alpha*(F11dot*F13+F21dot*F23+F31dot*F33 + F11*F13dot+F21*F23dot+F31*F33dot))
        E_BlockDamping.noalias() = FC.template block<NIP, 1>(2 * NIP, 0).cwiseProduct(FC.template block<NIP, 1>(0, 3)) +
                                   FC.template block<NIP, 1>(2 * NIP, 1).cwiseProduct(FC.template block<NIP, 1>(0, 4)) +
                                   FC.template block<NIP, 1>(2 * NIP, 2).cwiseProduct(FC.template block<NIP, 1>(0, 5)) +
                                   FC.template block<NIP, 1>(0, 0).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 3)) +
                                   FC.template block<NIP, 1>(0, 1).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 4)) +
                                   FC.template block<NIP, 1>(0, 2).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 5));
        VectorNIP E5_Block = FC.template block<NIP, 1>(0, 0).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 0)) +
                             FC.template block<NIP, 1>(0, 1).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 1)) +
                             FC.template block<NIP, 1>(0, 2).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 2));
        E5_Block += m_Alpha * E_BlockDamping;
        E5_Block.array() *= m_kGQ.block<NIP, 1>(kl * NIP, 0).array();

        // Each entry in E6 = kGQ*(2*(E12+alpha*E12dot))
        //                  = kGQ*((F11*F12+F21*F22+F31*F32)
        //                    +alpha*(F11dot*F12+F21dot*F22+F31dot*F32 + F11*F12dot+F21*F22dot+F31*F32dot))
        E_BlockDamping.noalias() = FC.template block<NIP, 1>(NIP, 0).cwiseProduct(FC.template block<NIP, 1>(0, 3)) +
                                   FC.template block<NIP, 1>(NIP, 1).cwiseProduct(FC.template block<NIP, 1>(0, 4)) +
                                   FC.template block<NIP, 1>(NIP, 2).cwiseProduct(FC.template block<NIP, 1>(0, 5)) +
                                   FC.template block<NIP, 1>(0, 0).cwiseProduct(FC.template block<NIP, 1>(NIP, 3)) +
                                   FC.template block<NIP, 1>(0, 1).cwiseProduct(FC.template block<NIP, 1>(NIP, 4)) +
                                   FC.template block<NIP, 1>(0, 2).cwiseProduct(FC.template block<NIP, 1>(NIP, 5));
        VectorNIP E6_Block = FC.template block<NIP, 1>(0, 0).cwiseProduct(FC.template block<NIP, 1>(NIP, 0)) +
                             FC.template block<NIP, 1>(0, 1).cwiseProduct(FC.template block<NIP, 1>(NIP, 1)) +
                             FC.template block<NIP, 1>(0, 2).cwiseProduct(FC.template block<NIP, 1>(NIP, 2));
        E6_Block += m_Alpha * E_BlockDamping;
        E6_Block.array() *= m_kGQ.block<NIP, 1>(kl * NIP, 0).array();

        // =============================================================================
        // Calculate the 2nd Piola-Kirchoff stresses in Voigt notation across all the Gauss quadrature points in the
        // current layer at a time component by component.
        // Note that the Green-Largrange strain components have been scaled have already been combined with their scaled
        // time derivatives and minus the Gauss quadrature weight times the element Jacobian at the corresponding Gauss
        // point to make the calculation of the 2nd Piola-Kirchoff stresses more efficient.
        //  kGQ*SPK2 = kGQ*[SPK2_11,SPK2_22,SPK2_33,SPK2_23,SPK2_13,SPK2_12] = D * E_Combined
        // =============================================================================

        VectorNIP SPK2_1_Block = D(0, 0) * E1_Block + D(0, 1) * E2_Block + D(0, 2) * E3_Block + D(0, 3) * E4_Block +
                                 D(0, 4) * E5_Block + D(0, 5) * E6_Block;
        VectorNIP SPK2_2_Block = D(1, 0) * E1_Block + D(1, 1) * E2_Block + D(1, 2) * E3_Block + D(1, 3) * E4_Block +
                                 D(1, 4) * E5_Block + D(1, 5) * E6_Block;
        VectorNIP SPK2_3_Block = D(2, 0) * E1_Block + D(2, 1) * E2_Block + D(2, 2) * E3_Block + D(2, 3) * E4_Block +
                                 D(2, 4) * E5_Block + D(2, 5) * E6_Block;
        VectorNIP SPK2_4_Block = D(3, 0) * E1_Block + D(3, 1) * E2_Block + D(3, 2) * E3_Block + D(3, 3) * E4_Block +
                                 D(3, 4) * E5_Block + D(3, 5) * E6_Block;
        VectorNIP SPK2_5_Block = D(4, 0) * E1_Block + D(4, 1) * E2_Block + D(4, 2) * E3_Block + D(4, 3) * E4_Block +
                                 D(4, 4) * E5_Block + D(4, 5) * E6_Block;
        VectorNIP SPK2_6_Block = D(5, 0) * E1_Block + D(5, 1) * E2_Block + D(5, 2) * E3_Block + D(5, 3) * E4_Block +
                                 D(5, 4) * E5_Block + D(5, 5) * E6_Block;

        // =============================================================================
        // Multiply the shape function derivative matrix by the 2nd Piola-Kirchoff stresses for each corresponding Gauss
        // quadrature point
        // =============================================================================

        ChMatrixNM<double, NSF, 3 * NIP> S_scaled_SD;

        for (auto i = 0; i < NSF; i++) {
            S_scaled_SD.template block<1, NIP>(i, 0) =
                SPK2_1_Block.transpose().cwiseProduct(m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)) +
                SPK2_6_Block.transpose().cwiseProduct(m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)) +
                SPK2_5_Block.transpose().cwiseProduct(m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP));

            S_scaled_SD.template block<1, NIP>(i, NIP) =
                SPK2_6_Block.transpose().cwiseProduct(m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)) +
                SPK2_2_Block.transpose().cwiseProduct(m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)) +
                SPK2_4_Block.transpose().cwiseProduct(m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP));

            S_scaled_SD.template block<1, NIP>(i, 2 * NIP) =
                SPK2_5_Block.transpose().cwiseProduct(m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)) +
                SPK2_4_Block.transpose().cwiseProduct(m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)) +
                SPK2_3_Block.transpose().cwiseProduct(m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP));
        }

        // =============================================================================
        // Calculate just the non-sparse upper triangular entires of the sparse and symmetric component of the Jacobian
        // matrix and then expand them out to full size by summing the contribution into the correct locations of the
        // full sized Jacobian matrix
        // =============================================================================
        unsigned int idx = 0;
        for (unsigned int i = 0; i < NSF; i++) {
            for (unsigned int j = i; j < NSF; j++) {
                double d = Kfactor * m_SD.block<1, 3 * NIP>(i, 3 * kl * NIP) *
                           S_scaled_SD.template block<1, 3 * NIP>(j, 0).transpose();

                H(3 * i, 3 * j) += d;
                H(3 * i + 1, 3 * j + 1) += d;
                H(3 * i + 2, 3 * j + 2) += d;
                if (i != j) {
                    H(3 * j, 3 * i) += d;
                    H(3 * j + 1, 3 * i + 1) += d;
                    H(3 * j + 2, 3 * i + 2) += d;
                }
                idx++;
            }
        }
    }
}